

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx::CurveNiMBIntersector1<8>::
     occluded_h<embree::avx::RibbonCurve1Intersector1<embree::HermiteCurveT,8>,embree::avx::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined1 (*pauVar9) [28];
  undefined1 (*pauVar10) [32];
  undefined1 (*pauVar11) [28];
  undefined4 uVar12;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  Primitive PVar33;
  Geometry *pGVar34;
  __int_type_conflict _Var35;
  long lVar36;
  RTCFilterFunctionN p_Var37;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [28];
  undefined1 auVar141 [28];
  undefined1 auVar142 [28];
  undefined1 auVar143 [28];
  undefined1 auVar144 [28];
  uint uVar145;
  int iVar146;
  RTCIntersectArguments *pRVar147;
  ulong uVar148;
  uint uVar149;
  long lVar150;
  long lVar151;
  long lVar152;
  ulong uVar153;
  long lVar154;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar155;
  float fVar172;
  float fVar173;
  float fVar174;
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  float fVar171;
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  float fVar170;
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar176;
  float fVar175;
  float fVar192;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  float fVar194;
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  float fVar193;
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar184 [32];
  float fVar190;
  float fVar191;
  undefined1 auVar189 [64];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  float fVar204;
  undefined1 auVar203 [32];
  float fVar205;
  float fVar206;
  float fVar224;
  undefined1 auVar208 [16];
  float fVar207;
  float fVar225;
  undefined1 auVar210 [16];
  float fVar220;
  float fVar222;
  float fVar226;
  float fVar227;
  float fVar228;
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar209 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  float fVar221;
  float fVar223;
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  float fVar229;
  float fVar239;
  float fVar241;
  float fVar243;
  undefined1 auVar231 [16];
  float fVar230;
  undefined1 auVar233 [16];
  undefined1 auVar232 [16];
  float fVar244;
  float fVar245;
  float fVar247;
  float fVar248;
  float fVar249;
  undefined1 auVar234 [32];
  float fVar240;
  float fVar242;
  float fVar246;
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  float fVar250;
  float fVar251;
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  float fVar252;
  float fVar261;
  float fVar262;
  undefined1 auVar253 [16];
  float fVar265;
  float fVar266;
  float fVar267;
  float fVar268;
  undefined1 auVar254 [32];
  float fVar263;
  float fVar269;
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  float fVar264;
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  float fVar270;
  undefined1 auVar271 [16];
  float fVar278;
  float fVar279;
  float fVar281;
  float fVar282;
  float fVar283;
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  float fVar280;
  float fVar284;
  undefined1 auVar277 [32];
  undefined1 auVar286 [16];
  float fVar285;
  float fVar293;
  float fVar294;
  float fVar296;
  float fVar297;
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  float fVar295;
  undefined1 auVar292 [32];
  undefined1 auVar298 [16];
  float fVar307;
  float fVar309;
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  float fVar308;
  undefined1 auVar305 [32];
  float fVar310;
  undefined1 auVar306 [32];
  float fVar320;
  float fVar321;
  float fVar322;
  float fVar323;
  float fVar324;
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  float fVar325;
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  float fVar326;
  float fVar334;
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [64];
  float fVar341;
  float fVar342;
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  float in_register_0000151c;
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  float fVar351;
  float fVar357;
  float fVar360;
  float fVar362;
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  float fVar358;
  float fVar359;
  float fVar361;
  float fVar363;
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  float fVar364;
  float fVar367;
  float fVar368;
  float fVar369;
  float in_register_0000159c;
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  float in_register_000015dc;
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [16];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_8> bhit;
  bool local_7f5;
  int local_7f4;
  RayQueryContext *local_7f0;
  Ray *local_7e8;
  undefined1 local_7e0 [4];
  undefined1 auStack_7dc [8];
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  uint local_7c0;
  undefined4 uStack_7bc;
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  ulong local_790;
  Precalculations *local_788;
  undefined1 local_780 [32];
  undefined1 local_760 [48];
  RTCFilterFunctionNArguments local_730;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [8];
  undefined8 uStack_6d8;
  undefined1 auStack_6d0 [8];
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [8];
  undefined8 uStack_6b8;
  undefined1 auStack_6b0 [8];
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [48];
  undefined1 local_670 [8];
  undefined8 uStack_668;
  undefined8 local_660;
  undefined4 local_658;
  float local_654;
  uint local_650;
  undefined4 local_64c;
  undefined4 local_648;
  uint local_644;
  uint local_640;
  ulong local_628;
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  undefined1 auStack_5b0 [8];
  float fStack_5a8;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  undefined1 auStack_510 [8];
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4b0 [16];
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined1 local_360 [8];
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  uint local_2a0;
  uint local_29c;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined1 local_240 [32];
  float local_220 [4];
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined1 local_80 [32];
  undefined1 auVar181 [24];
  
  local_788 = pre;
  PVar33 = prim[1];
  uVar148 = (ulong)(byte)PVar33;
  lVar152 = uVar148 * 0x25;
  fVar206 = *(float *)(prim + lVar152 + 0x12);
  auVar373 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + lVar152 + 6));
  auVar177._0_4_ = fVar206 * auVar373._0_4_;
  auVar177._4_4_ = fVar206 * auVar373._4_4_;
  auVar177._8_4_ = fVar206 * auVar373._8_4_;
  auVar177._12_4_ = fVar206 * auVar373._12_4_;
  auVar253._0_4_ = fVar206 * (ray->dir).field_0.m128[0];
  auVar253._4_4_ = fVar206 * (ray->dir).field_0.m128[1];
  auVar253._8_4_ = fVar206 * (ray->dir).field_0.m128[2];
  auVar253._12_4_ = fVar206 * (ray->dir).field_0.m128[3];
  auVar373 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar148 * 4 + 6)));
  auVar196 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar148 * 4 + 10)));
  auVar159._16_16_ = auVar196;
  auVar159._0_16_ = auVar373;
  lVar154 = uVar148 * 5;
  auVar373 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar154 + 6)));
  auVar196 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar154 + 10)));
  auVar159 = vcvtdq2ps_avx(auVar159);
  auVar200._16_16_ = auVar196;
  auVar200._0_16_ = auVar373;
  auVar39 = vcvtdq2ps_avx(auVar200);
  auVar373 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar148 * 6 + 6)));
  auVar196 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar148 * 6 + 10)));
  auVar211._16_16_ = auVar196;
  auVar211._0_16_ = auVar373;
  auVar373 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar148 * 0xf + 6)));
  auVar40 = vcvtdq2ps_avx(auVar211);
  auVar196 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar148 * 0xf + 10)));
  auVar212._16_16_ = auVar196;
  auVar212._0_16_ = auVar373;
  lVar151 = (ulong)(byte)PVar33 * 0x10;
  auVar373 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar151 + 6)));
  auVar41 = vcvtdq2ps_avx(auVar212);
  auVar196 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar151 + 10)));
  auVar272._16_16_ = auVar196;
  auVar272._0_16_ = auVar373;
  auVar42 = vcvtdq2ps_avx(auVar272);
  auVar373 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar151 + uVar148 + 6)));
  auVar196 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar151 + uVar148 + 10)));
  auVar287._16_16_ = auVar196;
  auVar287._0_16_ = auVar373;
  auVar43 = vcvtdq2ps_avx(auVar287);
  auVar373 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar148 * 0x1a + 6)));
  auVar196 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar148 * 0x1a + 10)));
  auVar299._16_16_ = auVar196;
  auVar299._0_16_ = auVar373;
  auVar373 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar148 * 0x1b + 6)));
  auVar196 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar148 * 0x1b + 10)));
  auVar44 = vcvtdq2ps_avx(auVar299);
  auVar311._16_16_ = auVar196;
  auVar311._0_16_ = auVar373;
  auVar45 = vcvtdq2ps_avx(auVar311);
  auVar373 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar148 * 0x1c + 6)));
  auVar196 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar148 * 0x1c + 10)));
  auVar327._16_16_ = auVar196;
  auVar327._0_16_ = auVar373;
  auVar46 = vcvtdq2ps_avx(auVar327);
  auVar373 = vshufps_avx(auVar253,auVar253,0);
  auVar196 = vshufps_avx(auVar253,auVar253,0x55);
  auVar233 = vshufps_avx(auVar253,auVar253,0xaa);
  fVar206 = auVar233._0_4_;
  fVar204 = auVar233._4_4_;
  fVar220 = auVar233._8_4_;
  fVar225 = auVar233._12_4_;
  fVar222 = auVar196._0_4_;
  fVar359 = auVar196._4_4_;
  fVar224 = auVar196._8_4_;
  fVar264 = auVar196._12_4_;
  fVar226 = auVar373._0_4_;
  fVar227 = auVar373._4_4_;
  fVar228 = auVar373._8_4_;
  fVar229 = auVar373._12_4_;
  auVar343._0_4_ = fVar226 * auVar159._0_4_ + fVar222 * auVar39._0_4_ + fVar206 * auVar40._0_4_;
  auVar343._4_4_ = fVar227 * auVar159._4_4_ + fVar359 * auVar39._4_4_ + fVar204 * auVar40._4_4_;
  auVar343._8_4_ = fVar228 * auVar159._8_4_ + fVar224 * auVar39._8_4_ + fVar220 * auVar40._8_4_;
  auVar343._12_4_ = fVar229 * auVar159._12_4_ + fVar264 * auVar39._12_4_ + fVar225 * auVar40._12_4_;
  auVar343._16_4_ = fVar226 * auVar159._16_4_ + fVar222 * auVar39._16_4_ + fVar206 * auVar40._16_4_;
  auVar343._20_4_ = fVar227 * auVar159._20_4_ + fVar359 * auVar39._20_4_ + fVar204 * auVar40._20_4_;
  auVar343._24_4_ = fVar228 * auVar159._24_4_ + fVar224 * auVar39._24_4_ + fVar220 * auVar40._24_4_;
  auVar343._28_4_ = fVar264 + in_register_000015dc + in_register_0000151c;
  auVar335._0_4_ = fVar226 * auVar41._0_4_ + fVar222 * auVar42._0_4_ + fVar206 * auVar43._0_4_;
  auVar335._4_4_ = fVar227 * auVar41._4_4_ + fVar359 * auVar42._4_4_ + fVar204 * auVar43._4_4_;
  auVar335._8_4_ = fVar228 * auVar41._8_4_ + fVar224 * auVar42._8_4_ + fVar220 * auVar43._8_4_;
  auVar335._12_4_ = fVar229 * auVar41._12_4_ + fVar264 * auVar42._12_4_ + fVar225 * auVar43._12_4_;
  auVar335._16_4_ = fVar226 * auVar41._16_4_ + fVar222 * auVar42._16_4_ + fVar206 * auVar43._16_4_;
  auVar335._20_4_ = fVar227 * auVar41._20_4_ + fVar359 * auVar42._20_4_ + fVar204 * auVar43._20_4_;
  auVar335._24_4_ = fVar228 * auVar41._24_4_ + fVar224 * auVar42._24_4_ + fVar220 * auVar43._24_4_;
  auVar335._28_4_ = fVar264 + in_register_000015dc + in_register_0000159c;
  auVar254._0_4_ = fVar226 * auVar44._0_4_ + fVar222 * auVar45._0_4_ + auVar46._0_4_ * fVar206;
  auVar254._4_4_ = fVar227 * auVar44._4_4_ + fVar359 * auVar45._4_4_ + auVar46._4_4_ * fVar204;
  auVar254._8_4_ = fVar228 * auVar44._8_4_ + fVar224 * auVar45._8_4_ + auVar46._8_4_ * fVar220;
  auVar254._12_4_ = fVar229 * auVar44._12_4_ + fVar264 * auVar45._12_4_ + auVar46._12_4_ * fVar225;
  auVar254._16_4_ = fVar226 * auVar44._16_4_ + fVar222 * auVar45._16_4_ + auVar46._16_4_ * fVar206;
  auVar254._20_4_ = fVar227 * auVar44._20_4_ + fVar359 * auVar45._20_4_ + auVar46._20_4_ * fVar204;
  auVar254._24_4_ = fVar228 * auVar44._24_4_ + fVar224 * auVar45._24_4_ + auVar46._24_4_ * fVar220;
  auVar254._28_4_ = fVar229 + fVar264 + fVar225;
  auVar373 = vshufps_avx(auVar177,auVar177,0);
  auVar196 = vshufps_avx(auVar177,auVar177,0x55);
  auVar233 = vshufps_avx(auVar177,auVar177,0xaa);
  fVar204 = auVar233._0_4_;
  fVar220 = auVar233._4_4_;
  fVar225 = auVar233._8_4_;
  fVar222 = auVar233._12_4_;
  fVar227 = auVar196._0_4_;
  fVar228 = auVar196._4_4_;
  fVar229 = auVar196._8_4_;
  fVar239 = auVar196._12_4_;
  fVar359 = auVar373._0_4_;
  fVar224 = auVar373._4_4_;
  fVar264 = auVar373._8_4_;
  fVar226 = auVar373._12_4_;
  fVar206 = auVar159._28_4_;
  auVar201._0_4_ = fVar359 * auVar159._0_4_ + fVar227 * auVar39._0_4_ + fVar204 * auVar40._0_4_;
  auVar201._4_4_ = fVar224 * auVar159._4_4_ + fVar228 * auVar39._4_4_ + fVar220 * auVar40._4_4_;
  auVar201._8_4_ = fVar264 * auVar159._8_4_ + fVar229 * auVar39._8_4_ + fVar225 * auVar40._8_4_;
  auVar201._12_4_ = fVar226 * auVar159._12_4_ + fVar239 * auVar39._12_4_ + fVar222 * auVar40._12_4_;
  auVar201._16_4_ = fVar359 * auVar159._16_4_ + fVar227 * auVar39._16_4_ + fVar204 * auVar40._16_4_;
  auVar201._20_4_ = fVar224 * auVar159._20_4_ + fVar228 * auVar39._20_4_ + fVar220 * auVar40._20_4_;
  auVar201._24_4_ = fVar264 * auVar159._24_4_ + fVar229 * auVar39._24_4_ + fVar225 * auVar40._24_4_;
  auVar201._28_4_ = fVar206 + auVar39._28_4_ + auVar40._28_4_;
  auVar182._0_4_ = fVar359 * auVar41._0_4_ + fVar227 * auVar42._0_4_ + fVar204 * auVar43._0_4_;
  auVar182._4_4_ = fVar224 * auVar41._4_4_ + fVar228 * auVar42._4_4_ + fVar220 * auVar43._4_4_;
  auVar182._8_4_ = fVar264 * auVar41._8_4_ + fVar229 * auVar42._8_4_ + fVar225 * auVar43._8_4_;
  auVar182._12_4_ = fVar226 * auVar41._12_4_ + fVar239 * auVar42._12_4_ + fVar222 * auVar43._12_4_;
  auVar182._16_4_ = fVar359 * auVar41._16_4_ + fVar227 * auVar42._16_4_ + fVar204 * auVar43._16_4_;
  auVar182._20_4_ = fVar224 * auVar41._20_4_ + fVar228 * auVar42._20_4_ + fVar220 * auVar43._20_4_;
  auVar182._24_4_ = fVar264 * auVar41._24_4_ + fVar229 * auVar42._24_4_ + fVar225 * auVar43._24_4_;
  auVar182._28_4_ = fVar206 + auVar40._28_4_ + auVar43._28_4_;
  auVar160._0_4_ = fVar359 * auVar44._0_4_ + fVar227 * auVar45._0_4_ + auVar46._0_4_ * fVar204;
  auVar160._4_4_ = fVar224 * auVar44._4_4_ + fVar228 * auVar45._4_4_ + auVar46._4_4_ * fVar220;
  auVar160._8_4_ = fVar264 * auVar44._8_4_ + fVar229 * auVar45._8_4_ + auVar46._8_4_ * fVar225;
  auVar160._12_4_ = fVar226 * auVar44._12_4_ + fVar239 * auVar45._12_4_ + auVar46._12_4_ * fVar222;
  auVar160._16_4_ = fVar359 * auVar44._16_4_ + fVar227 * auVar45._16_4_ + auVar46._16_4_ * fVar204;
  auVar160._20_4_ = fVar224 * auVar44._20_4_ + fVar228 * auVar45._20_4_ + auVar46._20_4_ * fVar220;
  auVar160._24_4_ = fVar264 * auVar44._24_4_ + fVar229 * auVar45._24_4_ + auVar46._24_4_ * fVar225;
  auVar160._28_4_ = fVar206 + auVar42._28_4_ + fVar222;
  auVar288._8_4_ = 0x7fffffff;
  auVar288._0_8_ = 0x7fffffff7fffffff;
  auVar288._12_4_ = 0x7fffffff;
  auVar288._16_4_ = 0x7fffffff;
  auVar288._20_4_ = 0x7fffffff;
  auVar288._24_4_ = 0x7fffffff;
  auVar288._28_4_ = 0x7fffffff;
  auVar213._8_4_ = 0x219392ef;
  auVar213._0_8_ = 0x219392ef219392ef;
  auVar213._12_4_ = 0x219392ef;
  auVar213._16_4_ = 0x219392ef;
  auVar213._20_4_ = 0x219392ef;
  auVar213._24_4_ = 0x219392ef;
  auVar213._28_4_ = 0x219392ef;
  auVar159 = vandps_avx(auVar343,auVar288);
  auVar159 = vcmpps_avx(auVar159,auVar213,1);
  auVar39 = vblendvps_avx(auVar343,auVar213,auVar159);
  auVar159 = vandps_avx(auVar335,auVar288);
  auVar159 = vcmpps_avx(auVar159,auVar213,1);
  auVar40 = vblendvps_avx(auVar335,auVar213,auVar159);
  auVar159 = vandps_avx(auVar254,auVar288);
  auVar159 = vcmpps_avx(auVar159,auVar213,1);
  auVar159 = vblendvps_avx(auVar254,auVar213,auVar159);
  auVar41 = vrcpps_avx(auVar39);
  fVar206 = auVar41._0_4_;
  fVar220 = auVar41._4_4_;
  auVar42._4_4_ = auVar39._4_4_ * fVar220;
  auVar42._0_4_ = auVar39._0_4_ * fVar206;
  fVar222 = auVar41._8_4_;
  auVar42._8_4_ = auVar39._8_4_ * fVar222;
  fVar224 = auVar41._12_4_;
  auVar42._12_4_ = auVar39._12_4_ * fVar224;
  fVar226 = auVar41._16_4_;
  auVar42._16_4_ = auVar39._16_4_ * fVar226;
  fVar227 = auVar41._20_4_;
  auVar42._20_4_ = auVar39._20_4_ * fVar227;
  fVar228 = auVar41._24_4_;
  auVar42._24_4_ = auVar39._24_4_ * fVar228;
  auVar42._28_4_ = auVar39._28_4_;
  auVar289._8_4_ = 0x3f800000;
  auVar289._0_8_ = &DAT_3f8000003f800000;
  auVar289._12_4_ = 0x3f800000;
  auVar289._16_4_ = 0x3f800000;
  auVar289._20_4_ = 0x3f800000;
  auVar289._24_4_ = 0x3f800000;
  auVar289._28_4_ = 0x3f800000;
  auVar43 = vsubps_avx(auVar289,auVar42);
  fVar206 = fVar206 + fVar206 * auVar43._0_4_;
  fVar220 = fVar220 + fVar220 * auVar43._4_4_;
  fVar222 = fVar222 + fVar222 * auVar43._8_4_;
  fVar224 = fVar224 + fVar224 * auVar43._12_4_;
  fVar226 = fVar226 + fVar226 * auVar43._16_4_;
  fVar227 = fVar227 + fVar227 * auVar43._20_4_;
  fVar228 = fVar228 + fVar228 * auVar43._24_4_;
  auVar42 = vrcpps_avx(auVar40);
  fVar229 = auVar42._0_4_;
  fVar239 = auVar42._4_4_;
  auVar39._4_4_ = fVar239 * auVar40._4_4_;
  auVar39._0_4_ = fVar229 * auVar40._0_4_;
  fVar241 = auVar42._8_4_;
  auVar39._8_4_ = fVar241 * auVar40._8_4_;
  fVar243 = auVar42._12_4_;
  auVar39._12_4_ = fVar243 * auVar40._12_4_;
  fVar247 = auVar42._16_4_;
  auVar39._16_4_ = fVar247 * auVar40._16_4_;
  fVar248 = auVar42._20_4_;
  auVar39._20_4_ = fVar248 * auVar40._20_4_;
  fVar249 = auVar42._24_4_;
  auVar39._24_4_ = fVar249 * auVar40._24_4_;
  auVar39._28_4_ = auVar40._28_4_;
  auVar40 = vsubps_avx(auVar289,auVar39);
  fVar229 = fVar229 + fVar229 * auVar40._0_4_;
  fVar239 = fVar239 + fVar239 * auVar40._4_4_;
  fVar241 = fVar241 + fVar241 * auVar40._8_4_;
  fVar243 = fVar243 + fVar243 * auVar40._12_4_;
  fVar247 = fVar247 + fVar247 * auVar40._16_4_;
  fVar248 = fVar248 + fVar248 * auVar40._20_4_;
  fVar249 = fVar249 + fVar249 * auVar40._24_4_;
  auVar39 = vrcpps_avx(auVar159);
  fVar252 = auVar39._0_4_;
  fVar261 = auVar39._4_4_;
  auVar44._4_4_ = fVar261 * auVar159._4_4_;
  auVar44._0_4_ = fVar252 * auVar159._0_4_;
  fVar262 = auVar39._8_4_;
  auVar44._8_4_ = fVar262 * auVar159._8_4_;
  fVar263 = auVar39._12_4_;
  auVar44._12_4_ = fVar263 * auVar159._12_4_;
  fVar265 = auVar39._16_4_;
  auVar44._16_4_ = fVar265 * auVar159._16_4_;
  fVar266 = auVar39._20_4_;
  auVar44._20_4_ = fVar266 * auVar159._20_4_;
  fVar267 = auVar39._24_4_;
  auVar44._24_4_ = fVar267 * auVar159._24_4_;
  auVar44._28_4_ = auVar159._28_4_;
  auVar159 = vsubps_avx(auVar289,auVar44);
  fVar252 = fVar252 + fVar252 * auVar159._0_4_;
  fVar261 = fVar261 + fVar261 * auVar159._4_4_;
  fVar262 = fVar262 + fVar262 * auVar159._8_4_;
  fVar263 = fVar263 + fVar263 * auVar159._12_4_;
  fVar265 = fVar265 + fVar265 * auVar159._16_4_;
  fVar266 = fVar266 + fVar266 * auVar159._20_4_;
  fVar267 = fVar267 + fVar267 * auVar159._24_4_;
  auVar373 = ZEXT416((uint)(((ray->dir).field_0.m128[3] - *(float *)(prim + lVar152 + 0x16)) *
                           *(float *)(prim + lVar152 + 0x1a)));
  auVar47 = vshufps_avx(auVar373,auVar373,0);
  auVar373._8_8_ = 0;
  auVar373._0_8_ = *(ulong *)(prim + uVar148 * 7 + 6);
  auVar373 = vpmovsxwd_avx(auVar373);
  auVar196._8_8_ = 0;
  auVar196._0_8_ = *(ulong *)(prim + uVar148 * 7 + 0xe);
  auVar196 = vpmovsxwd_avx(auVar196);
  auVar290._16_16_ = auVar196;
  auVar290._0_16_ = auVar373;
  auVar233._8_8_ = 0;
  auVar233._0_8_ = *(ulong *)(prim + uVar148 * 0xb + 6);
  auVar373 = vpmovsxwd_avx(auVar233);
  auVar159 = vcvtdq2ps_avx(auVar290);
  auVar210._8_8_ = 0;
  auVar210._0_8_ = *(ulong *)(prim + uVar148 * 0xb + 0xe);
  auVar196 = vpmovsxwd_avx(auVar210);
  auVar300._16_16_ = auVar196;
  auVar300._0_16_ = auVar373;
  auVar39 = vcvtdq2ps_avx(auVar300);
  auVar39 = vsubps_avx(auVar39,auVar159);
  fVar204 = auVar47._0_4_;
  fVar225 = auVar47._4_4_;
  fVar359 = auVar47._8_4_;
  fVar264 = auVar47._12_4_;
  auVar291._0_4_ = auVar39._0_4_ * fVar204 + auVar159._0_4_;
  auVar291._4_4_ = auVar39._4_4_ * fVar225 + auVar159._4_4_;
  auVar291._8_4_ = auVar39._8_4_ * fVar359 + auVar159._8_4_;
  auVar291._12_4_ = auVar39._12_4_ * fVar264 + auVar159._12_4_;
  auVar291._16_4_ = auVar39._16_4_ * fVar204 + auVar159._16_4_;
  auVar291._20_4_ = auVar39._20_4_ * fVar225 + auVar159._20_4_;
  auVar291._24_4_ = auVar39._24_4_ * fVar359 + auVar159._24_4_;
  auVar291._28_4_ = auVar39._28_4_ + auVar159._28_4_;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar148 * 9 + 6);
  auVar373 = vpmovsxwd_avx(auVar47);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar148 * 9 + 0xe);
  auVar196 = vpmovsxwd_avx(auVar14);
  auVar301._16_16_ = auVar196;
  auVar301._0_16_ = auVar373;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar148 * 0xd + 6);
  auVar373 = vpmovsxwd_avx(auVar15);
  auVar159 = vcvtdq2ps_avx(auVar301);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar148 * 0xd + 0xe);
  auVar196 = vpmovsxwd_avx(auVar16);
  auVar312._16_16_ = auVar196;
  auVar312._0_16_ = auVar373;
  auVar39 = vcvtdq2ps_avx(auVar312);
  auVar39 = vsubps_avx(auVar39,auVar159);
  auVar302._0_4_ = auVar159._0_4_ + auVar39._0_4_ * fVar204;
  auVar302._4_4_ = auVar159._4_4_ + auVar39._4_4_ * fVar225;
  auVar302._8_4_ = auVar159._8_4_ + auVar39._8_4_ * fVar359;
  auVar302._12_4_ = auVar159._12_4_ + auVar39._12_4_ * fVar264;
  auVar302._16_4_ = auVar159._16_4_ + auVar39._16_4_ * fVar204;
  auVar302._20_4_ = auVar159._20_4_ + auVar39._20_4_ * fVar225;
  auVar302._24_4_ = auVar159._24_4_ + auVar39._24_4_ * fVar359;
  auVar302._28_4_ = auVar159._28_4_ + auVar39._28_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar148 * 0x12 + 6);
  auVar373 = vpmovsxwd_avx(auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar148 * 0x12 + 0xe);
  auVar196 = vpmovsxwd_avx(auVar18);
  auVar313._16_16_ = auVar196;
  auVar313._0_16_ = auVar373;
  uVar153 = (ulong)(uint)((int)lVar154 << 2);
  lVar152 = uVar148 * 2 + uVar153;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + lVar152 + 6);
  auVar373 = vpmovsxwd_avx(auVar19);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + lVar152 + 0xe);
  auVar196 = vpmovsxwd_avx(auVar20);
  auVar159 = vcvtdq2ps_avx(auVar313);
  auVar328._16_16_ = auVar196;
  auVar328._0_16_ = auVar373;
  auVar39 = vcvtdq2ps_avx(auVar328);
  auVar39 = vsubps_avx(auVar39,auVar159);
  auVar314._0_4_ = auVar159._0_4_ + auVar39._0_4_ * fVar204;
  auVar314._4_4_ = auVar159._4_4_ + auVar39._4_4_ * fVar225;
  auVar314._8_4_ = auVar159._8_4_ + auVar39._8_4_ * fVar359;
  auVar314._12_4_ = auVar159._12_4_ + auVar39._12_4_ * fVar264;
  auVar314._16_4_ = auVar159._16_4_ + auVar39._16_4_ * fVar204;
  auVar314._20_4_ = auVar159._20_4_ + auVar39._20_4_ * fVar225;
  auVar314._24_4_ = auVar159._24_4_ + auVar39._24_4_ * fVar359;
  auVar314._28_4_ = auVar159._28_4_ + auVar39._28_4_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar153 + 6);
  auVar373 = vpmovsxwd_avx(auVar21);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar153 + 0xe);
  auVar196 = vpmovsxwd_avx(auVar22);
  auVar329._16_16_ = auVar196;
  auVar329._0_16_ = auVar373;
  auVar159 = vcvtdq2ps_avx(auVar329);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar148 * 0x18 + 6);
  auVar373 = vpmovsxwd_avx(auVar23);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar148 * 0x18 + 0xe);
  auVar196 = vpmovsxwd_avx(auVar24);
  auVar336._16_16_ = auVar196;
  auVar336._0_16_ = auVar373;
  auVar39 = vcvtdq2ps_avx(auVar336);
  auVar39 = vsubps_avx(auVar39,auVar159);
  auVar330._0_4_ = auVar159._0_4_ + auVar39._0_4_ * fVar204;
  auVar330._4_4_ = auVar159._4_4_ + auVar39._4_4_ * fVar225;
  auVar330._8_4_ = auVar159._8_4_ + auVar39._8_4_ * fVar359;
  auVar330._12_4_ = auVar159._12_4_ + auVar39._12_4_ * fVar264;
  auVar330._16_4_ = auVar159._16_4_ + auVar39._16_4_ * fVar204;
  auVar330._20_4_ = auVar159._20_4_ + auVar39._20_4_ * fVar225;
  auVar330._24_4_ = auVar159._24_4_ + auVar39._24_4_ * fVar359;
  auVar330._28_4_ = auVar159._28_4_ + auVar39._28_4_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar148 * 0x1d + 6);
  auVar373 = vpmovsxwd_avx(auVar25);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar148 * 0x1d + 0xe);
  auVar196 = vpmovsxwd_avx(auVar26);
  auVar337._16_16_ = auVar196;
  auVar337._0_16_ = auVar373;
  lVar152 = uVar148 + (ulong)(byte)PVar33 * 0x20;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + lVar152 + 6);
  auVar373 = vpmovsxwd_avx(auVar27);
  auVar159 = vcvtdq2ps_avx(auVar337);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + lVar152 + 0xe);
  auVar196 = vpmovsxwd_avx(auVar28);
  auVar344._16_16_ = auVar196;
  auVar344._0_16_ = auVar373;
  auVar39 = vcvtdq2ps_avx(auVar344);
  auVar39 = vsubps_avx(auVar39,auVar159);
  lVar152 = (ulong)(byte)PVar33 * 0x20 - uVar148;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + lVar152 + 6);
  auVar373 = vpmovsxwd_avx(auVar29);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + lVar152 + 0xe);
  auVar196 = vpmovsxwd_avx(auVar30);
  auVar338._0_4_ = auVar159._0_4_ + auVar39._0_4_ * fVar204;
  auVar338._4_4_ = auVar159._4_4_ + auVar39._4_4_ * fVar225;
  auVar338._8_4_ = auVar159._8_4_ + auVar39._8_4_ * fVar359;
  auVar338._12_4_ = auVar159._12_4_ + auVar39._12_4_ * fVar264;
  auVar338._16_4_ = auVar159._16_4_ + auVar39._16_4_ * fVar204;
  auVar338._20_4_ = auVar159._20_4_ + auVar39._20_4_ * fVar225;
  auVar338._24_4_ = auVar159._24_4_ + auVar39._24_4_ * fVar359;
  auVar338._28_4_ = auVar159._28_4_ + auVar39._28_4_;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar148 * 0x23 + 6);
  auVar233 = vpmovsxwd_avx(auVar31);
  auVar352._16_16_ = auVar196;
  auVar352._0_16_ = auVar373;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)(prim + uVar148 * 0x23 + 0xe);
  auVar373 = vpmovsxwd_avx(auVar32);
  auVar345._16_16_ = auVar373;
  auVar345._0_16_ = auVar233;
  auVar159 = vcvtdq2ps_avx(auVar352);
  auVar39 = vcvtdq2ps_avx(auVar345);
  auVar39 = vsubps_avx(auVar39,auVar159);
  auVar346._0_4_ = auVar159._0_4_ + auVar39._0_4_ * fVar204;
  auVar346._4_4_ = auVar159._4_4_ + auVar39._4_4_ * fVar225;
  auVar346._8_4_ = auVar159._8_4_ + auVar39._8_4_ * fVar359;
  auVar346._12_4_ = auVar159._12_4_ + auVar39._12_4_ * fVar264;
  auVar346._16_4_ = auVar159._16_4_ + auVar39._16_4_ * fVar204;
  auVar346._20_4_ = auVar159._20_4_ + auVar39._20_4_ * fVar225;
  auVar346._24_4_ = auVar159._24_4_ + auVar39._24_4_ * fVar359;
  auVar346._28_4_ = auVar159._28_4_ + fVar264;
  auVar159 = vsubps_avx(auVar291,auVar201);
  auVar271._0_4_ = fVar206 * auVar159._0_4_;
  auVar271._4_4_ = fVar220 * auVar159._4_4_;
  auVar271._8_4_ = fVar222 * auVar159._8_4_;
  auVar271._12_4_ = fVar224 * auVar159._12_4_;
  auVar45._16_4_ = fVar226 * auVar159._16_4_;
  auVar45._0_16_ = auVar271;
  auVar45._20_4_ = fVar227 * auVar159._20_4_;
  auVar45._24_4_ = fVar228 * auVar159._24_4_;
  auVar45._28_4_ = auVar159._28_4_;
  auVar159 = vsubps_avx(auVar302,auVar201);
  auVar208._0_4_ = fVar206 * auVar159._0_4_;
  auVar208._4_4_ = fVar220 * auVar159._4_4_;
  auVar208._8_4_ = fVar222 * auVar159._8_4_;
  auVar208._12_4_ = fVar224 * auVar159._12_4_;
  auVar46._16_4_ = fVar226 * auVar159._16_4_;
  auVar46._0_16_ = auVar208;
  auVar46._20_4_ = fVar227 * auVar159._20_4_;
  auVar46._24_4_ = fVar228 * auVar159._24_4_;
  auVar46._28_4_ = auVar41._28_4_ + auVar43._28_4_;
  auVar159 = vsubps_avx(auVar314,auVar182);
  auVar195._0_4_ = fVar229 * auVar159._0_4_;
  auVar195._4_4_ = fVar239 * auVar159._4_4_;
  auVar195._8_4_ = fVar241 * auVar159._8_4_;
  auVar195._12_4_ = fVar243 * auVar159._12_4_;
  auVar41._16_4_ = fVar247 * auVar159._16_4_;
  auVar41._0_16_ = auVar195;
  auVar41._20_4_ = fVar248 * auVar159._20_4_;
  auVar41._24_4_ = fVar249 * auVar159._24_4_;
  auVar41._28_4_ = auVar159._28_4_;
  auVar159 = vsubps_avx(auVar330,auVar182);
  auVar231._0_4_ = fVar229 * auVar159._0_4_;
  auVar231._4_4_ = fVar239 * auVar159._4_4_;
  auVar231._8_4_ = fVar241 * auVar159._8_4_;
  auVar231._12_4_ = fVar243 * auVar159._12_4_;
  auVar43._16_4_ = fVar247 * auVar159._16_4_;
  auVar43._0_16_ = auVar231;
  auVar43._20_4_ = fVar248 * auVar159._20_4_;
  auVar43._24_4_ = fVar249 * auVar159._24_4_;
  auVar43._28_4_ = auVar42._28_4_ + auVar40._28_4_;
  auVar159 = vsubps_avx(auVar338,auVar160);
  auVar178._0_4_ = fVar252 * auVar159._0_4_;
  auVar178._4_4_ = fVar261 * auVar159._4_4_;
  auVar178._8_4_ = fVar262 * auVar159._8_4_;
  auVar178._12_4_ = fVar263 * auVar159._12_4_;
  auVar40._16_4_ = fVar265 * auVar159._16_4_;
  auVar40._0_16_ = auVar178;
  auVar40._20_4_ = fVar266 * auVar159._20_4_;
  auVar40._24_4_ = fVar267 * auVar159._24_4_;
  auVar40._28_4_ = auVar159._28_4_;
  auVar159 = vsubps_avx(auVar346,auVar160);
  auVar156._0_4_ = fVar252 * auVar159._0_4_;
  auVar156._4_4_ = fVar261 * auVar159._4_4_;
  auVar156._8_4_ = fVar262 * auVar159._8_4_;
  auVar156._12_4_ = fVar263 * auVar159._12_4_;
  auVar48._16_4_ = fVar265 * auVar159._16_4_;
  auVar48._0_16_ = auVar156;
  auVar48._20_4_ = fVar266 * auVar159._20_4_;
  auVar48._24_4_ = fVar267 * auVar159._24_4_;
  auVar48._28_4_ = auVar159._28_4_;
  auVar373 = vpminsd_avx(auVar45._16_16_,auVar46._16_16_);
  auVar196 = vpminsd_avx(auVar271,auVar208);
  auVar303._16_16_ = auVar373;
  auVar303._0_16_ = auVar196;
  auVar373 = vpminsd_avx(auVar41._16_16_,auVar43._16_16_);
  auVar196 = vpminsd_avx(auVar195,auVar231);
  auVar339._16_16_ = auVar373;
  auVar339._0_16_ = auVar196;
  auVar159 = vmaxps_avx(auVar303,auVar339);
  auVar373 = vpminsd_avx(auVar40._16_16_,auVar48._16_16_);
  auVar196 = vpminsd_avx(auVar178,auVar156);
  auVar353._16_16_ = auVar373;
  auVar353._0_16_ = auVar196;
  uVar12 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar365._4_4_ = uVar12;
  auVar365._0_4_ = uVar12;
  auVar365._8_4_ = uVar12;
  auVar365._12_4_ = uVar12;
  auVar365._16_4_ = uVar12;
  auVar365._20_4_ = uVar12;
  auVar365._24_4_ = uVar12;
  auVar365._28_4_ = uVar12;
  auVar39 = vmaxps_avx(auVar353,auVar365);
  auVar159 = vmaxps_avx(auVar159,auVar39);
  local_80._4_4_ = auVar159._4_4_ * 0.99999964;
  local_80._0_4_ = auVar159._0_4_ * 0.99999964;
  local_80._8_4_ = auVar159._8_4_ * 0.99999964;
  local_80._12_4_ = auVar159._12_4_ * 0.99999964;
  local_80._16_4_ = auVar159._16_4_ * 0.99999964;
  local_80._20_4_ = auVar159._20_4_ * 0.99999964;
  local_80._24_4_ = auVar159._24_4_ * 0.99999964;
  local_80._28_4_ = auVar159._28_4_;
  auVar373 = vpmaxsd_avx(auVar45._16_16_,auVar46._16_16_);
  auVar196 = vpmaxsd_avx(auVar271,auVar208);
  auVar214._16_16_ = auVar373;
  auVar214._0_16_ = auVar196;
  auVar373 = vpmaxsd_avx(auVar41._16_16_,auVar43._16_16_);
  auVar196 = vpmaxsd_avx(auVar195,auVar231);
  auVar202._16_16_ = auVar373;
  auVar202._0_16_ = auVar196;
  auVar159 = vminps_avx(auVar214,auVar202);
  auVar373 = vpmaxsd_avx(auVar40._16_16_,auVar48._16_16_);
  auVar196 = vpmaxsd_avx(auVar178,auVar156);
  auVar161._16_16_ = auVar373;
  auVar161._0_16_ = auVar196;
  fVar206 = ray->tfar;
  auVar183._4_4_ = fVar206;
  auVar183._0_4_ = fVar206;
  auVar183._8_4_ = fVar206;
  auVar183._12_4_ = fVar206;
  auVar183._16_4_ = fVar206;
  auVar183._20_4_ = fVar206;
  auVar183._24_4_ = fVar206;
  auVar183._28_4_ = fVar206;
  auVar39 = vminps_avx(auVar161,auVar183);
  auVar159 = vminps_avx(auVar159,auVar39);
  auVar38._4_4_ = auVar159._4_4_ * 1.0000004;
  auVar38._0_4_ = auVar159._0_4_ * 1.0000004;
  auVar38._8_4_ = auVar159._8_4_ * 1.0000004;
  auVar38._12_4_ = auVar159._12_4_ * 1.0000004;
  auVar38._16_4_ = auVar159._16_4_ * 1.0000004;
  auVar38._20_4_ = auVar159._20_4_ * 1.0000004;
  auVar38._24_4_ = auVar159._24_4_ * 1.0000004;
  auVar38._28_4_ = auVar159._28_4_;
  auVar159 = vcmpps_avx(local_80,auVar38,2);
  auVar373 = vpshufd_avx(ZEXT116((byte)PVar33),0);
  auVar184._16_16_ = auVar373;
  auVar184._0_16_ = auVar373;
  auVar39 = vcvtdq2ps_avx(auVar184);
  auVar39 = vcmpps_avx(_DAT_02020f40,auVar39,1);
  auVar159 = vandps_avx(auVar159,auVar39);
  uVar145 = vmovmskps_avx(auVar159);
  local_7f5 = uVar145 != 0;
  if (local_7f5) {
    uVar145 = uVar145 & 0xff;
    local_4a0 = mm_lookupmask_ps._16_8_;
    uStack_498 = mm_lookupmask_ps._24_8_;
    uStack_490 = mm_lookupmask_ps._16_8_;
    uStack_488 = mm_lookupmask_ps._24_8_;
    local_7e8 = ray;
    do {
      lVar152 = 0;
      if (uVar145 != 0) {
        for (; (uVar145 >> lVar152 & 1) == 0; lVar152 = lVar152 + 1) {
        }
      }
      local_790 = (ulong)*(uint *)(prim + 2);
      pGVar34 = (context->scene->geometries).items[*(uint *)(prim + 2)].ptr;
      local_628 = (ulong)*(uint *)(prim + lVar152 * 4 + 6);
      uVar148 = (ulong)*(uint *)(*(long *)&pGVar34->field_0x58 +
                                (ulong)*(uint *)(prim + lVar152 * 4 + 6) *
                                pGVar34[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar206 = (pGVar34->time_range).lower;
      fVar206 = pGVar34->fnumTimeSegments *
                (((ray->dir).field_0.m128[3] - fVar206) / ((pGVar34->time_range).upper - fVar206));
      auVar373 = vroundss_avx(ZEXT416((uint)fVar206),ZEXT416((uint)fVar206),9);
      auVar373 = vminss_avx(auVar373,ZEXT416((uint)(pGVar34->fnumTimeSegments + -1.0)));
      auVar373 = vmaxss_avx(ZEXT816(0) << 0x20,auVar373);
      fVar206 = fVar206 - auVar373._0_4_;
      _Var35 = pGVar34[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar150 = (long)(int)auVar373._0_4_ * 0x38;
      lVar154 = *(long *)(_Var35 + 0x10 + lVar150);
      lVar151 = *(long *)(_Var35 + 0x38 + lVar150);
      lVar36 = *(long *)(_Var35 + 0x48 + lVar150);
      auVar373 = vshufps_avx(ZEXT416((uint)fVar206),ZEXT416((uint)fVar206),0);
      pfVar1 = (float *)(lVar151 + lVar36 * uVar148);
      fVar204 = auVar373._0_4_;
      fVar220 = auVar373._4_4_;
      fVar225 = auVar373._8_4_;
      fVar222 = auVar373._12_4_;
      lVar152 = uVar148 + 1;
      pfVar2 = (float *)(lVar151 + lVar36 * lVar152);
      p_Var37 = pGVar34[4].occlusionFilterN;
      auVar373 = vshufps_avx(ZEXT416((uint)(1.0 - fVar206)),ZEXT416((uint)(1.0 - fVar206)),0);
      pfVar3 = (float *)(*(long *)(_Var35 + lVar150) + lVar154 * uVar148);
      fVar206 = auVar373._0_4_;
      fVar359 = auVar373._4_4_;
      fVar224 = auVar373._8_4_;
      fVar264 = auVar373._12_4_;
      pfVar4 = (float *)(*(long *)(_Var35 + lVar150) + lVar154 * lVar152);
      pfVar5 = (float *)(*(long *)(p_Var37 + lVar150 + 0x38) +
                        uVar148 * *(long *)(p_Var37 + lVar150 + 0x48));
      pfVar6 = (float *)(*(long *)(p_Var37 + lVar150 + 0x38) +
                        *(long *)(p_Var37 + lVar150 + 0x48) * lVar152);
      uVar153 = *(long *)(p_Var37 + lVar150 + 0x10) * lVar152;
      pfVar7 = (float *)(*(long *)(p_Var37 + lVar150) +
                        *(long *)(p_Var37 + lVar150 + 0x10) * uVar148);
      pfVar8 = (float *)(*(long *)(p_Var37 + lVar150) + uVar153);
      uVar149 = (uint)pGVar34[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar152 = (long)(int)uVar149 * 0x44;
      fVar226 = fVar206 * *pfVar3 + fVar204 * *pfVar1;
      fVar227 = fVar359 * pfVar3[1] + fVar220 * pfVar1[1];
      local_670 = (undefined1  [8])CONCAT44(fVar227,fVar226);
      uStack_668._0_4_ = fVar224 * pfVar3[2] + fVar225 * pfVar1[2];
      uStack_668._4_4_ = fVar264 * pfVar3[3] + fVar222 * pfVar1[3];
      local_3d0._0_8_ =
           CONCAT44(fVar359 * pfVar4[1] + fVar220 * pfVar2[1],fVar206 * *pfVar4 + fVar204 * *pfVar2)
      ;
      local_3d0._8_4_ = fVar224 * pfVar4[2] + fVar225 * pfVar2[2];
      local_3d0._12_4_ = fVar264 * pfVar4[3] + fVar222 * pfVar2[3];
      local_4b0._0_8_ =
           CONCAT44(fVar227 + (fVar359 * pfVar7[1] + fVar220 * pfVar5[1]) * 0.33333334,
                    fVar226 + (fVar206 * *pfVar7 + fVar204 * *pfVar5) * 0.33333334);
      local_4b0._8_4_ = (float)uStack_668 + (fVar224 * pfVar7[2] + fVar225 * pfVar5[2]) * 0.33333334
      ;
      local_4b0._12_4_ = uStack_668._4_4_ + (fVar264 * pfVar7[3] + fVar222 * pfVar5[3]) * 0.33333334
      ;
      auVar157._0_4_ = (fVar206 * *pfVar8 + fVar204 * *pfVar6) * 0.33333334;
      auVar157._4_4_ = (fVar359 * pfVar8[1] + fVar220 * pfVar6[1]) * 0.33333334;
      auVar157._8_4_ = (fVar224 * pfVar8[2] + fVar225 * pfVar6[2]) * 0.33333334;
      auVar157._12_4_ = (fVar264 * pfVar8[3] + fVar222 * pfVar6[3]) * 0.33333334;
      local_3e0 = vsubps_avx(local_3d0,auVar157);
      aVar13 = (local_7e8->org).field_0;
      auVar233 = vsubps_avx(_local_670,(undefined1  [16])aVar13);
      auVar15 = _local_670;
      auVar373 = vshufps_avx(auVar233,auVar233,0);
      auVar196 = vshufps_avx(auVar233,auVar233,0x55);
      auVar233 = vshufps_avx(auVar233,auVar233,0xaa);
      fVar206 = (local_788->ray_space).vx.field_0.m128[0];
      fVar204 = (local_788->ray_space).vx.field_0.m128[1];
      fVar220 = (local_788->ray_space).vx.field_0.m128[2];
      fVar225 = (local_788->ray_space).vx.field_0.m128[3];
      fVar222 = (local_788->ray_space).vy.field_0.m128[0];
      fVar359 = (local_788->ray_space).vy.field_0.m128[1];
      fVar224 = (local_788->ray_space).vy.field_0.m128[2];
      fVar264 = (local_788->ray_space).vy.field_0.m128[3];
      fVar226 = (local_788->ray_space).vz.field_0.m128[0];
      fVar227 = (local_788->ray_space).vz.field_0.m128[1];
      fVar228 = (local_788->ray_space).vz.field_0.m128[2];
      fVar229 = (local_788->ray_space).vz.field_0.m128[3];
      auVar209._0_8_ =
           CONCAT44(auVar373._4_4_ * fVar204 + auVar233._4_4_ * fVar227 + auVar196._4_4_ * fVar359,
                    auVar373._0_4_ * fVar206 + auVar233._0_4_ * fVar226 + auVar196._0_4_ * fVar222);
      auVar209._8_4_ =
           auVar373._8_4_ * fVar220 + auVar233._8_4_ * fVar228 + auVar196._8_4_ * fVar224;
      auVar209._12_4_ =
           auVar373._12_4_ * fVar225 + auVar233._12_4_ * fVar229 + auVar196._12_4_ * fVar264;
      auVar373 = vblendps_avx(auVar209,_local_670,8);
      auVar16 = local_4b0;
      auVar210 = vsubps_avx(local_4b0,(undefined1  [16])aVar13);
      auVar196 = vshufps_avx(auVar210,auVar210,0);
      auVar233 = vshufps_avx(auVar210,auVar210,0x55);
      auVar210 = vshufps_avx(auVar210,auVar210,0xaa);
      auVar286._0_4_ =
           auVar196._0_4_ * fVar206 + auVar233._0_4_ * fVar222 + fVar226 * auVar210._0_4_;
      auVar286._4_4_ =
           auVar196._4_4_ * fVar204 + auVar233._4_4_ * fVar359 + fVar227 * auVar210._4_4_;
      auVar286._8_4_ =
           auVar196._8_4_ * fVar220 + auVar233._8_4_ * fVar224 + fVar228 * auVar210._8_4_;
      auVar286._12_4_ =
           auVar196._12_4_ * fVar225 + auVar233._12_4_ * fVar264 + fVar229 * auVar210._12_4_;
      auVar196 = vblendps_avx(auVar286,local_4b0,8);
      auVar47 = vsubps_avx(local_3e0,(undefined1  [16])aVar13);
      auVar233 = vshufps_avx(auVar47,auVar47,0);
      auVar210 = vshufps_avx(auVar47,auVar47,0x55);
      auVar47 = vshufps_avx(auVar47,auVar47,0xaa);
      auVar298._0_4_ = auVar233._0_4_ * fVar206 + auVar210._0_4_ * fVar222 + auVar47._0_4_ * fVar226
      ;
      auVar298._4_4_ = auVar233._4_4_ * fVar204 + auVar210._4_4_ * fVar359 + auVar47._4_4_ * fVar227
      ;
      auVar298._8_4_ = auVar233._8_4_ * fVar220 + auVar210._8_4_ * fVar224 + auVar47._8_4_ * fVar228
      ;
      auVar298._12_4_ =
           auVar233._12_4_ * fVar225 + auVar210._12_4_ * fVar264 + auVar47._12_4_ * fVar229;
      auVar233 = vblendps_avx(auVar298,local_3e0,8);
      auVar14 = vsubps_avx(local_3d0,(undefined1  [16])aVar13);
      auVar210 = vshufps_avx(auVar14,auVar14,0);
      auVar47 = vshufps_avx(auVar14,auVar14,0x55);
      auVar14 = vshufps_avx(auVar14,auVar14,0xaa);
      auVar179._0_4_ = auVar210._0_4_ * fVar206 + auVar14._0_4_ * fVar226 + auVar47._0_4_ * fVar222;
      auVar179._4_4_ = auVar210._4_4_ * fVar204 + auVar14._4_4_ * fVar227 + auVar47._4_4_ * fVar359;
      auVar179._8_4_ = auVar210._8_4_ * fVar220 + auVar14._8_4_ * fVar228 + auVar47._8_4_ * fVar224;
      auVar179._12_4_ =
           auVar210._12_4_ * fVar225 + auVar14._12_4_ * fVar229 + auVar47._12_4_ * fVar264;
      auVar210 = vblendps_avx(auVar179,local_3d0,8);
      auVar232._8_4_ = 0x7fffffff;
      auVar232._0_8_ = 0x7fffffff7fffffff;
      auVar232._12_4_ = 0x7fffffff;
      auVar373 = vandps_avx(auVar373,auVar232);
      auVar196 = vandps_avx(auVar196,auVar232);
      auVar47 = vmaxps_avx(auVar373,auVar196);
      auVar373 = vandps_avx(auVar233,auVar232);
      auVar196 = vandps_avx(auVar210,auVar232);
      auVar373 = vmaxps_avx(auVar373,auVar196);
      auVar373 = vmaxps_avx(auVar47,auVar373);
      auVar196 = vmovshdup_avx(auVar373);
      auVar196 = vmaxss_avx(auVar196,auVar373);
      auVar373 = vshufpd_avx(auVar373,auVar373,1);
      auVar373 = vmaxss_avx(auVar373,auVar196);
      fVar206 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar152 + 0x908);
      fVar204 = *(float *)(bezier_basis0 + lVar152 + 0x90c);
      fVar220 = *(float *)(bezier_basis0 + lVar152 + 0x910);
      fVar225 = *(float *)(bezier_basis0 + lVar152 + 0x914);
      fVar222 = *(float *)(bezier_basis0 + lVar152 + 0x918);
      fVar359 = *(float *)(bezier_basis0 + lVar152 + 0x91c);
      fVar224 = *(float *)(bezier_basis0 + lVar152 + 0x920);
      auVar141 = *(undefined1 (*) [28])(bezier_basis0 + lVar152 + 0x908);
      local_760._0_16_ = auVar298;
      auVar196 = vshufps_avx(auVar298,auVar298,0);
      register0x00001250 = auVar196;
      _local_580 = auVar196;
      auVar233 = vshufps_avx(auVar298,auVar298,0x55);
      register0x00001310 = auVar233;
      _local_5a0 = auVar233;
      fVar264 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar152 + 0xd8c);
      fVar226 = *(float *)(bezier_basis0 + lVar152 + 0xd90);
      fVar227 = *(float *)(bezier_basis0 + lVar152 + 0xd94);
      fVar228 = *(float *)(bezier_basis0 + lVar152 + 0xd98);
      fVar229 = *(float *)(bezier_basis0 + lVar152 + 0xd9c);
      fVar239 = *(float *)(bezier_basis0 + lVar152 + 0xda0);
      fVar241 = *(float *)(bezier_basis0 + lVar152 + 0xda4);
      auVar140 = *(undefined1 (*) [28])(bezier_basis0 + lVar152 + 0xd8c);
      auVar210 = vshufps_avx(auVar179,auVar179,0);
      register0x00001550 = auVar210;
      _local_3a0 = auVar210;
      fVar351 = auVar210._0_4_;
      fVar357 = auVar210._4_4_;
      fVar360 = auVar210._8_4_;
      fVar362 = auVar210._12_4_;
      fVar175 = auVar196._0_4_;
      fVar190 = auVar196._4_4_;
      fVar205 = auVar196._8_4_;
      fVar270 = auVar196._12_4_;
      auVar196 = vshufps_avx(auVar179,auVar179,0x55);
      register0x00001250 = auVar196;
      _local_600 = auVar196;
      fVar176 = auVar196._0_4_;
      fVar191 = auVar196._4_4_;
      fVar250 = auVar196._8_4_;
      fVar278 = auVar196._12_4_;
      fVar279 = auVar233._0_4_;
      fVar281 = auVar233._4_4_;
      fVar283 = auVar233._8_4_;
      fVar244 = auVar233._12_4_;
      auVar14 = local_3e0;
      auVar196 = vshufps_avx(local_3e0,local_3e0,0xff);
      register0x00001390 = auVar196;
      _local_160 = auVar196;
      auVar17 = local_3d0;
      auVar233 = vshufps_avx(local_3d0,local_3d0,0xff);
      register0x00001590 = auVar233;
      _local_a0 = auVar233;
      fVar358 = auVar233._0_4_;
      fVar361 = auVar233._4_4_;
      fVar363 = auVar233._8_4_;
      fVar364 = auVar233._12_4_;
      fVar230 = auVar196._0_4_;
      fVar240 = auVar196._4_4_;
      fVar242 = auVar196._8_4_;
      auVar233 = vshufps_avx(auVar286,auVar286,0);
      register0x00001510 = auVar233;
      _local_700 = auVar233;
      pauVar10 = (undefined1 (*) [32])(bezier_basis0 + lVar152 + 0x484);
      fVar243 = *(float *)*pauVar10;
      fVar247 = *(float *)(bezier_basis0 + lVar152 + 0x488);
      fVar248 = *(float *)(bezier_basis0 + lVar152 + 0x48c);
      fVar249 = *(float *)(bezier_basis0 + lVar152 + 0x490);
      fVar252 = *(float *)(bezier_basis0 + lVar152 + 0x494);
      fVar261 = *(float *)(bezier_basis0 + lVar152 + 0x498);
      fVar262 = *(float *)(bezier_basis0 + lVar152 + 0x49c);
      auVar142 = *(undefined1 (*) [28])*pauVar10;
      fVar263 = *(float *)(bezier_basis0 + lVar152 + 0x4a0);
      _auStack_510 = SUB3216(*pauVar10,0x10);
      fVar309 = auVar233._0_4_;
      fVar310 = auVar233._4_4_;
      fVar326 = auVar233._8_4_;
      fVar334 = auVar233._12_4_;
      auVar233 = vshufps_avx(auVar286,auVar286,0x55);
      register0x000014d0 = auVar233;
      _local_480 = auVar233;
      fVar321 = auVar233._0_4_;
      fVar322 = auVar233._4_4_;
      fVar323 = auVar233._8_4_;
      fVar324 = auVar233._12_4_;
      auVar210 = vpermilps_avx(local_4b0,0xff);
      register0x00001410 = auVar210;
      _local_180 = auVar210;
      fVar246 = auVar210._0_4_;
      fVar296 = auVar210._4_4_;
      fVar297 = auVar210._8_4_;
      auVar133._8_4_ = auVar209._8_4_;
      auVar133._0_8_ = auVar209._0_8_;
      auVar133._12_4_ = auVar209._12_4_;
      auVar233 = vshufps_avx(auVar133,auVar133,0);
      register0x00001310 = auVar233;
      _local_340 = auVar233;
      fVar265 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar152);
      fVar266 = *(float *)(bezier_basis0 + lVar152 + 4);
      fVar267 = *(float *)(bezier_basis0 + lVar152 + 8);
      fVar341 = *(float *)(bezier_basis0 + lVar152 + 0xc);
      fVar155 = *(float *)(bezier_basis0 + lVar152 + 0x10);
      fVar170 = *(float *)(bezier_basis0 + lVar152 + 0x14);
      fVar268 = *(float *)(bezier_basis0 + lVar152 + 0x18);
      auVar143 = *(undefined1 (*) [28])(bezier_basis0 + lVar152);
      fVar280 = auVar233._0_4_;
      fVar282 = auVar233._4_4_;
      fVar284 = auVar233._8_4_;
      fVar245 = auVar233._12_4_;
      auVar370._0_4_ = fVar280 * fVar265 + fVar309 * fVar243 + fVar175 * fVar206 + fVar351 * fVar264
      ;
      auVar370._4_4_ = fVar282 * fVar266 + fVar310 * fVar247 + fVar190 * fVar204 + fVar357 * fVar226
      ;
      auVar370._8_4_ = fVar284 * fVar267 + fVar326 * fVar248 + fVar205 * fVar220 + fVar360 * fVar227
      ;
      auVar370._12_4_ =
           fVar245 * fVar341 + fVar334 * fVar249 + fVar270 * fVar225 + fVar362 * fVar228;
      auVar370._16_4_ =
           fVar280 * fVar155 + fVar309 * fVar252 + fVar175 * fVar222 + fVar351 * fVar229;
      auVar370._20_4_ =
           fVar282 * fVar170 + fVar310 * fVar261 + fVar190 * fVar359 + fVar357 * fVar239;
      auVar370._24_4_ =
           fVar284 * fVar268 + fVar326 * fVar262 + fVar205 * fVar224 + fVar360 * fVar241;
      auVar370._28_4_ = fVar263 + fVar270 + 0.0 + 0.0;
      auVar233 = vshufps_avx(auVar133,auVar133,0x55);
      register0x000013d0 = auVar233;
      _local_400 = auVar233;
      fVar285 = auVar233._0_4_;
      fVar293 = auVar233._4_4_;
      fVar294 = auVar233._8_4_;
      fVar295 = auVar233._12_4_;
      auVar315._0_4_ = fVar285 * fVar265 + fVar321 * fVar243 + fVar279 * fVar206 + fVar176 * fVar264
      ;
      auVar315._4_4_ = fVar293 * fVar266 + fVar322 * fVar247 + fVar281 * fVar204 + fVar191 * fVar226
      ;
      auVar315._8_4_ = fVar294 * fVar267 + fVar323 * fVar248 + fVar283 * fVar220 + fVar250 * fVar227
      ;
      auVar315._12_4_ =
           fVar295 * fVar341 + fVar324 * fVar249 + fVar244 * fVar225 + fVar278 * fVar228;
      auVar315._16_4_ =
           fVar285 * fVar155 + fVar321 * fVar252 + fVar279 * fVar222 + fVar176 * fVar229;
      auVar315._20_4_ =
           fVar293 * fVar170 + fVar322 * fVar261 + fVar281 * fVar359 + fVar191 * fVar239;
      auVar315._24_4_ =
           fVar294 * fVar268 + fVar323 * fVar262 + fVar283 * fVar224 + fVar250 * fVar241;
      auVar315._28_4_ = fVar278 + 0.0 + 0.0 + 0.0;
      auVar233 = vpermilps_avx(_local_670,0xff);
      register0x00001490 = auVar233;
      _local_c0 = auVar233;
      fVar307 = auVar233._0_4_;
      fVar308 = auVar233._4_4_;
      fVar320 = auVar233._8_4_;
      local_7e0 = (undefined1  [4])
                  (fVar307 * fVar265 + fVar246 * fVar243 + fVar230 * fVar206 + fVar358 * fVar264);
      auStack_7dc._0_4_ =
           fVar308 * fVar266 + fVar296 * fVar247 + fVar240 * fVar204 + fVar361 * fVar226;
      auStack_7dc._4_4_ =
           fVar320 * fVar267 + fVar297 * fVar248 + fVar242 * fVar220 + fVar363 * fVar227;
      fStack_7d4 = auVar233._12_4_ * fVar341 +
                   auVar210._12_4_ * fVar249 + auVar196._12_4_ * fVar225 + fVar364 * fVar228;
      fStack_7d0 = fVar307 * fVar155 + fVar246 * fVar252 + fVar230 * fVar222 + fVar358 * fVar229;
      fStack_7cc = fVar308 * fVar170 + fVar296 * fVar261 + fVar240 * fVar359 + fVar361 * fVar239;
      fStack_7c8 = fVar320 * fVar268 + fVar297 * fVar262 + fVar242 * fVar224 + fVar363 * fVar241;
      fStack_7c4 = *(float *)(bezier_basis0 + lVar152 + 0x924) + 0.0 + 0.0 + 0.0;
      fVar243 = *(float *)(bezier_basis1 + lVar152 + 0x908);
      fVar247 = *(float *)(bezier_basis1 + lVar152 + 0x90c);
      fVar248 = *(float *)(bezier_basis1 + lVar152 + 0x910);
      fVar249 = *(float *)(bezier_basis1 + lVar152 + 0x914);
      fVar252 = *(float *)(bezier_basis1 + lVar152 + 0x918);
      fVar261 = *(float *)(bezier_basis1 + lVar152 + 0x91c);
      fVar262 = *(float *)(bezier_basis1 + lVar152 + 0x920);
      fVar265 = *(float *)(bezier_basis1 + lVar152 + 0xd8c);
      fVar266 = *(float *)(bezier_basis1 + lVar152 + 0xd90);
      fVar267 = *(float *)(bezier_basis1 + lVar152 + 0xd94);
      fVar341 = *(float *)(bezier_basis1 + lVar152 + 0xd98);
      fVar155 = *(float *)(bezier_basis1 + lVar152 + 0xd9c);
      fVar170 = *(float *)(bezier_basis1 + lVar152 + 0xda0);
      fVar268 = *(float *)(bezier_basis1 + lVar152 + 0xda4);
      fVar342 = *(float *)(bezier_basis1 + lVar152 + 0x484);
      fVar192 = *(float *)(bezier_basis1 + lVar152 + 0x488);
      fVar193 = *(float *)(bezier_basis1 + lVar152 + 0x48c);
      fVar194 = *(float *)(bezier_basis1 + lVar152 + 0x490);
      fVar269 = *(float *)(bezier_basis1 + lVar152 + 0x494);
      fVar325 = *(float *)(bezier_basis1 + lVar152 + 0x498);
      fVar251 = *(float *)(bezier_basis1 + lVar152 + 0x49c);
      fVar204 = fVar362 + fVar263 + 0.0;
      fVar171 = *(float *)(bezier_basis1 + lVar152);
      fVar172 = *(float *)(bezier_basis1 + lVar152 + 4);
      fVar173 = *(float *)(bezier_basis1 + lVar152 + 8);
      fVar174 = *(float *)(bezier_basis1 + lVar152 + 0xc);
      fVar207 = *(float *)(bezier_basis1 + lVar152 + 0x10);
      fVar221 = *(float *)(bezier_basis1 + lVar152 + 0x14);
      fVar223 = *(float *)(bezier_basis1 + lVar152 + 0x18);
      auVar234._0_4_ = fVar280 * fVar171 + fVar309 * fVar342 + fVar243 * fVar175 + fVar351 * fVar265
      ;
      auVar234._4_4_ = fVar282 * fVar172 + fVar310 * fVar192 + fVar247 * fVar190 + fVar357 * fVar266
      ;
      auVar234._8_4_ = fVar284 * fVar173 + fVar326 * fVar193 + fVar248 * fVar205 + fVar360 * fVar267
      ;
      auVar234._12_4_ =
           fVar245 * fVar174 + fVar334 * fVar194 + fVar249 * fVar270 + fVar362 * fVar341;
      auVar234._16_4_ =
           fVar280 * fVar207 + fVar309 * fVar269 + fVar252 * fVar175 + fVar351 * fVar155;
      auVar234._20_4_ =
           fVar282 * fVar221 + fVar310 * fVar325 + fVar261 * fVar190 + fVar357 * fVar170;
      auVar234._24_4_ =
           fVar284 * fVar223 + fVar326 * fVar251 + fVar262 * fVar205 + fVar360 * fVar268;
      auVar234._28_4_ = fVar364 + fVar204;
      auVar215._0_4_ = fVar285 * fVar171 + fVar321 * fVar342 + fVar279 * fVar243 + fVar265 * fVar176
      ;
      auVar215._4_4_ = fVar293 * fVar172 + fVar322 * fVar192 + fVar281 * fVar247 + fVar266 * fVar191
      ;
      auVar215._8_4_ = fVar294 * fVar173 + fVar323 * fVar193 + fVar283 * fVar248 + fVar267 * fVar250
      ;
      auVar215._12_4_ =
           fVar295 * fVar174 + fVar324 * fVar194 + fVar244 * fVar249 + fVar341 * fVar278;
      auVar215._16_4_ =
           fVar285 * fVar207 + fVar321 * fVar269 + fVar279 * fVar252 + fVar155 * fVar176;
      auVar215._20_4_ =
           fVar293 * fVar221 + fVar322 * fVar325 + fVar281 * fVar261 + fVar170 * fVar191;
      auVar215._24_4_ =
           fVar294 * fVar223 + fVar323 * fVar251 + fVar283 * fVar262 + fVar268 * fVar250;
      auVar215._28_4_ = fVar204 + fVar362 + fVar263 + 0.0;
      local_6a0._0_4_ =
           fVar246 * fVar342 + fVar243 * fVar230 + fVar358 * fVar265 + fVar307 * fVar171;
      local_6a0._4_4_ =
           fVar296 * fVar192 + fVar247 * fVar240 + fVar361 * fVar266 + fVar308 * fVar172;
      local_6a0._8_4_ =
           fVar297 * fVar193 + fVar248 * fVar242 + fVar363 * fVar267 + fVar320 * fVar173;
      local_6a0._12_4_ =
           auVar210._12_4_ * fVar194 + fVar249 * auVar196._12_4_ + fVar364 * fVar341 +
           auVar233._12_4_ * fVar174;
      local_6a0._16_4_ =
           fVar246 * fVar269 + fVar252 * fVar230 + fVar358 * fVar155 + fVar307 * fVar207;
      local_6a0._20_4_ =
           fVar296 * fVar325 + fVar261 * fVar240 + fVar361 * fVar170 + fVar308 * fVar221;
      local_6a0._24_4_ =
           fVar297 * fVar251 + fVar262 * fVar242 + fVar363 * fVar268 + fVar320 * fVar223;
      local_6a0._28_4_ = fVar362 + fVar244 + fVar263 + fVar204;
      auVar40 = vsubps_avx(auVar234,auVar370);
      auVar41 = vsubps_avx(auVar215,auVar315);
      fVar206 = auVar40._0_4_;
      fVar220 = auVar40._4_4_;
      auVar49._4_4_ = auVar315._4_4_ * fVar220;
      auVar49._0_4_ = auVar315._0_4_ * fVar206;
      fVar222 = auVar40._8_4_;
      auVar49._8_4_ = auVar315._8_4_ * fVar222;
      fVar224 = auVar40._12_4_;
      auVar49._12_4_ = auVar315._12_4_ * fVar224;
      fVar226 = auVar40._16_4_;
      auVar49._16_4_ = auVar315._16_4_ * fVar226;
      fVar228 = auVar40._20_4_;
      auVar49._20_4_ = auVar315._20_4_ * fVar228;
      fVar239 = auVar40._24_4_;
      auVar49._24_4_ = auVar315._24_4_ * fVar239;
      auVar49._28_4_ = fVar204;
      fVar204 = auVar41._0_4_;
      fVar225 = auVar41._4_4_;
      auVar50._4_4_ = auVar370._4_4_ * fVar225;
      auVar50._0_4_ = auVar370._0_4_ * fVar204;
      fVar359 = auVar41._8_4_;
      auVar50._8_4_ = auVar370._8_4_ * fVar359;
      fVar264 = auVar41._12_4_;
      auVar50._12_4_ = auVar370._12_4_ * fVar264;
      fVar227 = auVar41._16_4_;
      auVar50._16_4_ = auVar370._16_4_ * fVar227;
      fVar229 = auVar41._20_4_;
      auVar50._20_4_ = auVar370._20_4_ * fVar229;
      fVar241 = auVar41._24_4_;
      auVar50._24_4_ = auVar370._24_4_ * fVar241;
      auVar50._28_4_ = auVar215._28_4_;
      auVar39 = vsubps_avx(auVar49,auVar50);
      auVar159 = vmaxps_avx(_local_7e0,local_6a0._0_32_);
      auVar51._4_4_ = auVar159._4_4_ * auVar159._4_4_ * (fVar220 * fVar220 + fVar225 * fVar225);
      auVar51._0_4_ = auVar159._0_4_ * auVar159._0_4_ * (fVar206 * fVar206 + fVar204 * fVar204);
      auVar51._8_4_ = auVar159._8_4_ * auVar159._8_4_ * (fVar222 * fVar222 + fVar359 * fVar359);
      auVar51._12_4_ = auVar159._12_4_ * auVar159._12_4_ * (fVar224 * fVar224 + fVar264 * fVar264);
      auVar51._16_4_ = auVar159._16_4_ * auVar159._16_4_ * (fVar226 * fVar226 + fVar227 * fVar227);
      auVar51._20_4_ = auVar159._20_4_ * auVar159._20_4_ * (fVar228 * fVar228 + fVar229 * fVar229);
      auVar51._24_4_ = auVar159._24_4_ * auVar159._24_4_ * (fVar239 * fVar239 + fVar241 * fVar241);
      auVar51._28_4_ = auVar234._28_4_ + auVar215._28_4_;
      auVar52._4_4_ = auVar39._4_4_ * auVar39._4_4_;
      auVar52._0_4_ = auVar39._0_4_ * auVar39._0_4_;
      auVar52._8_4_ = auVar39._8_4_ * auVar39._8_4_;
      auVar52._12_4_ = auVar39._12_4_ * auVar39._12_4_;
      auVar52._16_4_ = auVar39._16_4_ * auVar39._16_4_;
      auVar52._20_4_ = auVar39._20_4_ * auVar39._20_4_;
      auVar52._24_4_ = auVar39._24_4_ * auVar39._24_4_;
      auVar52._28_4_ = auVar39._28_4_;
      auVar159 = vcmpps_avx(auVar52,auVar51,2);
      local_3c0 = (float)(int)uVar149;
      fStack_3bc = 0.0;
      fStack_3b8 = 0.0;
      fStack_3b4 = 0.0;
      auVar196 = vshufps_avx(ZEXT416((uint)local_3c0),ZEXT416((uint)local_3c0),0);
      auVar216._16_16_ = auVar196;
      auVar216._0_16_ = auVar196;
      auVar39 = vcmpps_avx(_DAT_02020f40,auVar216,1);
      auVar134._8_4_ = auVar209._8_4_;
      auVar134._0_8_ = auVar209._0_8_;
      auVar134._12_4_ = auVar209._12_4_;
      auVar196 = vpermilps_avx(auVar134,0xaa);
      auVar304._16_16_ = auVar196;
      auVar304._0_16_ = auVar196;
      auVar233 = vpermilps_avx(auVar286,0xaa);
      register0x00001550 = auVar233;
      _local_320 = auVar233;
      auVar210 = vpermilps_avx(auVar298,0xaa);
      register0x00001590 = auVar210;
      _local_e0 = auVar210;
      auVar47 = vpermilps_avx(auVar179,0xaa);
      register0x00001310 = auVar47;
      _local_540 = auVar47;
      auVar42 = auVar39 & auVar159;
      local_7c0 = *(uint *)((long)&(local_7e8->org).field_0 + 0xc);
      uStack_7bc = 0;
      fStack_7b8 = 0.0;
      fStack_7b4 = 0.0;
      auVar373 = ZEXT416((uint)(auVar373._0_4_ * 4.7683716e-07));
      ray = local_7e8;
      fVar206 = fVar309;
      fVar204 = fVar310;
      fVar220 = fVar326;
      fVar225 = fVar334;
      if ((((((((auVar42 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar42 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar42 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar42 >> 0x7f,0) == '\0') &&
            (auVar42 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar42 >> 0xbf,0) == '\0') &&
          (auVar42 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar42[0x1f])
      {
        uVar153 = 0;
        local_7f0 = context;
      }
      else {
        auVar159 = vandps_avx(auVar159,auVar39);
        fVar296 = auVar196._0_4_;
        fVar297 = auVar196._4_4_;
        fVar307 = auVar196._8_4_;
        fVar308 = auVar196._12_4_;
        fVar320 = auVar233._0_4_;
        fVar358 = auVar233._4_4_;
        fVar361 = auVar233._8_4_;
        fVar363 = auVar233._12_4_;
        fVar364 = auVar210._0_4_;
        fVar367 = auVar210._4_4_;
        fVar368 = auVar210._8_4_;
        fVar369 = auVar210._12_4_;
        fVar230 = auVar47._0_4_;
        fVar240 = auVar47._4_4_;
        fVar242 = auVar47._8_4_;
        fVar246 = auVar47._12_4_;
        fVar222 = auVar39._28_4_ +
                  *(float *)(bezier_basis1 + lVar152 + 0x924) +
                  *(float *)(bezier_basis1 + lVar152 + 0x4a0);
        local_760._0_16_ = auVar373;
        local_440 = fVar296 * fVar171 + fVar320 * fVar342 + fVar364 * fVar243 + fVar230 * fVar265;
        fStack_43c = fVar297 * fVar172 + fVar358 * fVar192 + fVar367 * fVar247 + fVar240 * fVar266;
        fStack_438 = fVar307 * fVar173 + fVar361 * fVar193 + fVar368 * fVar248 + fVar242 * fVar267;
        fStack_434 = fVar308 * fVar174 + fVar363 * fVar194 + fVar369 * fVar249 + fVar246 * fVar341;
        fStack_430 = fVar296 * fVar207 + fVar320 * fVar269 + fVar364 * fVar252 + fVar230 * fVar155;
        fStack_42c = fVar297 * fVar221 + fVar358 * fVar325 + fVar367 * fVar261 + fVar240 * fVar170;
        fStack_428 = fVar307 * fVar223 + fVar361 * fVar251 + fVar368 * fVar262 + fVar242 * fVar268;
        fStack_424 = auVar159._28_4_ + fVar222;
        local_420._0_4_ = auVar143._0_4_;
        local_420._4_4_ = auVar143._4_4_;
        fStack_418 = auVar143._8_4_;
        fStack_414 = auVar143._12_4_;
        fStack_410 = auVar143._16_4_;
        fStack_40c = auVar143._20_4_;
        fStack_408 = auVar143._24_4_;
        local_520._0_4_ = auVar142._0_4_;
        local_520._4_4_ = auVar142._4_4_;
        fStack_518 = auVar142._8_4_;
        fStack_514 = auVar142._12_4_;
        auStack_510._0_4_ = auVar142._16_4_;
        auStack_510._4_4_ = auVar142._20_4_;
        fStack_508 = auVar142._24_4_;
        local_500._0_4_ = auVar141._0_4_;
        local_500._4_4_ = auVar141._4_4_;
        fStack_4f8 = auVar141._8_4_;
        fStack_4f4 = auVar141._12_4_;
        fStack_4f0 = auVar141._16_4_;
        fStack_4ec = auVar141._20_4_;
        fStack_4e8 = auVar141._24_4_;
        local_5e0._0_4_ = auVar140._0_4_;
        local_5e0._4_4_ = auVar140._4_4_;
        fStack_5d8 = auVar140._8_4_;
        fStack_5d4 = auVar140._12_4_;
        fStack_5d0 = auVar140._16_4_;
        fStack_5cc = auVar140._20_4_;
        fStack_5c8 = auVar140._24_4_;
        local_500._0_4_ =
             fVar296 * (float)local_420._0_4_ +
             fVar320 * (float)local_520._0_4_ +
             fVar364 * (float)local_500._0_4_ + fVar230 * (float)local_5e0._0_4_;
        local_500._4_4_ =
             fVar297 * (float)local_420._4_4_ +
             fVar358 * (float)local_520._4_4_ +
             fVar367 * (float)local_500._4_4_ + fVar240 * (float)local_5e0._4_4_;
        fStack_4f8 = fVar307 * fStack_418 +
                     fVar361 * fStack_518 + fVar368 * fStack_4f8 + fVar242 * fStack_5d8;
        fStack_4f4 = fVar308 * fStack_414 +
                     fVar363 * fStack_514 + fVar369 * fStack_4f4 + fVar246 * fStack_5d4;
        fStack_4f0 = fVar296 * fStack_410 +
                     fVar320 * (float)auStack_510._0_4_ +
                     fVar364 * fStack_4f0 + fVar230 * fStack_5d0;
        fStack_4ec = fVar297 * fStack_40c +
                     fVar358 * (float)auStack_510._4_4_ +
                     fVar367 * fStack_4ec + fVar240 * fStack_5cc;
        fStack_4e8 = fVar307 * fStack_408 +
                     fVar361 * fStack_508 + fVar368 * fStack_4e8 + fVar242 * fStack_5c8;
        fStack_4e4 = fStack_424 + fVar222 + auVar159._28_4_ + auVar39._28_4_;
        fVar222 = *(float *)(bezier_basis0 + lVar152 + 0x1210);
        fVar359 = *(float *)(bezier_basis0 + lVar152 + 0x1214);
        fVar224 = *(float *)(bezier_basis0 + lVar152 + 0x1218);
        fVar264 = *(float *)(bezier_basis0 + lVar152 + 0x121c);
        fVar226 = *(float *)(bezier_basis0 + lVar152 + 0x1220);
        fVar227 = *(float *)(bezier_basis0 + lVar152 + 0x1224);
        fVar228 = *(float *)(bezier_basis0 + lVar152 + 0x1228);
        fVar229 = *(float *)(bezier_basis0 + lVar152 + 0x1694);
        fVar239 = *(float *)(bezier_basis0 + lVar152 + 0x1698);
        fVar241 = *(float *)(bezier_basis0 + lVar152 + 0x169c);
        fVar243 = *(float *)(bezier_basis0 + lVar152 + 0x16a0);
        fVar247 = *(float *)(bezier_basis0 + lVar152 + 0x16a4);
        fVar248 = *(float *)(bezier_basis0 + lVar152 + 0x16a8);
        fVar249 = *(float *)(bezier_basis0 + lVar152 + 0x16ac);
        fVar252 = *(float *)(bezier_basis0 + lVar152 + 0x1b18);
        fVar261 = *(float *)(bezier_basis0 + lVar152 + 0x1b1c);
        fVar262 = *(float *)(bezier_basis0 + lVar152 + 0x1b20);
        fVar263 = *(float *)(bezier_basis0 + lVar152 + 0x1b24);
        fVar265 = *(float *)(bezier_basis0 + lVar152 + 0x1b28);
        fVar266 = *(float *)(bezier_basis0 + lVar152 + 0x1b2c);
        fVar267 = *(float *)(bezier_basis0 + lVar152 + 0x1b30);
        fVar341 = *(float *)(bezier_basis0 + lVar152 + 0x1f9c);
        fVar155 = *(float *)(bezier_basis0 + lVar152 + 0x1fa0);
        fVar170 = *(float *)(bezier_basis0 + lVar152 + 0x1fa4);
        fVar268 = *(float *)(bezier_basis0 + lVar152 + 0x1fa8);
        fVar342 = *(float *)(bezier_basis0 + lVar152 + 0x1fac);
        fVar192 = *(float *)(bezier_basis0 + lVar152 + 0x1fb0);
        fVar193 = *(float *)(bezier_basis0 + lVar152 + 0x1fb4);
        fVar269 = auVar315._28_4_ + *(float *)(bezier_basis1 + lVar152 + 0x4a0);
        fVar194 = *(float *)(bezier_basis0 + lVar152 + 0x1b34) +
                  *(float *)(bezier_basis0 + lVar152 + 0x1fb8);
        fVar325 = *(float *)(bezier_basis0 + lVar152 + 0x16b0) + fVar194;
        local_420._4_4_ =
             fVar282 * fVar359 + fVar239 * fVar310 + fVar190 * fVar261 + fVar357 * fVar155;
        local_420._0_4_ =
             fVar280 * fVar222 + fVar229 * fVar309 + fVar175 * fVar252 + fVar351 * fVar341;
        fStack_418 = fVar284 * fVar224 + fVar241 * fVar326 + fVar205 * fVar262 + fVar360 * fVar170;
        fStack_414 = fVar245 * fVar264 + fVar243 * fVar334 + fVar270 * fVar263 + fVar362 * fVar268;
        fStack_410 = fVar280 * fVar226 + fVar247 * fVar309 + fVar175 * fVar265 + fVar351 * fVar342;
        fStack_40c = fVar282 * fVar227 + fVar248 * fVar310 + fVar190 * fVar266 + fVar357 * fVar192;
        fStack_408 = fVar284 * fVar228 + fVar249 * fVar326 + fVar205 * fVar267 + fVar360 * fVar193;
        fStack_404 = *(float *)(bezier_basis0 + lVar152 + 0x16b0) +
                     *(float *)(bezier_basis0 + lVar152 + 0x1fb8) + fVar269;
        auVar185._0_4_ =
             fVar222 * fVar285 + fVar279 * fVar252 + fVar176 * fVar341 + fVar321 * fVar229;
        auVar185._4_4_ =
             fVar359 * fVar293 + fVar281 * fVar261 + fVar191 * fVar155 + fVar322 * fVar239;
        auVar185._8_4_ =
             fVar224 * fVar294 + fVar283 * fVar262 + fVar250 * fVar170 + fVar323 * fVar241;
        auVar185._12_4_ =
             fVar264 * fVar295 + fVar244 * fVar263 + fVar278 * fVar268 + fVar324 * fVar243;
        auVar185._16_4_ =
             fVar226 * fVar285 + fVar279 * fVar265 + fVar176 * fVar342 + fVar321 * fVar247;
        auVar185._20_4_ =
             fVar227 * fVar293 + fVar281 * fVar266 + fVar191 * fVar192 + fVar322 * fVar248;
        auVar185._24_4_ =
             fVar228 * fVar294 + fVar283 * fVar267 + fVar250 * fVar193 + fVar323 * fVar249;
        auVar185._28_4_ =
             fVar194 + auVar315._28_4_ + *(float *)(bezier_basis1 + lVar152 + 0x1c) + fVar269;
        auVar255._0_4_ =
             fVar320 * fVar229 + fVar364 * fVar252 + fVar230 * fVar341 + fVar296 * fVar222;
        auVar255._4_4_ =
             fVar358 * fVar239 + fVar367 * fVar261 + fVar240 * fVar155 + fVar297 * fVar359;
        auVar255._8_4_ =
             fVar361 * fVar241 + fVar368 * fVar262 + fVar242 * fVar170 + fVar307 * fVar224;
        auVar255._12_4_ =
             fVar363 * fVar243 + fVar369 * fVar263 + fVar246 * fVar268 + fVar308 * fVar264;
        auVar255._16_4_ =
             fVar320 * fVar247 + fVar364 * fVar265 + fVar230 * fVar342 + fVar296 * fVar226;
        auVar255._20_4_ =
             fVar358 * fVar248 + fVar367 * fVar266 + fVar240 * fVar192 + fVar297 * fVar227;
        auVar255._24_4_ =
             fVar361 * fVar249 + fVar368 * fVar267 + fVar242 * fVar193 + fVar307 * fVar228;
        auVar255._28_4_ = fVar325 + *(float *)(bezier_basis0 + lVar152 + 0x122c);
        fVar222 = *(float *)(bezier_basis1 + lVar152 + 0x1b18);
        fVar359 = *(float *)(bezier_basis1 + lVar152 + 0x1b1c);
        fVar224 = *(float *)(bezier_basis1 + lVar152 + 0x1b20);
        fVar264 = *(float *)(bezier_basis1 + lVar152 + 0x1b24);
        fVar226 = *(float *)(bezier_basis1 + lVar152 + 0x1b28);
        fVar227 = *(float *)(bezier_basis1 + lVar152 + 0x1b2c);
        fVar228 = *(float *)(bezier_basis1 + lVar152 + 0x1b30);
        fVar229 = *(float *)(bezier_basis1 + lVar152 + 0x1f9c);
        fVar239 = *(float *)(bezier_basis1 + lVar152 + 0x1fa0);
        fVar241 = *(float *)(bezier_basis1 + lVar152 + 0x1fa4);
        fVar243 = *(float *)(bezier_basis1 + lVar152 + 0x1fa8);
        fVar247 = *(float *)(bezier_basis1 + lVar152 + 0x1fac);
        fVar248 = *(float *)(bezier_basis1 + lVar152 + 0x1fb0);
        fVar249 = *(float *)(bezier_basis1 + lVar152 + 0x1fb4);
        fVar252 = *(float *)(bezier_basis1 + lVar152 + 0x1694);
        fVar261 = *(float *)(bezier_basis1 + lVar152 + 0x1698);
        fVar262 = *(float *)(bezier_basis1 + lVar152 + 0x169c);
        fVar263 = *(float *)(bezier_basis1 + lVar152 + 0x16a0);
        fVar265 = *(float *)(bezier_basis1 + lVar152 + 0x16a4);
        fVar266 = *(float *)(bezier_basis1 + lVar152 + 0x16a8);
        fVar267 = *(float *)(bezier_basis1 + lVar152 + 0x16ac);
        fVar341 = *(float *)(bezier_basis1 + lVar152 + 0x1210);
        fVar155 = *(float *)(bezier_basis1 + lVar152 + 0x1214);
        fVar170 = *(float *)(bezier_basis1 + lVar152 + 0x1218);
        fVar268 = *(float *)(bezier_basis1 + lVar152 + 0x121c);
        fVar342 = *(float *)(bezier_basis1 + lVar152 + 0x1220);
        fVar192 = *(float *)(bezier_basis1 + lVar152 + 0x1224);
        fVar193 = *(float *)(bezier_basis1 + lVar152 + 0x1228);
        auVar273._0_4_ =
             fVar280 * fVar341 + fVar252 * fVar309 + fVar175 * fVar222 + fVar351 * fVar229;
        auVar273._4_4_ =
             fVar282 * fVar155 + fVar261 * fVar310 + fVar190 * fVar359 + fVar357 * fVar239;
        auVar273._8_4_ =
             fVar284 * fVar170 + fVar262 * fVar326 + fVar205 * fVar224 + fVar360 * fVar241;
        auVar273._12_4_ =
             fVar245 * fVar268 + fVar263 * fVar334 + fVar270 * fVar264 + fVar362 * fVar243;
        auVar273._16_4_ =
             fVar280 * fVar342 + fVar265 * fVar309 + fVar175 * fVar226 + fVar351 * fVar247;
        auVar273._20_4_ =
             fVar282 * fVar192 + fVar266 * fVar310 + fVar190 * fVar227 + fVar357 * fVar248;
        auVar273._24_4_ =
             fVar284 * fVar193 + fVar267 * fVar326 + fVar205 * fVar228 + fVar360 * fVar249;
        auVar273._28_4_ = fVar270 + fVar270 + fVar325 + fVar362;
        auVar316._0_4_ =
             fVar341 * fVar285 + fVar321 * fVar252 + fVar279 * fVar222 + fVar176 * fVar229;
        auVar316._4_4_ =
             fVar155 * fVar293 + fVar322 * fVar261 + fVar281 * fVar359 + fVar191 * fVar239;
        auVar316._8_4_ =
             fVar170 * fVar294 + fVar323 * fVar262 + fVar283 * fVar224 + fVar250 * fVar241;
        auVar316._12_4_ =
             fVar268 * fVar295 + fVar324 * fVar263 + fVar244 * fVar264 + fVar278 * fVar243;
        auVar316._16_4_ =
             fVar342 * fVar285 + fVar321 * fVar265 + fVar279 * fVar226 + fVar176 * fVar247;
        auVar316._20_4_ =
             fVar192 * fVar293 + fVar322 * fVar266 + fVar281 * fVar227 + fVar191 * fVar248;
        auVar316._24_4_ =
             fVar193 * fVar294 + fVar323 * fVar267 + fVar283 * fVar228 + fVar250 * fVar249;
        auVar316._28_4_ = fVar270 + fVar270 + fVar270 + fVar325;
        _local_560 = auVar304;
        auVar203._0_4_ =
             fVar296 * fVar341 + fVar320 * fVar252 + fVar364 * fVar222 + fVar229 * fVar230;
        auVar203._4_4_ =
             fVar297 * fVar155 + fVar358 * fVar261 + fVar367 * fVar359 + fVar239 * fVar240;
        auVar203._8_4_ =
             fVar307 * fVar170 + fVar361 * fVar262 + fVar368 * fVar224 + fVar241 * fVar242;
        auVar203._12_4_ =
             fVar308 * fVar268 + fVar363 * fVar263 + fVar369 * fVar264 + fVar243 * fVar246;
        auVar203._16_4_ =
             fVar296 * fVar342 + fVar320 * fVar265 + fVar364 * fVar226 + fVar247 * fVar230;
        auVar203._20_4_ =
             fVar297 * fVar192 + fVar358 * fVar266 + fVar367 * fVar227 + fVar248 * fVar240;
        auVar203._24_4_ =
             fVar307 * fVar193 + fVar361 * fVar267 + fVar368 * fVar228 + fVar249 * fVar242;
        auVar203._28_4_ =
             *(float *)(bezier_basis1 + lVar152 + 0x122c) +
             *(float *)(bezier_basis1 + lVar152 + 0x16b0) +
             *(float *)(bezier_basis1 + lVar152 + 0x1b34) +
             *(float *)(bezier_basis1 + lVar152 + 0x1fb8);
        auVar235._8_4_ = 0x7fffffff;
        auVar235._0_8_ = 0x7fffffff7fffffff;
        auVar235._12_4_ = 0x7fffffff;
        auVar235._16_4_ = 0x7fffffff;
        auVar235._20_4_ = 0x7fffffff;
        auVar235._24_4_ = 0x7fffffff;
        auVar235._28_4_ = 0x7fffffff;
        auVar39 = vandps_avx(_local_420,auVar235);
        auVar42 = vandps_avx(auVar185,auVar235);
        auVar42 = vmaxps_avx(auVar39,auVar42);
        auVar39 = vandps_avx(auVar255,auVar235);
        auVar39 = vmaxps_avx(auVar42,auVar39);
        auVar373 = vpermilps_avx(auVar373,0);
        auVar256._16_16_ = auVar373;
        auVar256._0_16_ = auVar373;
        auVar39 = vcmpps_avx(auVar39,auVar256,1);
        auVar43 = vblendvps_avx(_local_420,auVar40,auVar39);
        auVar44 = vblendvps_avx(auVar185,auVar41,auVar39);
        auVar39 = vandps_avx(auVar273,auVar235);
        auVar42 = vandps_avx(auVar316,auVar235);
        auVar45 = vmaxps_avx(auVar39,auVar42);
        auVar39 = vandps_avx(auVar203,auVar235);
        auVar39 = vmaxps_avx(auVar45,auVar39);
        auVar45 = vcmpps_avx(auVar39,auVar256,1);
        auVar39 = vblendvps_avx(auVar273,auVar40,auVar45);
        auVar40 = vblendvps_avx(auVar316,auVar41,auVar45);
        fVar269 = auVar43._0_4_;
        fVar325 = auVar43._4_4_;
        fVar251 = auVar43._8_4_;
        fVar171 = auVar43._12_4_;
        fVar172 = auVar43._16_4_;
        fVar173 = auVar43._20_4_;
        fVar174 = auVar43._24_4_;
        fVar205 = -auVar43._28_4_;
        fVar207 = auVar39._0_4_;
        fVar221 = auVar39._4_4_;
        fVar223 = auVar39._8_4_;
        fVar175 = auVar39._12_4_;
        fVar176 = auVar39._16_4_;
        fVar190 = auVar39._20_4_;
        fVar191 = auVar39._24_4_;
        fVar222 = auVar44._0_4_;
        fVar226 = auVar44._4_4_;
        fVar239 = auVar44._8_4_;
        fVar248 = auVar44._12_4_;
        fVar262 = auVar44._16_4_;
        fVar267 = auVar44._20_4_;
        fVar268 = auVar44._24_4_;
        auVar162._0_4_ = fVar222 * fVar222 + fVar269 * fVar269;
        auVar162._4_4_ = fVar226 * fVar226 + fVar325 * fVar325;
        auVar162._8_4_ = fVar239 * fVar239 + fVar251 * fVar251;
        auVar162._12_4_ = fVar248 * fVar248 + fVar171 * fVar171;
        auVar162._16_4_ = fVar262 * fVar262 + fVar172 * fVar172;
        auVar162._20_4_ = fVar267 * fVar267 + fVar173 * fVar173;
        auVar162._24_4_ = fVar268 * fVar268 + fVar174 * fVar174;
        auVar162._28_4_ = auVar316._28_4_ + auVar43._28_4_;
        auVar41 = vrsqrtps_avx(auVar162);
        fVar359 = auVar41._0_4_;
        fVar224 = auVar41._4_4_;
        auVar53._4_4_ = fVar224 * 1.5;
        auVar53._0_4_ = fVar359 * 1.5;
        fVar264 = auVar41._8_4_;
        auVar53._8_4_ = fVar264 * 1.5;
        fVar227 = auVar41._12_4_;
        auVar53._12_4_ = fVar227 * 1.5;
        fVar228 = auVar41._16_4_;
        auVar53._16_4_ = fVar228 * 1.5;
        fVar229 = auVar41._20_4_;
        auVar53._20_4_ = fVar229 * 1.5;
        fVar241 = auVar41._24_4_;
        fVar194 = auVar42._28_4_;
        auVar53._24_4_ = fVar241 * 1.5;
        auVar53._28_4_ = fVar194;
        auVar54._4_4_ = fVar224 * fVar224 * fVar224 * auVar162._4_4_ * 0.5;
        auVar54._0_4_ = fVar359 * fVar359 * fVar359 * auVar162._0_4_ * 0.5;
        auVar54._8_4_ = fVar264 * fVar264 * fVar264 * auVar162._8_4_ * 0.5;
        auVar54._12_4_ = fVar227 * fVar227 * fVar227 * auVar162._12_4_ * 0.5;
        auVar54._16_4_ = fVar228 * fVar228 * fVar228 * auVar162._16_4_ * 0.5;
        auVar54._20_4_ = fVar229 * fVar229 * fVar229 * auVar162._20_4_ * 0.5;
        auVar54._24_4_ = fVar241 * fVar241 * fVar241 * auVar162._24_4_ * 0.5;
        auVar54._28_4_ = auVar162._28_4_;
        auVar41 = vsubps_avx(auVar53,auVar54);
        fVar359 = auVar41._0_4_;
        fVar227 = auVar41._4_4_;
        fVar241 = auVar41._8_4_;
        fVar249 = auVar41._12_4_;
        fVar263 = auVar41._16_4_;
        fVar341 = auVar41._20_4_;
        fVar342 = auVar41._24_4_;
        fVar224 = auVar40._0_4_;
        fVar228 = auVar40._4_4_;
        fVar243 = auVar40._8_4_;
        fVar252 = auVar40._12_4_;
        fVar265 = auVar40._16_4_;
        fVar155 = auVar40._20_4_;
        fVar192 = auVar40._24_4_;
        auVar163._0_4_ = fVar224 * fVar224 + fVar207 * fVar207;
        auVar163._4_4_ = fVar228 * fVar228 + fVar221 * fVar221;
        auVar163._8_4_ = fVar243 * fVar243 + fVar223 * fVar223;
        auVar163._12_4_ = fVar252 * fVar252 + fVar175 * fVar175;
        auVar163._16_4_ = fVar265 * fVar265 + fVar176 * fVar176;
        auVar163._20_4_ = fVar155 * fVar155 + fVar190 * fVar190;
        auVar163._24_4_ = fVar192 * fVar192 + fVar191 * fVar191;
        auVar163._28_4_ = auVar39._28_4_ + auVar41._28_4_;
        auVar39 = vrsqrtps_avx(auVar163);
        fVar264 = auVar39._0_4_;
        fVar229 = auVar39._4_4_;
        auVar55._4_4_ = fVar229 * 1.5;
        auVar55._0_4_ = fVar264 * 1.5;
        fVar247 = auVar39._8_4_;
        auVar55._8_4_ = fVar247 * 1.5;
        fVar261 = auVar39._12_4_;
        auVar55._12_4_ = fVar261 * 1.5;
        fVar266 = auVar39._16_4_;
        auVar55._16_4_ = fVar266 * 1.5;
        fVar170 = auVar39._20_4_;
        auVar55._20_4_ = fVar170 * 1.5;
        fVar193 = auVar39._24_4_;
        auVar55._24_4_ = fVar193 * 1.5;
        auVar55._28_4_ = fVar194;
        auVar56._4_4_ = fVar229 * fVar229 * fVar229 * auVar163._4_4_ * 0.5;
        auVar56._0_4_ = fVar264 * fVar264 * fVar264 * auVar163._0_4_ * 0.5;
        auVar56._8_4_ = fVar247 * fVar247 * fVar247 * auVar163._8_4_ * 0.5;
        auVar56._12_4_ = fVar261 * fVar261 * fVar261 * auVar163._12_4_ * 0.5;
        auVar56._16_4_ = fVar266 * fVar266 * fVar266 * auVar163._16_4_ * 0.5;
        auVar56._20_4_ = fVar170 * fVar170 * fVar170 * auVar163._20_4_ * 0.5;
        auVar56._24_4_ = fVar193 * fVar193 * fVar193 * auVar163._24_4_ * 0.5;
        auVar56._28_4_ = auVar163._28_4_;
        auVar39 = vsubps_avx(auVar55,auVar56);
        fVar264 = auVar39._0_4_;
        fVar229 = auVar39._4_4_;
        fVar247 = auVar39._8_4_;
        fVar261 = auVar39._12_4_;
        fVar266 = auVar39._16_4_;
        fVar170 = auVar39._20_4_;
        fVar193 = auVar39._24_4_;
        fVar222 = (float)local_7e0 * fVar222 * fVar359;
        fVar226 = (float)auStack_7dc._0_4_ * fVar226 * fVar227;
        auVar57._4_4_ = fVar226;
        auVar57._0_4_ = fVar222;
        fVar239 = (float)auStack_7dc._4_4_ * fVar239 * fVar241;
        auVar57._8_4_ = fVar239;
        fVar248 = fStack_7d4 * fVar248 * fVar249;
        auVar57._12_4_ = fVar248;
        fVar262 = fStack_7d0 * fVar262 * fVar263;
        auVar57._16_4_ = fVar262;
        fVar267 = fStack_7cc * fVar267 * fVar341;
        auVar57._20_4_ = fVar267;
        fVar268 = fStack_7c8 * fVar268 * fVar342;
        auVar57._24_4_ = fVar268;
        auVar57._28_4_ = fVar194;
        local_5e0._4_4_ = fVar226 + auVar370._4_4_;
        local_5e0._0_4_ = fVar222 + auVar370._0_4_;
        fStack_5d8 = fVar239 + auVar370._8_4_;
        fStack_5d4 = fVar248 + auVar370._12_4_;
        fStack_5d0 = fVar262 + auVar370._16_4_;
        fStack_5cc = fVar267 + auVar370._20_4_;
        fStack_5c8 = fVar268 + auVar370._24_4_;
        fStack_5c4 = fVar194 + auVar370._28_4_;
        fVar222 = (float)local_7e0 * fVar359 * -fVar269;
        fVar226 = (float)auStack_7dc._0_4_ * fVar227 * -fVar325;
        auVar58._4_4_ = fVar226;
        auVar58._0_4_ = fVar222;
        fVar239 = (float)auStack_7dc._4_4_ * fVar241 * -fVar251;
        auVar58._8_4_ = fVar239;
        fVar248 = fStack_7d4 * fVar249 * -fVar171;
        auVar58._12_4_ = fVar248;
        fVar262 = fStack_7d0 * fVar263 * -fVar172;
        auVar58._16_4_ = fVar262;
        fVar267 = fStack_7cc * fVar341 * -fVar173;
        auVar58._20_4_ = fVar267;
        fVar268 = fStack_7c8 * fVar342 * -fVar174;
        auVar58._24_4_ = fVar268;
        auVar58._28_4_ = fVar205;
        local_520._4_4_ = auVar315._4_4_ + fVar226;
        local_520._0_4_ = auVar315._0_4_ + fVar222;
        fStack_518 = auVar315._8_4_ + fVar239;
        fStack_514 = auVar315._12_4_ + fVar248;
        auStack_510._0_4_ = auVar315._16_4_ + fVar262;
        auStack_510._4_4_ = auVar315._20_4_ + fVar267;
        fStack_508 = auVar315._24_4_ + fVar268;
        fStack_504 = auVar315._28_4_ + fVar205;
        fVar222 = fVar359 * 0.0 * (float)local_7e0;
        fVar359 = fVar227 * 0.0 * (float)auStack_7dc._0_4_;
        auVar59._4_4_ = fVar359;
        auVar59._0_4_ = fVar222;
        fVar226 = fVar241 * 0.0 * (float)auStack_7dc._4_4_;
        auVar59._8_4_ = fVar226;
        fVar227 = fVar249 * 0.0 * fStack_7d4;
        auVar59._12_4_ = fVar227;
        fVar239 = fVar263 * 0.0 * fStack_7d0;
        auVar59._16_4_ = fVar239;
        fVar241 = fVar341 * 0.0 * fStack_7cc;
        auVar59._20_4_ = fVar241;
        fVar248 = fVar342 * 0.0 * fStack_7c8;
        auVar59._24_4_ = fVar248;
        auVar59._28_4_ = fVar363;
        auVar274._0_4_ = (float)local_500._0_4_ + fVar222;
        auVar274._4_4_ = (float)local_500._4_4_ + fVar359;
        auVar274._8_4_ = fStack_4f8 + fVar226;
        auVar274._12_4_ = fStack_4f4 + fVar227;
        auVar274._16_4_ = fStack_4f0 + fVar239;
        auVar274._20_4_ = fStack_4ec + fVar241;
        auVar274._24_4_ = fStack_4e8 + fVar248;
        auVar274._28_4_ = fStack_4e4 + fVar363;
        fVar222 = local_6a0._0_4_ * fVar224 * fVar264;
        fVar359 = local_6a0._4_4_ * fVar228 * fVar229;
        auVar60._4_4_ = fVar359;
        auVar60._0_4_ = fVar222;
        fVar224 = local_6a0._8_4_ * fVar243 * fVar247;
        auVar60._8_4_ = fVar224;
        fVar226 = local_6a0._12_4_ * fVar252 * fVar261;
        auVar60._12_4_ = fVar226;
        fVar227 = local_6a0._16_4_ * fVar265 * fVar266;
        auVar60._16_4_ = fVar227;
        fVar228 = local_6a0._20_4_ * fVar155 * fVar170;
        auVar60._20_4_ = fVar228;
        fVar239 = local_6a0._24_4_ * fVar192 * fVar193;
        auVar60._24_4_ = fVar239;
        auVar60._28_4_ = auVar40._28_4_;
        auVar44 = vsubps_avx(auVar370,auVar57);
        auVar331._0_4_ = auVar234._0_4_ + fVar222;
        auVar331._4_4_ = auVar234._4_4_ + fVar359;
        auVar331._8_4_ = auVar234._8_4_ + fVar224;
        auVar331._12_4_ = auVar234._12_4_ + fVar226;
        auVar331._16_4_ = auVar234._16_4_ + fVar227;
        auVar331._20_4_ = auVar234._20_4_ + fVar228;
        auVar331._24_4_ = auVar234._24_4_ + fVar239;
        auVar331._28_4_ = auVar234._28_4_ + auVar40._28_4_;
        fVar222 = local_6a0._0_4_ * fVar264 * -fVar207;
        fVar359 = local_6a0._4_4_ * fVar229 * -fVar221;
        auVar61._4_4_ = fVar359;
        auVar61._0_4_ = fVar222;
        fVar224 = local_6a0._8_4_ * fVar247 * -fVar223;
        auVar61._8_4_ = fVar224;
        fVar226 = local_6a0._12_4_ * fVar261 * -fVar175;
        auVar61._12_4_ = fVar226;
        fVar227 = local_6a0._16_4_ * fVar266 * -fVar176;
        auVar61._16_4_ = fVar227;
        fVar228 = local_6a0._20_4_ * fVar170 * -fVar190;
        auVar61._20_4_ = fVar228;
        fVar239 = local_6a0._24_4_ * fVar193 * -fVar191;
        auVar61._24_4_ = fVar239;
        auVar61._28_4_ = fVar369;
        auVar45 = vsubps_avx(auVar315,auVar58);
        auVar340._0_4_ = fVar222 + auVar215._0_4_;
        auVar340._4_4_ = fVar359 + auVar215._4_4_;
        auVar340._8_4_ = fVar224 + auVar215._8_4_;
        auVar340._12_4_ = fVar226 + auVar215._12_4_;
        auVar340._16_4_ = fVar227 + auVar215._16_4_;
        auVar340._20_4_ = fVar228 + auVar215._20_4_;
        auVar340._24_4_ = fVar239 + auVar215._24_4_;
        auVar340._28_4_ = fVar369 + auVar215._28_4_;
        fVar222 = fVar264 * 0.0 * local_6a0._0_4_;
        fVar359 = fVar229 * 0.0 * local_6a0._4_4_;
        auVar62._4_4_ = fVar359;
        auVar62._0_4_ = fVar222;
        fVar224 = fVar247 * 0.0 * local_6a0._8_4_;
        auVar62._8_4_ = fVar224;
        fVar264 = fVar261 * 0.0 * local_6a0._12_4_;
        auVar62._12_4_ = fVar264;
        fVar226 = fVar266 * 0.0 * local_6a0._16_4_;
        auVar62._16_4_ = fVar226;
        fVar227 = fVar170 * 0.0 * local_6a0._20_4_;
        auVar62._20_4_ = fVar227;
        fVar228 = fVar193 * 0.0 * local_6a0._24_4_;
        auVar62._24_4_ = fVar228;
        auVar62._28_4_ = fVar205;
        auVar48 = vsubps_avx(_local_500,auVar59);
        auVar137._4_4_ = fStack_43c;
        auVar137._0_4_ = local_440;
        auVar137._8_4_ = fStack_438;
        auVar137._12_4_ = fStack_434;
        auVar137._16_4_ = fStack_430;
        auVar137._20_4_ = fStack_42c;
        auVar137._24_4_ = fStack_428;
        auVar137._28_4_ = fStack_424;
        auVar371._0_4_ = local_440 + fVar222;
        auVar371._4_4_ = fStack_43c + fVar359;
        auVar371._8_4_ = fStack_438 + fVar224;
        auVar371._12_4_ = fStack_434 + fVar264;
        auVar371._16_4_ = fStack_430 + fVar226;
        auVar371._20_4_ = fStack_42c + fVar227;
        auVar371._24_4_ = fStack_428 + fVar228;
        auVar371._28_4_ = fStack_424 + fVar205;
        auVar39 = vsubps_avx(auVar234,auVar60);
        auVar40 = vsubps_avx(auVar215,auVar61);
        auVar41 = vsubps_avx(auVar137,auVar62);
        auVar42 = vsubps_avx(auVar340,auVar45);
        auVar43 = vsubps_avx(auVar371,auVar48);
        auVar63._4_4_ = auVar48._4_4_ * auVar42._4_4_;
        auVar63._0_4_ = auVar48._0_4_ * auVar42._0_4_;
        auVar63._8_4_ = auVar48._8_4_ * auVar42._8_4_;
        auVar63._12_4_ = auVar48._12_4_ * auVar42._12_4_;
        auVar63._16_4_ = auVar48._16_4_ * auVar42._16_4_;
        auVar63._20_4_ = auVar48._20_4_ * auVar42._20_4_;
        auVar63._24_4_ = auVar48._24_4_ * auVar42._24_4_;
        auVar63._28_4_ = fVar369;
        auVar64._4_4_ = auVar45._4_4_ * auVar43._4_4_;
        auVar64._0_4_ = auVar45._0_4_ * auVar43._0_4_;
        auVar64._8_4_ = auVar45._8_4_ * auVar43._8_4_;
        auVar64._12_4_ = auVar45._12_4_ * auVar43._12_4_;
        auVar64._16_4_ = auVar45._16_4_ * auVar43._16_4_;
        auVar64._20_4_ = auVar45._20_4_ * auVar43._20_4_;
        auVar64._24_4_ = auVar45._24_4_ * auVar43._24_4_;
        auVar64._28_4_ = auVar215._28_4_;
        auVar46 = vsubps_avx(auVar64,auVar63);
        auVar65._4_4_ = auVar44._4_4_ * auVar43._4_4_;
        auVar65._0_4_ = auVar44._0_4_ * auVar43._0_4_;
        auVar65._8_4_ = auVar44._8_4_ * auVar43._8_4_;
        auVar65._12_4_ = auVar44._12_4_ * auVar43._12_4_;
        auVar65._16_4_ = auVar44._16_4_ * auVar43._16_4_;
        auVar65._20_4_ = auVar44._20_4_ * auVar43._20_4_;
        auVar65._24_4_ = auVar44._24_4_ * auVar43._24_4_;
        auVar65._28_4_ = auVar43._28_4_;
        auVar38 = vsubps_avx(auVar331,auVar44);
        auVar66._4_4_ = auVar48._4_4_ * auVar38._4_4_;
        auVar66._0_4_ = auVar48._0_4_ * auVar38._0_4_;
        auVar66._8_4_ = auVar48._8_4_ * auVar38._8_4_;
        auVar66._12_4_ = auVar48._12_4_ * auVar38._12_4_;
        auVar66._16_4_ = auVar48._16_4_ * auVar38._16_4_;
        auVar66._20_4_ = auVar48._20_4_ * auVar38._20_4_;
        auVar66._24_4_ = auVar48._24_4_ * auVar38._24_4_;
        auVar66._28_4_ = auVar234._28_4_;
        auVar160 = vsubps_avx(auVar66,auVar65);
        auVar67._4_4_ = auVar38._4_4_ * auVar45._4_4_;
        auVar67._0_4_ = auVar38._0_4_ * auVar45._0_4_;
        auVar67._8_4_ = auVar38._8_4_ * auVar45._8_4_;
        auVar67._12_4_ = auVar38._12_4_ * auVar45._12_4_;
        auVar67._16_4_ = auVar38._16_4_ * auVar45._16_4_;
        auVar67._20_4_ = auVar38._20_4_ * auVar45._20_4_;
        auVar67._24_4_ = auVar38._24_4_ * auVar45._24_4_;
        auVar67._28_4_ = auVar43._28_4_;
        auVar68._4_4_ = auVar44._4_4_ * auVar42._4_4_;
        auVar68._0_4_ = auVar44._0_4_ * auVar42._0_4_;
        auVar68._8_4_ = auVar44._8_4_ * auVar42._8_4_;
        auVar68._12_4_ = auVar44._12_4_ * auVar42._12_4_;
        auVar68._16_4_ = auVar44._16_4_ * auVar42._16_4_;
        auVar68._20_4_ = auVar44._20_4_ * auVar42._20_4_;
        auVar68._24_4_ = auVar44._24_4_ * auVar42._24_4_;
        auVar68._28_4_ = auVar42._28_4_;
        auVar42 = vsubps_avx(auVar68,auVar67);
        auVar164._0_4_ = auVar46._0_4_ * 0.0 + auVar42._0_4_ + auVar160._0_4_ * 0.0;
        auVar164._4_4_ = auVar46._4_4_ * 0.0 + auVar42._4_4_ + auVar160._4_4_ * 0.0;
        auVar164._8_4_ = auVar46._8_4_ * 0.0 + auVar42._8_4_ + auVar160._8_4_ * 0.0;
        auVar164._12_4_ = auVar46._12_4_ * 0.0 + auVar42._12_4_ + auVar160._12_4_ * 0.0;
        auVar164._16_4_ = auVar46._16_4_ * 0.0 + auVar42._16_4_ + auVar160._16_4_ * 0.0;
        auVar164._20_4_ = auVar46._20_4_ * 0.0 + auVar42._20_4_ + auVar160._20_4_ * 0.0;
        auVar164._24_4_ = auVar46._24_4_ * 0.0 + auVar42._24_4_ + auVar160._24_4_ * 0.0;
        auVar164._28_4_ = auVar42._28_4_ + auVar42._28_4_ + auVar160._28_4_;
        auVar46 = vcmpps_avx(auVar164,ZEXT432(0) << 0x20,2);
        local_620 = vblendvps_avx(auVar39,_local_5e0,auVar46);
        auVar39 = vblendvps_avx(auVar40,_local_520,auVar46);
        auVar40 = vblendvps_avx(auVar41,auVar274,auVar46);
        auVar41 = vblendvps_avx(auVar44,auVar331,auVar46);
        auVar42 = vblendvps_avx(auVar45,auVar340,auVar46);
        auVar43 = vblendvps_avx(auVar48,auVar371,auVar46);
        auVar44 = vblendvps_avx(auVar331,auVar44,auVar46);
        auVar45 = vblendvps_avx(auVar340,auVar45,auVar46);
        local_780._0_16_ = vpackssdw_avx(auVar159._0_16_,auVar159._16_16_);
        local_780._16_16_ = auVar159._16_16_;
        auVar159 = vblendvps_avx(auVar371,auVar48,auVar46);
        auVar44 = vsubps_avx(auVar44,local_620);
        auVar48 = vsubps_avx(auVar45,auVar39);
        auVar38 = vsubps_avx(auVar159,auVar40);
        auVar159 = vsubps_avx(auVar39,auVar42);
        fVar222 = auVar48._0_4_;
        fVar174 = auVar40._0_4_;
        fVar227 = auVar48._4_4_;
        fVar207 = auVar40._4_4_;
        auVar69._4_4_ = fVar207 * fVar227;
        auVar69._0_4_ = fVar174 * fVar222;
        fVar243 = auVar48._8_4_;
        fVar221 = auVar40._8_4_;
        auVar69._8_4_ = fVar221 * fVar243;
        fVar261 = auVar48._12_4_;
        fVar223 = auVar40._12_4_;
        auVar69._12_4_ = fVar223 * fVar261;
        fVar267 = auVar48._16_4_;
        fVar175 = auVar40._16_4_;
        auVar69._16_4_ = fVar175 * fVar267;
        fVar342 = auVar48._20_4_;
        fVar176 = auVar40._20_4_;
        auVar69._20_4_ = fVar176 * fVar342;
        fVar325 = auVar48._24_4_;
        fVar190 = auVar40._24_4_;
        auVar69._24_4_ = fVar190 * fVar325;
        auVar69._28_4_ = auVar45._28_4_;
        fVar359 = auVar39._0_4_;
        fVar281 = auVar38._0_4_;
        fVar228 = auVar39._4_4_;
        fVar282 = auVar38._4_4_;
        auVar70._4_4_ = fVar282 * fVar228;
        auVar70._0_4_ = fVar281 * fVar359;
        fVar247 = auVar39._8_4_;
        fVar283 = auVar38._8_4_;
        auVar70._8_4_ = fVar283 * fVar247;
        fVar262 = auVar39._12_4_;
        fVar284 = auVar38._12_4_;
        auVar70._12_4_ = fVar284 * fVar262;
        fVar341 = auVar39._16_4_;
        fVar244 = auVar38._16_4_;
        auVar70._16_4_ = fVar244 * fVar341;
        fVar192 = auVar39._20_4_;
        fVar245 = auVar38._20_4_;
        auVar70._20_4_ = fVar245 * fVar192;
        fVar251 = auVar39._24_4_;
        fVar230 = auVar38._24_4_;
        auVar70._24_4_ = fVar230 * fVar251;
        auVar70._28_4_ = auVar340._28_4_;
        auVar45 = vsubps_avx(auVar70,auVar69);
        fVar224 = local_620._0_4_;
        fVar229 = local_620._4_4_;
        auVar71._4_4_ = fVar282 * fVar229;
        auVar71._0_4_ = fVar281 * fVar224;
        fVar248 = local_620._8_4_;
        auVar71._8_4_ = fVar283 * fVar248;
        fVar263 = local_620._12_4_;
        auVar71._12_4_ = fVar284 * fVar263;
        fVar155 = local_620._16_4_;
        auVar71._16_4_ = fVar244 * fVar155;
        fVar193 = local_620._20_4_;
        auVar71._20_4_ = fVar245 * fVar193;
        fVar171 = local_620._24_4_;
        auVar71._24_4_ = fVar230 * fVar171;
        auVar71._28_4_ = auVar340._28_4_;
        fVar264 = auVar44._0_4_;
        auVar366._0_4_ = fVar174 * fVar264;
        fVar239 = auVar44._4_4_;
        auVar366._4_4_ = fVar207 * fVar239;
        fVar249 = auVar44._8_4_;
        auVar366._8_4_ = fVar221 * fVar249;
        fVar265 = auVar44._12_4_;
        auVar366._12_4_ = fVar223 * fVar265;
        fVar170 = auVar44._16_4_;
        auVar366._16_4_ = fVar175 * fVar170;
        fVar194 = auVar44._20_4_;
        auVar366._20_4_ = fVar176 * fVar194;
        fVar172 = auVar44._24_4_;
        auVar366._24_4_ = fVar190 * fVar172;
        auVar366._28_4_ = 0;
        auVar160 = vsubps_avx(auVar366,auVar71);
        auVar72._4_4_ = fVar228 * fVar239;
        auVar72._0_4_ = fVar359 * fVar264;
        auVar72._8_4_ = fVar247 * fVar249;
        auVar72._12_4_ = fVar262 * fVar265;
        auVar72._16_4_ = fVar341 * fVar170;
        auVar72._20_4_ = fVar192 * fVar194;
        auVar72._24_4_ = fVar251 * fVar172;
        auVar72._28_4_ = auVar340._28_4_;
        auVar73._4_4_ = fVar229 * fVar227;
        auVar73._0_4_ = fVar224 * fVar222;
        auVar73._8_4_ = fVar248 * fVar243;
        auVar73._12_4_ = fVar263 * fVar261;
        auVar73._16_4_ = fVar155 * fVar267;
        auVar73._20_4_ = fVar193 * fVar342;
        auVar73._24_4_ = fVar171 * fVar325;
        auVar73._28_4_ = auVar371._28_4_;
        auVar161 = vsubps_avx(auVar73,auVar72);
        auVar182 = vsubps_avx(auVar40,auVar43);
        fVar226 = auVar161._28_4_ + auVar160._28_4_;
        auVar186._0_4_ = auVar161._0_4_ + auVar160._0_4_ * 0.0 + auVar45._0_4_ * 0.0;
        auVar186._4_4_ = auVar161._4_4_ + auVar160._4_4_ * 0.0 + auVar45._4_4_ * 0.0;
        auVar186._8_4_ = auVar161._8_4_ + auVar160._8_4_ * 0.0 + auVar45._8_4_ * 0.0;
        auVar186._12_4_ = auVar161._12_4_ + auVar160._12_4_ * 0.0 + auVar45._12_4_ * 0.0;
        auVar186._16_4_ = auVar161._16_4_ + auVar160._16_4_ * 0.0 + auVar45._16_4_ * 0.0;
        auVar186._20_4_ = auVar161._20_4_ + auVar160._20_4_ * 0.0 + auVar45._20_4_ * 0.0;
        auVar186._24_4_ = auVar161._24_4_ + auVar160._24_4_ * 0.0 + auVar45._24_4_ * 0.0;
        auVar186._28_4_ = fVar226 + auVar45._28_4_;
        fVar191 = auVar159._0_4_;
        fVar205 = auVar159._4_4_;
        auVar74._4_4_ = fVar205 * auVar43._4_4_;
        auVar74._0_4_ = fVar191 * auVar43._0_4_;
        fVar250 = auVar159._8_4_;
        auVar74._8_4_ = fVar250 * auVar43._8_4_;
        fVar270 = auVar159._12_4_;
        auVar74._12_4_ = fVar270 * auVar43._12_4_;
        fVar278 = auVar159._16_4_;
        auVar74._16_4_ = fVar278 * auVar43._16_4_;
        fVar279 = auVar159._20_4_;
        auVar74._20_4_ = fVar279 * auVar43._20_4_;
        fVar280 = auVar159._24_4_;
        auVar74._24_4_ = fVar280 * auVar43._24_4_;
        auVar74._28_4_ = fVar226;
        fVar226 = auVar182._0_4_;
        fVar241 = auVar182._4_4_;
        auVar75._4_4_ = auVar42._4_4_ * fVar241;
        auVar75._0_4_ = auVar42._0_4_ * fVar226;
        fVar252 = auVar182._8_4_;
        auVar75._8_4_ = auVar42._8_4_ * fVar252;
        fVar266 = auVar182._12_4_;
        auVar75._12_4_ = auVar42._12_4_ * fVar266;
        fVar268 = auVar182._16_4_;
        auVar75._16_4_ = auVar42._16_4_ * fVar268;
        fVar269 = auVar182._20_4_;
        auVar75._20_4_ = auVar42._20_4_ * fVar269;
        fVar173 = auVar182._24_4_;
        auVar75._24_4_ = auVar42._24_4_ * fVar173;
        auVar75._28_4_ = auVar161._28_4_;
        auVar159 = vsubps_avx(auVar75,auVar74);
        auVar160 = vsubps_avx(local_620,auVar41);
        fVar240 = auVar160._0_4_;
        fVar242 = auVar160._4_4_;
        auVar76._4_4_ = fVar242 * auVar43._4_4_;
        auVar76._0_4_ = fVar240 * auVar43._0_4_;
        fVar285 = auVar160._8_4_;
        auVar76._8_4_ = fVar285 * auVar43._8_4_;
        fVar293 = auVar160._12_4_;
        auVar76._12_4_ = fVar293 * auVar43._12_4_;
        fVar294 = auVar160._16_4_;
        auVar76._16_4_ = fVar294 * auVar43._16_4_;
        fVar295 = auVar160._20_4_;
        auVar76._20_4_ = fVar295 * auVar43._20_4_;
        fVar246 = auVar160._24_4_;
        auVar76._24_4_ = fVar246 * auVar43._24_4_;
        auVar76._28_4_ = auVar43._28_4_;
        auVar77._4_4_ = auVar41._4_4_ * fVar241;
        auVar77._0_4_ = auVar41._0_4_ * fVar226;
        auVar77._8_4_ = auVar41._8_4_ * fVar252;
        auVar77._12_4_ = auVar41._12_4_ * fVar266;
        auVar77._16_4_ = auVar41._16_4_ * fVar268;
        auVar77._20_4_ = auVar41._20_4_ * fVar269;
        auVar77._24_4_ = auVar41._24_4_ * fVar173;
        auVar77._28_4_ = auVar45._28_4_;
        auVar45 = vsubps_avx(auVar76,auVar77);
        auVar78._4_4_ = auVar42._4_4_ * fVar242;
        auVar78._0_4_ = auVar42._0_4_ * fVar240;
        auVar78._8_4_ = auVar42._8_4_ * fVar285;
        auVar78._12_4_ = auVar42._12_4_ * fVar293;
        auVar78._16_4_ = auVar42._16_4_ * fVar294;
        auVar78._20_4_ = auVar42._20_4_ * fVar295;
        auVar78._24_4_ = auVar42._24_4_ * fVar246;
        auVar78._28_4_ = auVar43._28_4_;
        auVar79._4_4_ = auVar41._4_4_ * fVar205;
        auVar79._0_4_ = auVar41._0_4_ * fVar191;
        auVar79._8_4_ = auVar41._8_4_ * fVar250;
        auVar79._12_4_ = auVar41._12_4_ * fVar270;
        auVar79._16_4_ = auVar41._16_4_ * fVar278;
        auVar79._20_4_ = auVar41._20_4_ * fVar279;
        auVar79._24_4_ = auVar41._24_4_ * fVar280;
        auVar79._28_4_ = auVar41._28_4_;
        auVar41 = vsubps_avx(auVar79,auVar78);
        auVar236._0_4_ = auVar159._0_4_ * 0.0 + auVar41._0_4_ + auVar45._0_4_ * 0.0;
        auVar236._4_4_ = auVar159._4_4_ * 0.0 + auVar41._4_4_ + auVar45._4_4_ * 0.0;
        auVar236._8_4_ = auVar159._8_4_ * 0.0 + auVar41._8_4_ + auVar45._8_4_ * 0.0;
        auVar236._12_4_ = auVar159._12_4_ * 0.0 + auVar41._12_4_ + auVar45._12_4_ * 0.0;
        auVar236._16_4_ = auVar159._16_4_ * 0.0 + auVar41._16_4_ + auVar45._16_4_ * 0.0;
        auVar236._20_4_ = auVar159._20_4_ * 0.0 + auVar41._20_4_ + auVar45._20_4_ * 0.0;
        auVar236._24_4_ = auVar159._24_4_ * 0.0 + auVar41._24_4_ + auVar45._24_4_ * 0.0;
        auVar236._28_4_ = auVar41._28_4_ + auVar41._28_4_ + auVar45._28_4_;
        auVar159 = vmaxps_avx(auVar186,auVar236);
        auVar159 = vcmpps_avx(auVar159,ZEXT832(0) << 0x20,2);
        auVar373 = vpackssdw_avx(auVar159._0_16_,auVar159._16_16_);
        auVar373 = vpand_avx(auVar373,local_780._0_16_);
        auVar196 = vpmovsxwd_avx(auVar373);
        auVar233 = vpunpckhwd_avx(auVar373,auVar373);
        auVar217._16_16_ = auVar233;
        auVar217._0_16_ = auVar196;
        if ((((((((auVar217 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar217 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar217 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar217 >> 0x7f,0) == '\0') &&
              (auVar217 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar233 >> 0x3f,0) == '\0') &&
            (auVar217 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar233[0xf]) {
LAB_0125bb4c:
          auVar189 = ZEXT3264(CONCAT824(uStack_488,
                                        CONCAT816(uStack_490,CONCAT88(uStack_498,local_4a0))));
          auVar169 = ZEXT3264(local_4e0);
        }
        else {
          auVar80._4_4_ = fVar241 * fVar227;
          auVar80._0_4_ = fVar226 * fVar222;
          auVar80._8_4_ = fVar252 * fVar243;
          auVar80._12_4_ = fVar266 * fVar261;
          auVar80._16_4_ = fVar268 * fVar267;
          auVar80._20_4_ = fVar269 * fVar342;
          auVar80._24_4_ = fVar173 * fVar325;
          auVar80._28_4_ = auVar233._12_4_;
          auVar347._0_4_ = fVar191 * fVar281;
          auVar347._4_4_ = fVar205 * fVar282;
          auVar347._8_4_ = fVar250 * fVar283;
          auVar347._12_4_ = fVar270 * fVar284;
          auVar347._16_4_ = fVar278 * fVar244;
          auVar347._20_4_ = fVar279 * fVar245;
          auVar347._24_4_ = fVar280 * fVar230;
          auVar347._28_4_ = 0;
          auVar159 = vsubps_avx(auVar347,auVar80);
          auVar81._4_4_ = fVar242 * fVar282;
          auVar81._0_4_ = fVar240 * fVar281;
          auVar81._8_4_ = fVar285 * fVar283;
          auVar81._12_4_ = fVar293 * fVar284;
          auVar81._16_4_ = fVar294 * fVar244;
          auVar81._20_4_ = fVar295 * fVar245;
          auVar81._24_4_ = fVar246 * fVar230;
          auVar81._28_4_ = auVar38._28_4_;
          auVar82._4_4_ = fVar241 * fVar239;
          auVar82._0_4_ = fVar226 * fVar264;
          auVar82._8_4_ = fVar252 * fVar249;
          auVar82._12_4_ = fVar266 * fVar265;
          auVar82._16_4_ = fVar268 * fVar170;
          auVar82._20_4_ = fVar269 * fVar194;
          auVar82._24_4_ = fVar173 * fVar172;
          auVar82._28_4_ = auVar182._28_4_;
          auVar42 = vsubps_avx(auVar82,auVar81);
          auVar83._4_4_ = fVar205 * fVar239;
          auVar83._0_4_ = fVar191 * fVar264;
          auVar83._8_4_ = fVar250 * fVar249;
          auVar83._12_4_ = fVar270 * fVar265;
          auVar83._16_4_ = fVar278 * fVar170;
          auVar83._20_4_ = fVar279 * fVar194;
          auVar83._24_4_ = fVar280 * fVar172;
          auVar83._28_4_ = auVar186._28_4_;
          auVar84._4_4_ = fVar242 * fVar227;
          auVar84._0_4_ = fVar240 * fVar222;
          auVar84._8_4_ = fVar285 * fVar243;
          auVar84._12_4_ = fVar293 * fVar261;
          auVar84._16_4_ = fVar294 * fVar267;
          auVar84._20_4_ = fVar295 * fVar342;
          auVar84._24_4_ = fVar246 * fVar325;
          auVar84._28_4_ = auVar48._28_4_;
          auVar43 = vsubps_avx(auVar84,auVar83);
          auVar292._0_4_ = auVar159._0_4_ * 0.0 + auVar43._0_4_ + auVar42._0_4_ * 0.0;
          auVar292._4_4_ = auVar159._4_4_ * 0.0 + auVar43._4_4_ + auVar42._4_4_ * 0.0;
          auVar292._8_4_ = auVar159._8_4_ * 0.0 + auVar43._8_4_ + auVar42._8_4_ * 0.0;
          auVar292._12_4_ = auVar159._12_4_ * 0.0 + auVar43._12_4_ + auVar42._12_4_ * 0.0;
          auVar292._16_4_ = auVar159._16_4_ * 0.0 + auVar43._16_4_ + auVar42._16_4_ * 0.0;
          auVar292._20_4_ = auVar159._20_4_ * 0.0 + auVar43._20_4_ + auVar42._20_4_ * 0.0;
          auVar292._24_4_ = auVar159._24_4_ * 0.0 + auVar43._24_4_ + auVar42._24_4_ * 0.0;
          auVar292._28_4_ = auVar48._28_4_ + auVar43._28_4_ + auVar186._28_4_;
          auVar41 = vrcpps_avx(auVar292);
          fVar264 = auVar41._0_4_;
          fVar226 = auVar41._4_4_;
          auVar85._4_4_ = auVar292._4_4_ * fVar226;
          auVar85._0_4_ = auVar292._0_4_ * fVar264;
          fVar227 = auVar41._8_4_;
          auVar85._8_4_ = auVar292._8_4_ * fVar227;
          fVar239 = auVar41._12_4_;
          auVar85._12_4_ = auVar292._12_4_ * fVar239;
          fVar241 = auVar41._16_4_;
          auVar85._16_4_ = auVar292._16_4_ * fVar241;
          fVar243 = auVar41._20_4_;
          auVar85._20_4_ = auVar292._20_4_ * fVar243;
          fVar249 = auVar41._24_4_;
          auVar85._24_4_ = auVar292._24_4_ * fVar249;
          auVar85._28_4_ = auVar182._28_4_;
          auVar348._8_4_ = 0x3f800000;
          auVar348._0_8_ = &DAT_3f8000003f800000;
          auVar348._12_4_ = 0x3f800000;
          auVar348._16_4_ = 0x3f800000;
          auVar348._20_4_ = 0x3f800000;
          auVar348._24_4_ = 0x3f800000;
          auVar348._28_4_ = 0x3f800000;
          auVar45 = vsubps_avx(auVar348,auVar85);
          fVar264 = auVar45._0_4_ * fVar264 + fVar264;
          fVar226 = auVar45._4_4_ * fVar226 + fVar226;
          fVar227 = auVar45._8_4_ * fVar227 + fVar227;
          fVar239 = auVar45._12_4_ * fVar239 + fVar239;
          fVar241 = auVar45._16_4_ * fVar241 + fVar241;
          fVar243 = auVar45._20_4_ * fVar243 + fVar243;
          fVar249 = auVar45._24_4_ * fVar249 + fVar249;
          auVar86._4_4_ =
               (auVar159._4_4_ * fVar229 + auVar42._4_4_ * fVar228 + auVar43._4_4_ * fVar207) *
               fVar226;
          auVar86._0_4_ =
               (auVar159._0_4_ * fVar224 + auVar42._0_4_ * fVar359 + auVar43._0_4_ * fVar174) *
               fVar264;
          auVar86._8_4_ =
               (auVar159._8_4_ * fVar248 + auVar42._8_4_ * fVar247 + auVar43._8_4_ * fVar221) *
               fVar227;
          auVar86._12_4_ =
               (auVar159._12_4_ * fVar263 + auVar42._12_4_ * fVar262 + auVar43._12_4_ * fVar223) *
               fVar239;
          auVar86._16_4_ =
               (auVar159._16_4_ * fVar155 + auVar42._16_4_ * fVar341 + auVar43._16_4_ * fVar175) *
               fVar241;
          auVar86._20_4_ =
               (auVar159._20_4_ * fVar193 + auVar42._20_4_ * fVar192 + auVar43._20_4_ * fVar176) *
               fVar243;
          auVar86._24_4_ =
               (auVar159._24_4_ * fVar171 + auVar42._24_4_ * fVar251 + auVar43._24_4_ * fVar190) *
               fVar249;
          auVar86._28_4_ = local_620._28_4_ + auVar44._28_4_ + auVar40._28_4_;
          auVar196 = vpermilps_avx(ZEXT416(local_7c0),0);
          auVar218._16_16_ = auVar196;
          auVar218._0_16_ = auVar196;
          auVar159 = vcmpps_avx(auVar218,auVar86,2);
          fVar222 = local_7e8->tfar;
          auVar257._4_4_ = fVar222;
          auVar257._0_4_ = fVar222;
          auVar257._8_4_ = fVar222;
          auVar257._12_4_ = fVar222;
          auVar257._16_4_ = fVar222;
          auVar257._20_4_ = fVar222;
          auVar257._24_4_ = fVar222;
          auVar257._28_4_ = fVar222;
          auVar40 = vcmpps_avx(auVar86,auVar257,2);
          auVar159 = vandps_avx(auVar40,auVar159);
          auVar196 = vpackssdw_avx(auVar159._0_16_,auVar159._16_16_);
          auVar373 = vpand_avx(auVar373,auVar196);
          auVar196 = vpmovsxwd_avx(auVar373);
          auVar233 = vpshufd_avx(auVar373,0xee);
          auVar233 = vpmovsxwd_avx(auVar233);
          auVar219._16_16_ = auVar233;
          auVar219._0_16_ = auVar196;
          if ((((((((auVar219 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar219 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar219 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar219 >> 0x7f,0) == '\0') &&
                (auVar219 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar233 >> 0x3f,0) == '\0') &&
              (auVar219 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar233[0xf]) goto LAB_0125bb4c;
          auVar159 = vcmpps_avx(ZEXT832(0) << 0x20,auVar292,4);
          auVar196 = vpackssdw_avx(auVar159._0_16_,auVar159._16_16_);
          auVar373 = vpand_avx(auVar373,auVar196);
          auVar196 = vpmovsxwd_avx(auVar373);
          auVar373 = vpunpckhwd_avx(auVar373,auVar373);
          auVar275._16_16_ = auVar373;
          auVar275._0_16_ = auVar196;
          auVar189 = ZEXT3264(CONCAT824(uStack_488,
                                        CONCAT816(uStack_490,CONCAT88(uStack_498,local_4a0))));
          auVar169 = ZEXT3264(local_4e0);
          if ((((((((auVar275 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar275 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar275 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar275 >> 0x7f,0) != '\0') ||
                (auVar275 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar373 >> 0x3f,0) != '\0') ||
              (auVar275 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar373[0xf] < '\0') {
            auVar87._4_4_ = auVar186._4_4_ * fVar226;
            auVar87._0_4_ = auVar186._0_4_ * fVar264;
            auVar87._8_4_ = auVar186._8_4_ * fVar227;
            auVar87._12_4_ = auVar186._12_4_ * fVar239;
            auVar87._16_4_ = auVar186._16_4_ * fVar241;
            auVar87._20_4_ = auVar186._20_4_ * fVar243;
            auVar87._24_4_ = auVar186._24_4_ * fVar249;
            auVar87._28_4_ = local_460._28_4_;
            auVar88._4_4_ = auVar236._4_4_ * fVar226;
            auVar88._0_4_ = auVar236._0_4_ * fVar264;
            auVar88._8_4_ = auVar236._8_4_ * fVar227;
            auVar88._12_4_ = auVar236._12_4_ * fVar239;
            auVar88._16_4_ = auVar236._16_4_ * fVar241;
            auVar88._20_4_ = auVar236._20_4_ * fVar243;
            auVar88._24_4_ = auVar236._24_4_ * fVar249;
            auVar88._28_4_ = auVar45._28_4_ + auVar41._28_4_;
            auVar258._8_4_ = 0x3f800000;
            auVar258._0_8_ = &DAT_3f8000003f800000;
            auVar258._12_4_ = 0x3f800000;
            auVar258._16_4_ = 0x3f800000;
            auVar258._20_4_ = 0x3f800000;
            auVar258._24_4_ = 0x3f800000;
            auVar258._28_4_ = 0x3f800000;
            auVar159 = vsubps_avx(auVar258,auVar87);
            auVar159 = vblendvps_avx(auVar159,auVar87,auVar46);
            auVar169 = ZEXT3264(auVar159);
            auVar159 = vsubps_avx(auVar258,auVar88);
            _local_360 = vblendvps_avx(auVar159,auVar88,auVar46);
            auVar189 = ZEXT3264(auVar275);
            local_460 = auVar86;
          }
        }
        auVar333 = ZEXT3264(auVar304);
        local_4e0 = auVar169._0_32_;
        auVar159 = auVar189._0_32_;
        if ((((((((auVar159 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar159 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar159 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar159 >> 0x7f,0) == '\0') &&
              (auVar189 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar159 >> 0xbf,0) == '\0') &&
            (auVar189 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar189[0x1f]) {
          uVar153 = 0;
          _local_670 = auVar15;
          local_3e0 = auVar14;
        }
        else {
          auVar40 = vsubps_avx(local_6a0._0_32_,_local_7e0);
          fVar359 = (float)local_7e0 + auVar40._0_4_ * auVar169._0_4_;
          fVar224 = (float)auStack_7dc._0_4_ + auVar40._4_4_ * auVar169._4_4_;
          fVar264 = (float)auStack_7dc._4_4_ + auVar40._8_4_ * auVar169._8_4_;
          fVar226 = fStack_7d4 + auVar40._12_4_ * auVar169._12_4_;
          fVar227 = fStack_7d0 + auVar40._16_4_ * auVar169._16_4_;
          fVar228 = fStack_7cc + auVar40._20_4_ * auVar169._20_4_;
          fVar229 = fStack_7c8 + auVar40._24_4_ * auVar169._24_4_;
          fVar239 = fStack_7c4 + auVar40._28_4_;
          fVar222 = local_788->depth_scale;
          auVar89._4_4_ = (fVar224 + fVar224) * fVar222;
          auVar89._0_4_ = (fVar359 + fVar359) * fVar222;
          auVar89._8_4_ = (fVar264 + fVar264) * fVar222;
          auVar89._12_4_ = (fVar226 + fVar226) * fVar222;
          auVar89._16_4_ = (fVar227 + fVar227) * fVar222;
          auVar89._20_4_ = (fVar228 + fVar228) * fVar222;
          auVar89._24_4_ = (fVar229 + fVar229) * fVar222;
          auVar89._28_4_ = fVar239 + fVar239;
          auVar40 = vcmpps_avx(local_460,auVar89,6);
          auVar41 = auVar159 & auVar40;
          if ((((((((auVar41 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar41 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar41 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar41 >> 0x7f,0) != '\0') ||
                (auVar41 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar41 >> 0xbf,0) != '\0') ||
              (auVar41 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar41[0x1f] < '\0') {
            local_240 = vandps_avx(auVar40,auVar159);
            local_2e0._0_4_ = (float)local_360._0_4_ + (float)local_360._0_4_ + -1.0;
            local_2e0._4_4_ = (float)local_360._4_4_ + (float)local_360._4_4_ + -1.0;
            fStack_2d8 = (float)uStack_358 + (float)uStack_358 + -1.0;
            fStack_2d4 = uStack_358._4_4_ + uStack_358._4_4_ + -1.0;
            fStack_2d0 = (float)uStack_350 + (float)uStack_350 + -1.0;
            fStack_2cc = uStack_350._4_4_ + uStack_350._4_4_ + -1.0;
            fStack_2c8 = (float)uStack_348 + (float)uStack_348 + -1.0;
            fStack_2c4 = uStack_348._4_4_ + uStack_348._4_4_ + -1.0;
            local_300 = local_4e0;
            local_2c0 = local_460;
            local_2a0 = 0;
            local_29c = uVar149;
            local_290 = local_670;
            uStack_288 = uStack_668;
            local_280 = local_4b0._0_8_;
            uStack_278 = local_4b0._8_8_;
            local_270 = local_3e0._0_8_;
            uStack_268 = local_3e0._8_8_;
            local_260 = local_3d0._0_8_;
            uStack_258 = local_3d0._8_8_;
            local_360._4_4_ = local_2e0._4_4_;
            local_360._0_4_ = local_2e0._0_4_;
            uStack_358._0_4_ = fStack_2d8;
            uStack_358._4_4_ = fStack_2d4;
            uStack_350._0_4_ = fStack_2d0;
            uStack_350._4_4_ = fStack_2cc;
            auVar181 = _local_360;
            uStack_348._0_4_ = fStack_2c8;
            uStack_348._4_4_ = fStack_2c4;
            auVar159 = _local_360;
            if ((pGVar34->mask & local_7e8->mask) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (uVar153 = CONCAT71((int7)(uVar153 >> 8),1), _local_670 = auVar15,
                 local_3e0 = auVar14, pGVar34->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar198._0_4_ = 1.0 / local_3c0;
                auVar198._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar373 = vshufps_avx(auVar198,auVar198,0);
                local_220[0] = auVar373._0_4_ * (auVar169._0_4_ + 0.0);
                local_220[1] = auVar373._4_4_ * (auVar169._4_4_ + 1.0);
                local_220[2] = auVar373._8_4_ * (auVar169._8_4_ + 2.0);
                local_220[3] = auVar373._12_4_ * (auVar169._12_4_ + 3.0);
                fStack_210 = auVar373._0_4_ * (auVar169._16_4_ + 4.0);
                fStack_20c = auVar373._4_4_ * (auVar169._20_4_ + 5.0);
                fStack_208 = auVar373._8_4_ * (auVar169._24_4_ + 6.0);
                fStack_204 = auVar169._28_4_ + 7.0;
                uStack_350 = auVar181._16_8_;
                uStack_348 = auVar159._24_8_;
                local_200 = local_360;
                uStack_1f8 = uStack_358;
                uStack_1f0 = uStack_350;
                uStack_1e8 = uStack_348;
                local_1e0 = local_460;
                iVar146 = vmovmskps_avx(local_240);
                uVar148 = CONCAT44((int)((ulong)context->args >> 0x20),iVar146);
                lVar154 = 0;
                if (uVar148 != 0) {
                  for (; (uVar148 >> lVar154 & 1) == 0; lVar154 = lVar154 + 1) {
                  }
                }
                uVar153 = CONCAT71((int7)(uVar153 >> 8),iVar146 != 0);
                auVar40 = local_4e0;
                _local_670 = auVar15;
                local_3e0 = auVar14;
                _local_360 = auVar159;
                if (iVar146 != 0) {
                  local_780._0_8_ = uVar148;
                  _auStack_6b0 = auVar39._16_16_;
                  uStack_6b8 = local_4b0._8_8_;
                  local_6c0 = (undefined1  [8])local_4b0._0_8_;
                  _auStack_5b0 = auVar234._16_16_;
                  _local_5c0 = local_3e0;
                  _auStack_6d0 = auVar215._16_16_;
                  uStack_6d8 = local_3d0._8_8_;
                  local_6e0 = (undefined1  [8])local_3d0._0_8_;
                  local_7f0 = context;
                  local_4b0 = auVar16;
                  local_3d0 = auVar17;
                  do {
                    local_654 = local_220[lVar154];
                    local_650 = *(undefined4 *)((long)&local_200 + lVar154 * 4);
                    local_620._0_4_ = ray->tfar;
                    local_6a0._0_8_ = lVar154;
                    ray->tfar = *(float *)(local_1e0 + lVar154 * 4);
                    local_730.context = context->user;
                    fVar359 = 1.0 - local_654;
                    fVar222 = local_654 * fVar359 + local_654 * fVar359;
                    auVar373 = ZEXT416((uint)(local_654 * local_654 * 3.0));
                    auVar373 = vshufps_avx(auVar373,auVar373,0);
                    auVar196 = ZEXT416((uint)((fVar222 - local_654 * local_654) * 3.0));
                    auVar196 = vshufps_avx(auVar196,auVar196,0);
                    auVar233 = ZEXT416((uint)((fVar359 * fVar359 - fVar222) * 3.0));
                    auVar233 = vshufps_avx(auVar233,auVar233,0);
                    auVar210 = ZEXT416((uint)(fVar359 * fVar359 * -3.0));
                    auVar210 = vshufps_avx(auVar210,auVar210,0);
                    auVar199._0_4_ =
                         auVar210._0_4_ * (float)local_670._0_4_ +
                         auVar233._0_4_ * (float)local_6c0._0_4_ +
                         auVar373._0_4_ * (float)local_6e0._0_4_ +
                         auVar196._0_4_ * (float)local_5c0._0_4_;
                    auVar199._4_4_ =
                         auVar210._4_4_ * (float)local_670._4_4_ +
                         auVar233._4_4_ * (float)local_6c0._4_4_ +
                         auVar373._4_4_ * (float)local_6e0._4_4_ +
                         auVar196._4_4_ * (float)local_5c0._4_4_;
                    auVar199._8_4_ =
                         auVar210._8_4_ * (float)uStack_668 +
                         auVar233._8_4_ * (float)uStack_6b8 +
                         auVar373._8_4_ * (float)uStack_6d8 + auVar196._8_4_ * fStack_5b8;
                    auVar199._12_4_ =
                         auVar210._12_4_ * uStack_668._4_4_ +
                         auVar233._12_4_ * uStack_6b8._4_4_ +
                         auVar373._12_4_ * uStack_6d8._4_4_ + auVar196._12_4_ * fStack_5b4;
                    local_660 = vmovlps_avx(auVar199);
                    local_658 = vextractps_avx(auVar199,2);
                    local_64c = (int)local_628;
                    local_648 = (int)local_790;
                    local_644 = (local_730.context)->instID[0];
                    local_640 = (local_730.context)->instPrimID[0];
                    local_7f4 = -1;
                    local_730.valid = &local_7f4;
                    local_730.geometryUserPtr = pGVar34->userPtr;
                    local_730.ray = (RTCRayN *)ray;
                    local_730.hit = (RTCHitN *)&local_660;
                    local_730.N = 1;
                    local_7e0 = (undefined1  [4])(int)uVar153;
                    if (pGVar34->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0125be12:
                      auVar304 = auVar333._0_32_;
                      p_Var37 = context->args->filter;
                      auVar40 = auVar169._0_32_;
                      auVar16 = local_4b0;
                      auVar17 = local_3d0;
                      if (p_Var37 == (RTCFilterFunctionN)0x0) break;
                      if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar34->field_8).field_0x2 & 0x40) != 0)) {
                        (*p_Var37)(&local_730);
                        uVar153 = (ulong)(uint)local_7e0;
                        auVar333 = ZEXT3264(_local_560);
                        auVar169 = ZEXT3264(local_4e0);
                        context = local_7f0;
                        ray = local_7e8;
                        fVar309 = (float)local_700._0_4_;
                        fVar310 = (float)local_700._4_4_;
                        fVar326 = fStack_6f8;
                        fVar334 = fStack_6f4;
                        fVar206 = fStack_6f0;
                        fVar204 = fStack_6ec;
                        fVar220 = fStack_6e8;
                        fVar225 = fStack_6e4;
                      }
                      auVar304 = auVar333._0_32_;
                      auVar40 = auVar169._0_32_;
                      auVar16 = local_4b0;
                      auVar17 = local_3d0;
                      if (*local_730.valid != 0) break;
                    }
                    else {
                      (*pGVar34->occlusionFilterN)(&local_730);
                      uVar153 = (ulong)(uint)local_7e0;
                      auVar333 = ZEXT3264(_local_560);
                      auVar169 = ZEXT3264(local_4e0);
                      context = local_7f0;
                      ray = local_7e8;
                      fVar309 = (float)local_700._0_4_;
                      fVar310 = (float)local_700._4_4_;
                      fVar326 = fStack_6f8;
                      fVar334 = fStack_6f4;
                      fVar206 = fStack_6f0;
                      fVar204 = fStack_6ec;
                      fVar220 = fStack_6e8;
                      fVar225 = fStack_6e4;
                      if (*local_730.valid != 0) goto LAB_0125be12;
                    }
                    auVar304 = auVar333._0_32_;
                    ray->tfar = (float)local_620._0_4_;
                    uVar148 = local_780._0_8_ ^ 1L << (local_6a0._0_8_ & 0x3f);
                    lVar154 = 0;
                    if (uVar148 != 0) {
                      for (; (uVar148 >> lVar154 & 1) == 0; lVar154 = lVar154 + 1) {
                      }
                    }
                    local_780._0_8_ = uVar148;
                    uVar153 = CONCAT71((int7)(uVar153 >> 8),uVar148 != 0);
                    auVar40 = auVar169._0_32_;
                    auVar16 = local_4b0;
                    auVar17 = local_3d0;
                  } while (uVar148 != 0);
                }
                local_3d0 = auVar17;
                local_4b0 = auVar16;
                local_4e0 = auVar40;
                uVar153 = uVar153 & 0xffffffffffffff01;
                auVar16 = local_4b0;
                auVar17 = local_3d0;
              }
              goto LAB_0125acea;
            }
          }
          uVar153 = 0;
          _local_670 = auVar15;
          local_3e0 = auVar14;
        }
LAB_0125acea:
        local_3d0 = auVar17;
        local_4b0 = auVar16;
        local_7f0 = context;
        auVar373 = local_760._0_16_;
      }
      auVar189 = ZEXT1664(auVar373);
      if (8 < (int)uVar149) {
        _local_520 = vpshufd_avx(ZEXT416(uVar149),0);
        auVar373 = vshufps_avx(auVar373,auVar373,0);
        local_100._16_16_ = auVar373;
        local_100._0_16_ = auVar373;
        auVar135._4_4_ = uStack_7bc;
        auVar135._0_4_ = local_7c0;
        auVar135._8_4_ = fStack_7b8;
        auVar135._12_4_ = fStack_7b4;
        auVar373 = vpermilps_avx(auVar135,0);
        local_120._16_16_ = auVar373;
        local_120._0_16_ = auVar373;
        auVar158._0_4_ = 1.0 / local_3c0;
        auVar158._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar373 = vshufps_avx(auVar158,auVar158,0);
        register0x00001210 = auVar373;
        _local_140 = auVar373;
        auVar169 = ZEXT3264(_local_140);
        lVar154 = 8;
        auVar333 = ZEXT3264(_local_580);
        _local_560 = auVar304;
        fVar222 = (float)local_600._0_4_;
        fVar359 = (float)local_600._4_4_;
        fVar224 = fStack_5f8;
        fVar264 = fStack_5f4;
        fVar226 = fStack_5f0;
        fVar227 = fStack_5ec;
        fVar228 = fStack_5e8;
        fVar229 = fStack_5e4;
        fVar239 = (float)local_480._0_4_;
        fVar241 = (float)local_480._4_4_;
        fVar243 = fStack_478;
        fVar247 = fStack_474;
        fVar248 = fStack_470;
        fVar249 = fStack_46c;
        fVar252 = fStack_468;
        do {
          pauVar9 = (undefined1 (*) [28])(bezier_basis0 + lVar154 * 4 + lVar152);
          fVar261 = *(float *)*pauVar9;
          fVar262 = *(float *)(*pauVar9 + 4);
          fVar263 = *(float *)(*pauVar9 + 8);
          fVar265 = *(float *)(*pauVar9 + 0xc);
          fVar266 = *(float *)(*pauVar9 + 0x10);
          fVar267 = *(float *)(*pauVar9 + 0x14);
          fVar341 = *(float *)(*pauVar9 + 0x18);
          auVar143 = *pauVar9;
          pauVar11 = (undefined1 (*) [28])(lVar152 + 0x2227768 + lVar154 * 4);
          fVar155 = *(float *)*pauVar11;
          fVar170 = *(float *)(*pauVar11 + 4);
          fVar268 = *(float *)(*pauVar11 + 8);
          fVar342 = *(float *)(*pauVar11 + 0xc);
          fVar192 = *(float *)(*pauVar11 + 0x10);
          fVar193 = *(float *)(*pauVar11 + 0x14);
          fVar194 = *(float *)(*pauVar11 + 0x18);
          auVar142 = *pauVar11;
          pauVar11 = (undefined1 (*) [28])(lVar152 + 0x2227bec + lVar154 * 4);
          fVar269 = *(float *)*pauVar11;
          fVar325 = *(float *)(*pauVar11 + 4);
          fVar251 = *(float *)(*pauVar11 + 8);
          fVar171 = *(float *)(*pauVar11 + 0xc);
          fVar172 = *(float *)(*pauVar11 + 0x10);
          fVar173 = *(float *)(*pauVar11 + 0x14);
          fVar174 = *(float *)(*pauVar11 + 0x18);
          auVar141 = *pauVar11;
          pauVar11 = (undefined1 (*) [28])(lVar152 + 0x2228070 + lVar154 * 4);
          fVar207 = *(float *)*pauVar11;
          fVar221 = *(float *)(*pauVar11 + 4);
          fVar223 = *(float *)(*pauVar11 + 8);
          fVar175 = *(float *)(*pauVar11 + 0xc);
          fVar176 = *(float *)(*pauVar11 + 0x10);
          fVar190 = *(float *)(*pauVar11 + 0x14);
          fVar191 = *(float *)(*pauVar11 + 0x18);
          auVar140 = *pauVar11;
          fVar205 = fVar229 + *(float *)pauVar11[1];
          fStack_7a4 = fVar229 + fVar229 + auVar169._28_4_;
          fVar250 = fVar229 + fVar205;
          auVar317._0_4_ =
               (float)local_340._0_4_ * fVar261 +
               fVar309 * fVar155 + auVar333._0_4_ * fVar269 + (float)local_3a0._0_4_ * fVar207;
          auVar317._4_4_ =
               (float)local_340._4_4_ * fVar262 +
               fVar310 * fVar170 + auVar333._4_4_ * fVar325 + (float)local_3a0._4_4_ * fVar221;
          auVar317._8_4_ =
               fStack_338 * fVar263 +
               fVar326 * fVar268 + auVar333._8_4_ * fVar251 + fStack_398 * fVar223;
          auVar317._12_4_ =
               fStack_334 * fVar265 +
               fVar334 * fVar342 + auVar333._12_4_ * fVar171 + fStack_394 * fVar175;
          auVar317._16_4_ =
               fStack_330 * fVar266 +
               fVar206 * fVar192 + auVar333._16_4_ * fVar172 + fStack_390 * fVar176;
          auVar317._20_4_ =
               fStack_32c * fVar267 +
               fVar204 * fVar193 + auVar333._20_4_ * fVar173 + fStack_38c * fVar190;
          auVar317._24_4_ =
               fStack_328 * fVar341 +
               fVar220 * fVar194 + auVar333._24_4_ * fVar174 + fStack_388 * fVar191;
          auVar317._28_4_ = fVar205 + fStack_7a4;
          local_760._0_4_ =
               (float)local_400._0_4_ * fVar261 +
               fVar239 * fVar155 + (float)local_5a0._0_4_ * fVar269 + fVar222 * fVar207;
          local_760._4_4_ =
               (float)local_400._4_4_ * fVar262 +
               fVar241 * fVar170 + (float)local_5a0._4_4_ * fVar325 + fVar359 * fVar221;
          local_760._8_4_ =
               fStack_3f8 * fVar263 + fVar243 * fVar268 + fStack_598 * fVar251 + fVar224 * fVar223;
          local_760._12_4_ =
               fStack_3f4 * fVar265 + fVar247 * fVar342 + fStack_594 * fVar171 + fVar264 * fVar175;
          local_760._16_4_ =
               fStack_3f0 * fVar266 + fVar248 * fVar192 + fStack_590 * fVar172 + fVar226 * fVar176;
          local_760._20_4_ =
               fStack_3ec * fVar267 + fVar249 * fVar193 + fStack_58c * fVar173 + fVar227 * fVar190;
          local_760._24_4_ =
               fStack_3e8 * fVar341 + fVar252 * fVar194 + fStack_588 * fVar174 + fVar228 * fVar191;
          local_760._28_4_ = fStack_7a4 + fVar229 + fVar229 + auVar189._28_4_;
          fVar155 = (float)local_c0._0_4_ * fVar261 +
                    fVar155 * (float)local_180._0_4_ +
                    (float)local_160._0_4_ * fVar269 + (float)local_a0._0_4_ * fVar207;
          fVar170 = (float)local_c0._4_4_ * fVar262 +
                    fVar170 * (float)local_180._4_4_ +
                    (float)local_160._4_4_ * fVar325 + (float)local_a0._4_4_ * fVar221;
          fStack_7b8 = fStack_b8 * fVar263 +
                       fVar268 * fStack_178 + fStack_158 * fVar251 + fStack_98 * fVar223;
          fStack_7b4 = fStack_b4 * fVar265 +
                       fVar342 * fStack_174 + fStack_154 * fVar171 + fStack_94 * fVar175;
          fStack_7b0 = fStack_b0 * fVar266 +
                       fVar192 * fStack_170 + fStack_150 * fVar172 + fStack_90 * fVar176;
          fStack_7ac = fStack_ac * fVar267 +
                       fVar193 * fStack_16c + fStack_14c * fVar173 + fStack_8c * fVar190;
          fStack_7a8 = fStack_a8 * fVar341 +
                       fVar194 * fStack_168 + fStack_148 * fVar174 + fStack_88 * fVar191;
          fStack_7a4 = fStack_7a4 + fVar250;
          auVar181 = *(undefined1 (*) [24])(bezier_basis1 + lVar154 * 4 + lVar152);
          auVar159 = *(undefined1 (*) [32])(lVar152 + 0x2229b88 + lVar154 * 4);
          auVar169 = ZEXT3264(auVar159);
          auVar39 = *(undefined1 (*) [32])(lVar152 + 0x222a00c + lVar154 * 4);
          auVar189 = ZEXT3264(auVar39);
          pauVar11 = (undefined1 (*) [28])(lVar152 + 0x222a490 + lVar154 * 4);
          fVar239 = *(float *)*pauVar11;
          fVar241 = *(float *)(*pauVar11 + 4);
          fVar243 = *(float *)(*pauVar11 + 8);
          fVar247 = *(float *)(*pauVar11 + 0xc);
          fVar248 = *(float *)(*pauVar11 + 0x10);
          fVar249 = *(float *)(*pauVar11 + 0x14);
          fVar252 = *(float *)(*pauVar11 + 0x18);
          auVar144 = *pauVar11;
          fVar268 = auVar39._0_4_;
          fVar342 = auVar39._4_4_;
          fVar192 = auVar39._8_4_;
          fVar193 = auVar39._12_4_;
          fVar194 = auVar39._16_4_;
          fVar269 = auVar39._20_4_;
          fVar325 = auVar39._24_4_;
          local_7e0 = auVar181._0_4_;
          auStack_7dc._0_4_ = auVar181._4_4_;
          auStack_7dc._4_4_ = auVar181._8_4_;
          fStack_7d4 = auVar181._12_4_;
          fStack_7d0 = auVar181._16_4_;
          fStack_7cc = auVar181._20_4_;
          fStack_7c8 = (float)*(undefined8 *)
                               ((undefined1 (*) [24])(bezier_basis1 + lVar154 * 4 + lVar152))[1];
          fVar261 = auVar159._0_4_;
          fVar262 = auVar159._4_4_;
          fVar263 = auVar159._8_4_;
          fVar265 = auVar159._12_4_;
          fVar266 = auVar159._16_4_;
          fVar267 = auVar159._20_4_;
          fVar341 = auVar159._24_4_;
          fVar251 = fVar229 + fVar229 + fVar250;
          auVar276._0_4_ =
               (float)local_340._0_4_ * (float)local_7e0 +
               fVar309 * fVar261 +
               fVar268 * (float)local_580._0_4_ + (float)local_3a0._0_4_ * fVar239;
          auVar276._4_4_ =
               (float)local_340._4_4_ * (float)auStack_7dc._0_4_ +
               fVar310 * fVar262 +
               fVar342 * (float)local_580._4_4_ + (float)local_3a0._4_4_ * fVar241;
          auVar276._8_4_ =
               fStack_338 * (float)auStack_7dc._4_4_ +
               fVar326 * fVar263 + fVar192 * fStack_578 + fStack_398 * fVar243;
          auVar276._12_4_ =
               fStack_334 * fStack_7d4 +
               fVar334 * fVar265 + fVar193 * fStack_574 + fStack_394 * fVar247;
          auVar276._16_4_ =
               fStack_330 * fStack_7d0 +
               fVar206 * fVar266 + fVar194 * fStack_570 + fStack_390 * fVar248;
          auVar276._20_4_ =
               fStack_32c * fStack_7cc +
               fVar204 * fVar267 + fVar269 * fStack_56c + fStack_38c * fVar249;
          auVar276._24_4_ =
               fStack_328 * fStack_7c8 +
               fVar220 * fVar341 + fVar325 * fStack_568 + fStack_388 * fVar252;
          auVar276._28_4_ = fVar229 + fStack_84 + fVar251;
          auVar259._0_4_ =
               (float)local_400._0_4_ * (float)local_7e0 +
               (float)local_480._0_4_ * fVar261 +
               (float)local_5a0._0_4_ * fVar268 + fVar239 * fVar222;
          auVar259._4_4_ =
               (float)local_400._4_4_ * (float)auStack_7dc._0_4_ +
               (float)local_480._4_4_ * fVar262 +
               (float)local_5a0._4_4_ * fVar342 + fVar241 * fVar359;
          auVar259._8_4_ =
               fStack_3f8 * (float)auStack_7dc._4_4_ +
               fStack_478 * fVar263 + fStack_598 * fVar192 + fVar243 * fVar224;
          auVar259._12_4_ =
               fStack_3f4 * fStack_7d4 +
               fStack_474 * fVar265 + fStack_594 * fVar193 + fVar247 * fVar264;
          auVar259._16_4_ =
               fStack_3f0 * fStack_7d0 +
               fStack_470 * fVar266 + fStack_590 * fVar194 + fVar248 * fVar226;
          auVar259._20_4_ =
               fStack_3ec * fStack_7cc +
               fStack_46c * fVar267 + fStack_58c * fVar269 + fVar249 * fVar227;
          auVar259._24_4_ =
               fStack_3e8 * fStack_7c8 +
               fStack_468 * fVar341 + fStack_588 * fVar325 + fVar252 * fVar228;
          auVar259._28_4_ = fVar251 + fVar229 + fVar229 + *(float *)pauVar9[1];
          auVar354._0_4_ =
               fVar261 * (float)local_180._0_4_ +
               (float)local_160._0_4_ * fVar268 + fVar239 * (float)local_a0._0_4_ +
               (float)local_7e0 * (float)local_c0._0_4_;
          auVar354._4_4_ =
               fVar262 * (float)local_180._4_4_ +
               (float)local_160._4_4_ * fVar342 + fVar241 * (float)local_a0._4_4_ +
               (float)auStack_7dc._0_4_ * (float)local_c0._4_4_;
          auVar354._8_4_ =
               fVar263 * fStack_178 + fStack_158 * fVar192 + fVar243 * fStack_98 +
               (float)auStack_7dc._4_4_ * fStack_b8;
          auVar354._12_4_ =
               fVar265 * fStack_174 + fStack_154 * fVar193 + fVar247 * fStack_94 +
               fStack_7d4 * fStack_b4;
          auVar354._16_4_ =
               fVar266 * fStack_170 + fStack_150 * fVar194 + fVar248 * fStack_90 +
               fStack_7d0 * fStack_b0;
          auVar354._20_4_ =
               fVar267 * fStack_16c + fStack_14c * fVar269 + fVar249 * fStack_8c +
               fStack_7cc * fStack_ac;
          auVar354._24_4_ =
               fVar341 * fStack_168 + fStack_148 * fVar325 + fVar252 * fStack_88 +
               fStack_7c8 * fStack_a8;
          auVar354._28_4_ = fVar229 + fVar229 + fStack_84 + fVar251;
          auVar41 = vsubps_avx(auVar276,auVar317);
          auVar42 = vsubps_avx(auVar259,local_760._0_32_);
          fVar229 = auVar41._0_4_;
          fVar239 = auVar41._4_4_;
          auVar90._4_4_ = fVar239 * local_760._4_4_;
          auVar90._0_4_ = fVar229 * local_760._0_4_;
          fVar241 = auVar41._8_4_;
          auVar90._8_4_ = fVar241 * local_760._8_4_;
          fVar243 = auVar41._12_4_;
          auVar90._12_4_ = fVar243 * local_760._12_4_;
          fVar247 = auVar41._16_4_;
          auVar90._16_4_ = fVar247 * local_760._16_4_;
          fVar248 = auVar41._20_4_;
          auVar90._20_4_ = fVar248 * local_760._20_4_;
          fVar249 = auVar41._24_4_;
          auVar90._24_4_ = fVar249 * local_760._24_4_;
          auVar90._28_4_ = fVar251;
          fVar222 = auVar42._0_4_;
          fVar359 = auVar42._4_4_;
          auVar91._4_4_ = auVar317._4_4_ * fVar359;
          auVar91._0_4_ = auVar317._0_4_ * fVar222;
          fVar224 = auVar42._8_4_;
          auVar91._8_4_ = auVar317._8_4_ * fVar224;
          fVar264 = auVar42._12_4_;
          auVar91._12_4_ = auVar317._12_4_ * fVar264;
          fVar226 = auVar42._16_4_;
          auVar91._16_4_ = auVar317._16_4_ * fVar226;
          fVar227 = auVar42._20_4_;
          auVar91._20_4_ = auVar317._20_4_ * fVar227;
          fVar228 = auVar42._24_4_;
          auVar91._24_4_ = auVar317._24_4_ * fVar228;
          auVar91._28_4_ = auVar259._28_4_;
          auVar43 = vsubps_avx(auVar90,auVar91);
          auVar136._4_4_ = fVar170;
          auVar136._0_4_ = fVar155;
          auVar136._8_4_ = fStack_7b8;
          auVar136._12_4_ = fStack_7b4;
          auVar136._16_4_ = fStack_7b0;
          auVar136._20_4_ = fStack_7ac;
          auVar136._24_4_ = fStack_7a8;
          auVar136._28_4_ = fStack_7a4;
          auVar40 = vmaxps_avx(auVar136,auVar354);
          auVar92._4_4_ = auVar40._4_4_ * auVar40._4_4_ * (fVar239 * fVar239 + fVar359 * fVar359);
          auVar92._0_4_ = auVar40._0_4_ * auVar40._0_4_ * (fVar229 * fVar229 + fVar222 * fVar222);
          auVar92._8_4_ = auVar40._8_4_ * auVar40._8_4_ * (fVar241 * fVar241 + fVar224 * fVar224);
          auVar92._12_4_ = auVar40._12_4_ * auVar40._12_4_ * (fVar243 * fVar243 + fVar264 * fVar264)
          ;
          auVar92._16_4_ = auVar40._16_4_ * auVar40._16_4_ * (fVar247 * fVar247 + fVar226 * fVar226)
          ;
          auVar92._20_4_ = auVar40._20_4_ * auVar40._20_4_ * (fVar248 * fVar248 + fVar227 * fVar227)
          ;
          auVar92._24_4_ = auVar40._24_4_ * auVar40._24_4_ * (fVar249 * fVar249 + fVar228 * fVar228)
          ;
          auVar92._28_4_ = auVar276._28_4_ + auVar259._28_4_;
          auVar93._4_4_ = auVar43._4_4_ * auVar43._4_4_;
          auVar93._0_4_ = auVar43._0_4_ * auVar43._0_4_;
          auVar93._8_4_ = auVar43._8_4_ * auVar43._8_4_;
          auVar93._12_4_ = auVar43._12_4_ * auVar43._12_4_;
          auVar93._16_4_ = auVar43._16_4_ * auVar43._16_4_;
          auVar93._20_4_ = auVar43._20_4_ * auVar43._20_4_;
          auVar93._24_4_ = auVar43._24_4_ * auVar43._24_4_;
          auVar93._28_4_ = auVar43._28_4_;
          auVar40 = vcmpps_avx(auVar93,auVar92,2);
          local_2a0 = (uint)lVar154;
          auVar196 = vpshufd_avx(ZEXT416(local_2a0),0);
          auVar373 = vpor_avx(auVar196,_DAT_01ff0cf0);
          auVar196 = vpor_avx(auVar196,_DAT_02020ea0);
          auVar373 = vpcmpgtd_avx(_local_520,auVar373);
          auVar196 = vpcmpgtd_avx(_local_520,auVar196);
          register0x000012d0 = auVar196;
          _local_420 = auVar373;
          auVar43 = _local_420 & auVar40;
          fVar222 = (float)local_600._0_4_;
          fVar359 = (float)local_600._4_4_;
          fVar224 = fStack_5f8;
          fVar264 = fStack_5f4;
          fVar226 = fStack_5f0;
          fVar227 = fStack_5ec;
          fVar228 = fStack_5e8;
          fVar229 = fStack_5e4;
          fVar239 = (float)local_480._0_4_;
          fVar241 = (float)local_480._4_4_;
          fVar243 = fStack_478;
          fVar247 = fStack_474;
          fVar248 = fStack_470;
          fVar249 = fStack_46c;
          fVar252 = fStack_468;
          if ((((((((auVar43 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar43 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar43 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar43 >> 0x7f,0) == '\0') &&
                (auVar43 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar43 >> 0xbf,0) == '\0') &&
              (auVar43 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar43[0x1f]) {
            auVar333 = ZEXT3264(_local_580);
          }
          else {
            local_5e0._0_4_ = auVar144._0_4_;
            local_5e0._4_4_ = auVar144._4_4_;
            fStack_5d8 = auVar144._8_4_;
            fStack_5d4 = auVar144._12_4_;
            fStack_5d0 = auVar144._16_4_;
            fStack_5cc = auVar144._20_4_;
            fStack_5c8 = auVar144._24_4_;
            local_5e0._0_4_ =
                 (float)local_7e0 * (float)local_560._0_4_ +
                 (float)local_320._0_4_ * fVar261 +
                 (float)local_e0._0_4_ * fVar268 + (float)local_540._0_4_ * (float)local_5e0._0_4_;
            local_5e0._4_4_ =
                 (float)auStack_7dc._0_4_ * (float)local_560._4_4_ +
                 (float)local_320._4_4_ * fVar262 +
                 (float)local_e0._4_4_ * fVar342 + (float)local_540._4_4_ * (float)local_5e0._4_4_;
            fStack_5d8 = (float)auStack_7dc._4_4_ * fStack_558 +
                         fStack_318 * fVar263 + fStack_d8 * fVar192 + fStack_538 * fStack_5d8;
            fStack_5d4 = fStack_7d4 * fStack_554 +
                         fStack_314 * fVar265 + fStack_d4 * fVar193 + fStack_534 * fStack_5d4;
            fStack_5d0 = fStack_7d0 * fStack_550 +
                         fStack_310 * fVar266 + fStack_d0 * fVar194 + fStack_530 * fStack_5d0;
            fStack_5cc = fStack_7cc * fStack_54c +
                         fStack_30c * fVar267 + fStack_cc * fVar269 + fStack_52c * fStack_5cc;
            fStack_5c8 = fStack_7c8 * fStack_548 +
                         fStack_308 * fVar341 + fStack_c8 * fVar325 + fStack_528 * fStack_5c8;
            fStack_5c4 = auVar317._28_4_ + auVar159._28_4_ + auVar39._28_4_ + 0.0;
            local_5c0._0_4_ = auVar142._0_4_;
            local_5c0._4_4_ = auVar142._4_4_;
            fStack_5b8 = auVar142._8_4_;
            fStack_5b4 = auVar142._12_4_;
            auStack_5b0._0_4_ = auVar142._16_4_;
            auStack_5b0._4_4_ = auVar142._20_4_;
            fStack_5a8 = auVar142._24_4_;
            local_6e0._0_4_ = auVar141._0_4_;
            local_6e0._4_4_ = auVar141._4_4_;
            uStack_6d8._0_4_ = auVar141._8_4_;
            uStack_6d8._4_4_ = auVar141._12_4_;
            auStack_6d0._0_4_ = auVar141._16_4_;
            auStack_6d0._4_4_ = auVar141._20_4_;
            fStack_6c8 = auVar141._24_4_;
            local_500._0_4_ = auVar140._0_4_;
            local_500._4_4_ = auVar140._4_4_;
            fStack_4f8 = auVar140._8_4_;
            fStack_4f4 = auVar140._12_4_;
            fStack_4f0 = auVar140._16_4_;
            fStack_4ec = auVar140._20_4_;
            fStack_4e8 = auVar140._24_4_;
            fVar270 = (float)local_540._0_4_ * (float)local_500._0_4_;
            fVar278 = (float)local_540._4_4_ * (float)local_500._4_4_;
            fVar279 = fStack_538 * fStack_4f8;
            fVar280 = fStack_534 * fStack_4f4;
            fVar281 = fStack_530 * fStack_4f0;
            fVar282 = fStack_52c * fStack_4ec;
            fVar283 = fStack_528 * fStack_4e8;
            pfVar1 = (float *)(lVar152 + 0x2228dfc + lVar154 * 4);
            fVar261 = *pfVar1;
            fVar262 = pfVar1[1];
            fVar263 = pfVar1[2];
            fVar265 = pfVar1[3];
            fVar266 = pfVar1[4];
            fVar267 = pfVar1[5];
            fVar341 = pfVar1[6];
            pfVar2 = (float *)(lVar152 + 0x2229280 + lVar154 * 4);
            fVar268 = *pfVar2;
            fVar342 = pfVar2[1];
            fVar192 = pfVar2[2];
            fVar193 = pfVar2[3];
            fVar194 = pfVar2[4];
            fVar269 = pfVar2[5];
            fVar325 = pfVar2[6];
            _local_500 = auVar42;
            pfVar3 = (float *)(lVar152 + 0x2228978 + lVar154 * 4);
            fVar251 = *pfVar3;
            fVar171 = pfVar3[1];
            fVar172 = pfVar3[2];
            fVar173 = pfVar3[3];
            fVar174 = pfVar3[4];
            fVar207 = pfVar3[5];
            fVar221 = pfVar3[6];
            fVar250 = pfVar1[7] + pfVar2[7];
            fStack_3a4 = pfVar2[7] + fVar225 + 0.0;
            fVar284 = fVar225 + fStack_324 + fVar225 + 0.0;
            pfVar1 = (float *)(lVar152 + 0x22284f4 + lVar154 * 4);
            fVar225 = *pfVar1;
            fVar223 = pfVar1[1];
            fVar175 = pfVar1[2];
            fVar176 = pfVar1[3];
            fVar190 = pfVar1[4];
            fVar191 = pfVar1[5];
            fVar205 = pfVar1[6];
            local_440 = (float)local_340._0_4_ * fVar225 +
                        fVar251 * fVar309 +
                        (float)local_580._0_4_ * fVar261 + (float)local_3a0._0_4_ * fVar268;
            fStack_43c = (float)local_340._4_4_ * fVar223 +
                         fVar171 * fVar310 +
                         (float)local_580._4_4_ * fVar262 + (float)local_3a0._4_4_ * fVar342;
            fStack_438 = fStack_338 * fVar175 +
                         fVar172 * fVar326 + fStack_578 * fVar263 + fStack_398 * fVar192;
            fStack_434 = fStack_334 * fVar176 +
                         fVar173 * fVar334 + fStack_574 * fVar265 + fStack_394 * fVar193;
            fStack_430 = fStack_330 * fVar190 +
                         fVar174 * fVar206 + fStack_570 * fVar266 + fStack_390 * fVar194;
            fStack_42c = fStack_32c * fVar191 +
                         fVar207 * fVar204 + fStack_56c * fVar267 + fStack_38c * fVar269;
            fStack_428 = fStack_328 * fVar205 +
                         fVar221 * fVar220 + fStack_568 * fVar341 + fStack_388 * fVar325;
            fStack_424 = fVar250 + fStack_3a4;
            local_3c0 = fVar225 * (float)local_400._0_4_ +
                        fVar261 * (float)local_5a0._0_4_ + (float)local_600._0_4_ * fVar268 +
                        (float)local_480._0_4_ * fVar251;
            fStack_3bc = fVar223 * (float)local_400._4_4_ +
                         fVar262 * (float)local_5a0._4_4_ + (float)local_600._4_4_ * fVar342 +
                         (float)local_480._4_4_ * fVar171;
            fStack_3b8 = fVar175 * fStack_3f8 +
                         fVar263 * fStack_598 + fStack_5f8 * fVar192 + fStack_478 * fVar172;
            fStack_3b4 = fVar176 * fStack_3f4 +
                         fVar265 * fStack_594 + fStack_5f4 * fVar193 + fStack_474 * fVar173;
            fStack_3b0 = fVar190 * fStack_3f0 +
                         fVar266 * fStack_590 + fStack_5f0 * fVar194 + fStack_470 * fVar174;
            fStack_3ac = fVar191 * fStack_3ec +
                         fVar267 * fStack_58c + fStack_5ec * fVar269 + fStack_46c * fVar207;
            fStack_3a8 = fVar205 * fStack_3e8 +
                         fVar341 * fStack_588 + fStack_5e8 * fVar325 + fStack_468 * fVar221;
            fStack_3a4 = fStack_3a4 + fVar284;
            auVar355._0_4_ =
                 fVar251 * (float)local_320._0_4_ +
                 (float)local_e0._0_4_ * fVar261 + (float)local_540._0_4_ * fVar268 +
                 fVar225 * (float)local_560._0_4_;
            auVar355._4_4_ =
                 fVar171 * (float)local_320._4_4_ +
                 (float)local_e0._4_4_ * fVar262 + (float)local_540._4_4_ * fVar342 +
                 fVar223 * (float)local_560._4_4_;
            auVar355._8_4_ =
                 fVar172 * fStack_318 + fStack_d8 * fVar263 + fStack_538 * fVar192 +
                 fVar175 * fStack_558;
            auVar355._12_4_ =
                 fVar173 * fStack_314 + fStack_d4 * fVar265 + fStack_534 * fVar193 +
                 fVar176 * fStack_554;
            auVar355._16_4_ =
                 fVar174 * fStack_310 + fStack_d0 * fVar266 + fStack_530 * fVar194 +
                 fVar190 * fStack_550;
            auVar355._20_4_ =
                 fVar207 * fStack_30c + fStack_cc * fVar267 + fStack_52c * fVar269 +
                 fVar191 * fStack_54c;
            auVar355._24_4_ =
                 fVar221 * fStack_308 + fStack_c8 * fVar341 + fStack_528 * fVar325 +
                 fVar205 * fStack_548;
            auVar355._28_4_ = pfVar3[7] + fVar250 + fVar284;
            pfVar1 = (float *)(lVar152 + 0x222b21c + lVar154 * 4);
            fVar225 = *pfVar1;
            fVar261 = pfVar1[1];
            fVar262 = pfVar1[2];
            fVar263 = pfVar1[3];
            fVar265 = pfVar1[4];
            fVar266 = pfVar1[5];
            fVar267 = pfVar1[6];
            pfVar2 = (float *)(lVar152 + 0x222b6a0 + lVar154 * 4);
            fVar341 = *pfVar2;
            fVar268 = pfVar2[1];
            fVar342 = pfVar2[2];
            fVar192 = pfVar2[3];
            fVar193 = pfVar2[4];
            fVar194 = pfVar2[5];
            fVar269 = pfVar2[6];
            pfVar3 = (float *)(lVar152 + 0x222ad98 + lVar154 * 4);
            fVar325 = *pfVar3;
            fVar251 = pfVar3[1];
            fVar171 = pfVar3[2];
            fVar172 = pfVar3[3];
            fVar173 = pfVar3[4];
            fVar174 = pfVar3[5];
            fVar207 = pfVar3[6];
            pfVar4 = (float *)(lVar152 + 0x222a914 + lVar154 * 4);
            fVar221 = *pfVar4;
            fVar223 = pfVar4[1];
            fVar175 = pfVar4[2];
            fVar176 = pfVar4[3];
            fVar190 = pfVar4[4];
            fVar191 = pfVar4[5];
            fVar205 = pfVar4[6];
            auVar318._0_4_ =
                 fVar221 * (float)local_340._0_4_ +
                 fVar325 * fVar309 +
                 (float)local_580._0_4_ * fVar225 + (float)local_3a0._0_4_ * fVar341;
            auVar318._4_4_ =
                 fVar223 * (float)local_340._4_4_ +
                 fVar251 * fVar310 +
                 (float)local_580._4_4_ * fVar261 + (float)local_3a0._4_4_ * fVar268;
            auVar318._8_4_ =
                 fVar175 * fStack_338 +
                 fVar171 * fVar326 + fStack_578 * fVar262 + fStack_398 * fVar342;
            auVar318._12_4_ =
                 fVar176 * fStack_334 +
                 fVar172 * fVar334 + fStack_574 * fVar263 + fStack_394 * fVar192;
            auVar318._16_4_ =
                 fVar190 * fStack_330 +
                 fVar173 * fVar206 + fStack_570 * fVar265 + fStack_390 * fVar193;
            auVar318._20_4_ =
                 fVar191 * fStack_32c +
                 fVar174 * fVar204 + fStack_56c * fVar266 + fStack_38c * fVar194;
            auVar318._24_4_ =
                 fVar205 * fStack_328 +
                 fVar207 * fVar220 + fStack_568 * fVar267 + fStack_388 * fVar269;
            auVar318._28_4_ = fStack_464 + fStack_464 + fStack_384 + fStack_464;
            auVar349._0_4_ =
                 fVar221 * (float)local_400._0_4_ +
                 fVar325 * (float)local_480._0_4_ +
                 fVar225 * (float)local_5a0._0_4_ + (float)local_600._0_4_ * fVar341;
            auVar349._4_4_ =
                 fVar223 * (float)local_400._4_4_ +
                 fVar251 * (float)local_480._4_4_ +
                 fVar261 * (float)local_5a0._4_4_ + (float)local_600._4_4_ * fVar268;
            auVar349._8_4_ =
                 fVar175 * fStack_3f8 +
                 fVar171 * fStack_478 + fVar262 * fStack_598 + fStack_5f8 * fVar342;
            auVar349._12_4_ =
                 fVar176 * fStack_3f4 +
                 fVar172 * fStack_474 + fVar263 * fStack_594 + fStack_5f4 * fVar192;
            auVar349._16_4_ =
                 fVar190 * fStack_3f0 +
                 fVar173 * fStack_470 + fVar265 * fStack_590 + fStack_5f0 * fVar193;
            auVar349._20_4_ =
                 fVar191 * fStack_3ec +
                 fVar174 * fStack_46c + fVar266 * fStack_58c + fStack_5ec * fVar194;
            auVar349._24_4_ =
                 fVar205 * fStack_3e8 +
                 fVar207 * fStack_468 + fVar267 * fStack_588 + fStack_5e8 * fVar269;
            auVar349._28_4_ = fStack_464 + fStack_464 + fStack_324 + fStack_464;
            auVar260._8_4_ = 0x7fffffff;
            auVar260._0_8_ = 0x7fffffff7fffffff;
            auVar260._12_4_ = 0x7fffffff;
            auVar260._16_4_ = 0x7fffffff;
            auVar260._20_4_ = 0x7fffffff;
            auVar260._24_4_ = 0x7fffffff;
            auVar260._28_4_ = 0x7fffffff;
            auVar138._4_4_ = fStack_43c;
            auVar138._0_4_ = local_440;
            auVar138._8_4_ = fStack_438;
            auVar138._12_4_ = fStack_434;
            auVar138._16_4_ = fStack_430;
            auVar138._20_4_ = fStack_42c;
            auVar138._24_4_ = fStack_428;
            auVar138._28_4_ = fStack_424;
            auVar159 = vandps_avx(auVar138,auVar260);
            auVar139._4_4_ = fStack_3bc;
            auVar139._0_4_ = local_3c0;
            auVar139._8_4_ = fStack_3b8;
            auVar139._12_4_ = fStack_3b4;
            auVar139._16_4_ = fStack_3b0;
            auVar139._20_4_ = fStack_3ac;
            auVar139._24_4_ = fStack_3a8;
            auVar139._28_4_ = fStack_3a4;
            auVar43 = vandps_avx(auVar139,auVar260);
            auVar43 = vmaxps_avx(auVar159,auVar43);
            auVar159 = vandps_avx(auVar355,auVar260);
            auVar43 = vmaxps_avx(auVar43,auVar159);
            auVar43 = vcmpps_avx(auVar43,local_100,1);
            auVar44 = vblendvps_avx(auVar138,auVar41,auVar43);
            auVar166._0_4_ =
                 fVar221 * (float)local_560._0_4_ +
                 fVar325 * (float)local_320._0_4_ +
                 fVar341 * (float)local_540._0_4_ + (float)local_e0._0_4_ * fVar225;
            auVar166._4_4_ =
                 fVar223 * (float)local_560._4_4_ +
                 fVar251 * (float)local_320._4_4_ +
                 fVar268 * (float)local_540._4_4_ + (float)local_e0._4_4_ * fVar261;
            auVar166._8_4_ =
                 fVar175 * fStack_558 +
                 fVar171 * fStack_318 + fVar342 * fStack_538 + fStack_d8 * fVar262;
            auVar166._12_4_ =
                 fVar176 * fStack_554 +
                 fVar172 * fStack_314 + fVar192 * fStack_534 + fStack_d4 * fVar263;
            auVar166._16_4_ =
                 fVar190 * fStack_550 +
                 fVar173 * fStack_310 + fVar193 * fStack_530 + fStack_d0 * fVar265;
            auVar166._20_4_ =
                 fVar191 * fStack_54c +
                 fVar174 * fStack_30c + fVar194 * fStack_52c + fStack_cc * fVar266;
            auVar166._24_4_ =
                 fVar205 * fStack_548 +
                 fVar207 * fStack_308 + fVar269 * fStack_528 + fStack_c8 * fVar267;
            auVar166._28_4_ = auVar159._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
            auVar45 = vblendvps_avx(auVar139,auVar42,auVar43);
            auVar159 = vandps_avx(auVar318,auVar260);
            auVar43 = vandps_avx(auVar349,auVar260);
            auVar46 = vmaxps_avx(auVar159,auVar43);
            auVar159 = vandps_avx(auVar166,auVar260);
            auVar159 = vmaxps_avx(auVar46,auVar159);
            local_6c0._0_4_ = auVar143._0_4_;
            local_6c0._4_4_ = auVar143._4_4_;
            uStack_6b8._0_4_ = auVar143._8_4_;
            uStack_6b8._4_4_ = auVar143._12_4_;
            auStack_6b0._0_4_ = auVar143._16_4_;
            auStack_6b0._4_4_ = auVar143._20_4_;
            fStack_6a8 = auVar143._24_4_;
            auVar43 = vcmpps_avx(auVar159,local_100,1);
            auVar159 = vblendvps_avx(auVar318,auVar41,auVar43);
            auVar167._0_4_ =
                 (float)local_560._0_4_ * (float)local_6c0._0_4_ +
                 (float)local_320._0_4_ * (float)local_5c0._0_4_ +
                 (float)local_e0._0_4_ * (float)local_6e0._0_4_ + fVar270;
            auVar167._4_4_ =
                 (float)local_560._4_4_ * (float)local_6c0._4_4_ +
                 (float)local_320._4_4_ * (float)local_5c0._4_4_ +
                 (float)local_e0._4_4_ * (float)local_6e0._4_4_ + fVar278;
            auVar167._8_4_ =
                 fStack_558 * (float)uStack_6b8 +
                 fStack_318 * fStack_5b8 + fStack_d8 * (float)uStack_6d8 + fVar279;
            auVar167._12_4_ =
                 fStack_554 * uStack_6b8._4_4_ +
                 fStack_314 * fStack_5b4 + fStack_d4 * uStack_6d8._4_4_ + fVar280;
            auVar167._16_4_ =
                 fStack_550 * (float)auStack_6b0._0_4_ +
                 fStack_310 * (float)auStack_5b0._0_4_ +
                 fStack_d0 * (float)auStack_6d0._0_4_ + fVar281;
            auVar167._20_4_ =
                 fStack_54c * (float)auStack_6b0._4_4_ +
                 fStack_30c * (float)auStack_5b0._4_4_ +
                 fStack_cc * (float)auStack_6d0._4_4_ + fVar282;
            auVar167._24_4_ =
                 fStack_548 * fStack_6a8 +
                 fStack_308 * fStack_5a8 + fStack_c8 * fStack_6c8 + fVar283;
            auVar167._28_4_ = auVar46._28_4_ + fStack_5c4 + auVar39._28_4_ + 0.0;
            auVar39 = vblendvps_avx(auVar349,auVar42,auVar43);
            fVar250 = auVar44._0_4_;
            fVar270 = auVar44._4_4_;
            fVar278 = auVar44._8_4_;
            fVar279 = auVar44._12_4_;
            fVar280 = auVar44._16_4_;
            fVar281 = auVar44._20_4_;
            fVar282 = auVar44._24_4_;
            fVar283 = auVar44._28_4_;
            fVar193 = auVar159._0_4_;
            fVar269 = auVar159._4_4_;
            fVar251 = auVar159._8_4_;
            fVar172 = auVar159._12_4_;
            fVar174 = auVar159._16_4_;
            fVar221 = auVar159._20_4_;
            fVar309 = auVar159._24_4_;
            fVar206 = auVar45._0_4_;
            fVar220 = auVar45._4_4_;
            fVar261 = auVar45._8_4_;
            fVar263 = auVar45._12_4_;
            fVar266 = auVar45._16_4_;
            fVar341 = auVar45._20_4_;
            fVar342 = auVar45._24_4_;
            auVar332._0_4_ = fVar206 * fVar206 + fVar250 * fVar250;
            auVar332._4_4_ = fVar220 * fVar220 + fVar270 * fVar270;
            auVar332._8_4_ = fVar261 * fVar261 + fVar278 * fVar278;
            auVar332._12_4_ = fVar263 * fVar263 + fVar279 * fVar279;
            auVar332._16_4_ = fVar266 * fVar266 + fVar280 * fVar280;
            auVar332._20_4_ = fVar341 * fVar341 + fVar281 * fVar281;
            auVar332._24_4_ = fVar342 * fVar342 + fVar282 * fVar282;
            auVar332._28_4_ = auVar41._28_4_ + auVar42._28_4_;
            auVar41 = vrsqrtps_avx(auVar332);
            fVar204 = auVar41._0_4_;
            fVar225 = auVar41._4_4_;
            auVar94._4_4_ = fVar225 * 1.5;
            auVar94._0_4_ = fVar204 * 1.5;
            fVar262 = auVar41._8_4_;
            auVar94._8_4_ = fVar262 * 1.5;
            fVar265 = auVar41._12_4_;
            auVar94._12_4_ = fVar265 * 1.5;
            fVar267 = auVar41._16_4_;
            auVar94._16_4_ = fVar267 * 1.5;
            fVar268 = auVar41._20_4_;
            auVar94._20_4_ = fVar268 * 1.5;
            fVar192 = auVar41._24_4_;
            auVar94._24_4_ = fVar192 * 1.5;
            auVar94._28_4_ = auVar349._28_4_;
            auVar95._4_4_ = fVar225 * fVar225 * fVar225 * auVar332._4_4_ * 0.5;
            auVar95._0_4_ = fVar204 * fVar204 * fVar204 * auVar332._0_4_ * 0.5;
            auVar95._8_4_ = fVar262 * fVar262 * fVar262 * auVar332._8_4_ * 0.5;
            auVar95._12_4_ = fVar265 * fVar265 * fVar265 * auVar332._12_4_ * 0.5;
            auVar95._16_4_ = fVar267 * fVar267 * fVar267 * auVar332._16_4_ * 0.5;
            auVar95._20_4_ = fVar268 * fVar268 * fVar268 * auVar332._20_4_ * 0.5;
            auVar95._24_4_ = fVar192 * fVar192 * fVar192 * auVar332._24_4_ * 0.5;
            auVar95._28_4_ = auVar332._28_4_;
            auVar42 = vsubps_avx(auVar94,auVar95);
            fVar326 = auVar42._0_4_;
            fVar334 = auVar42._4_4_;
            fVar175 = auVar42._8_4_;
            fVar176 = auVar42._12_4_;
            fVar190 = auVar42._16_4_;
            fVar191 = auVar42._20_4_;
            fVar205 = auVar42._24_4_;
            fVar204 = auVar39._0_4_;
            fVar225 = auVar39._4_4_;
            fVar262 = auVar39._8_4_;
            fVar265 = auVar39._12_4_;
            fVar267 = auVar39._16_4_;
            fVar268 = auVar39._20_4_;
            fVar192 = auVar39._24_4_;
            auVar305._0_4_ = fVar204 * fVar204 + fVar193 * fVar193;
            auVar305._4_4_ = fVar225 * fVar225 + fVar269 * fVar269;
            auVar305._8_4_ = fVar262 * fVar262 + fVar251 * fVar251;
            auVar305._12_4_ = fVar265 * fVar265 + fVar172 * fVar172;
            auVar305._16_4_ = fVar267 * fVar267 + fVar174 * fVar174;
            auVar305._20_4_ = fVar268 * fVar268 + fVar221 * fVar221;
            auVar305._24_4_ = fVar192 * fVar192 + fVar309 * fVar309;
            auVar305._28_4_ = auVar41._28_4_ + auVar159._28_4_;
            auVar159 = vrsqrtps_avx(auVar305);
            fVar194 = auVar159._0_4_;
            fVar325 = auVar159._4_4_;
            auVar96._4_4_ = fVar325 * 1.5;
            auVar96._0_4_ = fVar194 * 1.5;
            fVar171 = auVar159._8_4_;
            auVar96._8_4_ = fVar171 * 1.5;
            fVar173 = auVar159._12_4_;
            auVar96._12_4_ = fVar173 * 1.5;
            fVar207 = auVar159._16_4_;
            auVar96._16_4_ = fVar207 * 1.5;
            fVar223 = auVar159._20_4_;
            auVar96._20_4_ = fVar223 * 1.5;
            fVar310 = auVar159._24_4_;
            auVar96._24_4_ = fVar310 * 1.5;
            auVar96._28_4_ = auVar349._28_4_;
            auVar97._4_4_ = fVar325 * fVar325 * fVar325 * auVar305._4_4_ * 0.5;
            auVar97._0_4_ = fVar194 * fVar194 * fVar194 * auVar305._0_4_ * 0.5;
            auVar97._8_4_ = fVar171 * fVar171 * fVar171 * auVar305._8_4_ * 0.5;
            auVar97._12_4_ = fVar173 * fVar173 * fVar173 * auVar305._12_4_ * 0.5;
            auVar97._16_4_ = fVar207 * fVar207 * fVar207 * auVar305._16_4_ * 0.5;
            auVar97._20_4_ = fVar223 * fVar223 * fVar223 * auVar305._20_4_ * 0.5;
            auVar97._24_4_ = fVar310 * fVar310 * fVar310 * auVar305._24_4_ * 0.5;
            auVar97._28_4_ = auVar305._28_4_;
            auVar39 = vsubps_avx(auVar96,auVar97);
            fVar194 = auVar39._0_4_;
            fVar325 = auVar39._4_4_;
            fVar171 = auVar39._8_4_;
            fVar173 = auVar39._12_4_;
            fVar207 = auVar39._16_4_;
            fVar223 = auVar39._20_4_;
            fVar310 = auVar39._24_4_;
            fVar206 = fVar155 * fVar326 * fVar206;
            fVar220 = fVar170 * fVar334 * fVar220;
            auVar98._4_4_ = fVar220;
            auVar98._0_4_ = fVar206;
            fVar261 = fStack_7b8 * fVar175 * fVar261;
            auVar98._8_4_ = fVar261;
            fVar263 = fStack_7b4 * fVar176 * fVar263;
            auVar98._12_4_ = fVar263;
            fVar266 = fStack_7b0 * fVar190 * fVar266;
            auVar98._16_4_ = fVar266;
            fVar341 = fStack_7ac * fVar191 * fVar341;
            auVar98._20_4_ = fVar341;
            fVar342 = fStack_7a8 * fVar205 * fVar342;
            auVar98._24_4_ = fVar342;
            auVar98._28_4_ = auVar159._28_4_;
            local_6c0._4_4_ = fVar220 + auVar317._4_4_;
            local_6c0._0_4_ = fVar206 + auVar317._0_4_;
            uStack_6b8._0_4_ = fVar261 + auVar317._8_4_;
            uStack_6b8._4_4_ = fVar263 + auVar317._12_4_;
            auStack_6b0._0_4_ = fVar266 + auVar317._16_4_;
            auStack_6b0._4_4_ = fVar341 + auVar317._20_4_;
            fStack_6a8 = fVar342 + auVar317._24_4_;
            fStack_6a4 = auVar159._28_4_ + auVar317._28_4_;
            fVar206 = fVar155 * fVar326 * -fVar250;
            fVar220 = fVar170 * fVar334 * -fVar270;
            auVar99._4_4_ = fVar220;
            auVar99._0_4_ = fVar206;
            fVar261 = fStack_7b8 * fVar175 * -fVar278;
            auVar99._8_4_ = fVar261;
            fVar263 = fStack_7b4 * fVar176 * -fVar279;
            auVar99._12_4_ = fVar263;
            fVar266 = fStack_7b0 * fVar190 * -fVar280;
            auVar99._16_4_ = fVar266;
            fVar341 = fStack_7ac * fVar191 * -fVar281;
            auVar99._20_4_ = fVar341;
            fVar342 = fStack_7a8 * fVar205 * -fVar282;
            auVar99._24_4_ = fVar342;
            auVar99._28_4_ = -fVar283;
            local_6e0._4_4_ = local_760._4_4_ + fVar220;
            local_6e0._0_4_ = local_760._0_4_ + fVar206;
            uStack_6d8._0_4_ = local_760._8_4_ + fVar261;
            uStack_6d8._4_4_ = local_760._12_4_ + fVar263;
            auStack_6d0._0_4_ = local_760._16_4_ + fVar266;
            auStack_6d0._4_4_ = local_760._20_4_ + fVar341;
            fStack_6c8 = local_760._24_4_ + fVar342;
            fStack_6c4 = local_760._28_4_ + -fVar283;
            fVar206 = fVar326 * 0.0 * fVar155;
            fVar220 = fVar334 * 0.0 * fVar170;
            auVar100._4_4_ = fVar220;
            auVar100._0_4_ = fVar206;
            fVar261 = fVar175 * 0.0 * fStack_7b8;
            auVar100._8_4_ = fVar261;
            fVar263 = fVar176 * 0.0 * fStack_7b4;
            auVar100._12_4_ = fVar263;
            fVar266 = fVar190 * 0.0 * fStack_7b0;
            auVar100._16_4_ = fVar266;
            fVar341 = fVar191 * 0.0 * fStack_7ac;
            auVar100._20_4_ = fVar341;
            fVar342 = fVar205 * 0.0 * fStack_7a8;
            auVar100._24_4_ = fVar342;
            auVar100._28_4_ = fVar283;
            auVar45 = vsubps_avx(auVar317,auVar98);
            auVar372._0_4_ = fVar206 + auVar167._0_4_;
            auVar372._4_4_ = fVar220 + auVar167._4_4_;
            auVar372._8_4_ = fVar261 + auVar167._8_4_;
            auVar372._12_4_ = fVar263 + auVar167._12_4_;
            auVar372._16_4_ = fVar266 + auVar167._16_4_;
            auVar372._20_4_ = fVar341 + auVar167._20_4_;
            auVar372._24_4_ = fVar342 + auVar167._24_4_;
            auVar372._28_4_ = fVar283 + auVar167._28_4_;
            fVar206 = auVar354._0_4_ * fVar194 * fVar204;
            fVar204 = auVar354._4_4_ * fVar325 * fVar225;
            auVar101._4_4_ = fVar204;
            auVar101._0_4_ = fVar206;
            fVar220 = auVar354._8_4_ * fVar171 * fVar262;
            auVar101._8_4_ = fVar220;
            fVar225 = auVar354._12_4_ * fVar173 * fVar265;
            auVar101._12_4_ = fVar225;
            fVar261 = auVar354._16_4_ * fVar207 * fVar267;
            auVar101._16_4_ = fVar261;
            fVar262 = auVar354._20_4_ * fVar223 * fVar268;
            auVar101._20_4_ = fVar262;
            fVar263 = auVar354._24_4_ * fVar310 * fVar192;
            auVar101._24_4_ = fVar263;
            auVar101._28_4_ = fStack_7a4;
            auVar160 = vsubps_avx(local_760._0_32_,auVar99);
            auVar356._0_4_ = auVar276._0_4_ + fVar206;
            auVar356._4_4_ = auVar276._4_4_ + fVar204;
            auVar356._8_4_ = auVar276._8_4_ + fVar220;
            auVar356._12_4_ = auVar276._12_4_ + fVar225;
            auVar356._16_4_ = auVar276._16_4_ + fVar261;
            auVar356._20_4_ = auVar276._20_4_ + fVar262;
            auVar356._24_4_ = auVar276._24_4_ + fVar263;
            auVar356._28_4_ = auVar276._28_4_ + fStack_7a4;
            fVar206 = fVar194 * -fVar193 * auVar354._0_4_;
            fVar204 = fVar325 * -fVar269 * auVar354._4_4_;
            auVar102._4_4_ = fVar204;
            auVar102._0_4_ = fVar206;
            fVar220 = fVar171 * -fVar251 * auVar354._8_4_;
            auVar102._8_4_ = fVar220;
            fVar225 = fVar173 * -fVar172 * auVar354._12_4_;
            auVar102._12_4_ = fVar225;
            fVar261 = fVar207 * -fVar174 * auVar354._16_4_;
            auVar102._16_4_ = fVar261;
            fVar262 = fVar223 * -fVar221 * auVar354._20_4_;
            auVar102._20_4_ = fVar262;
            fVar263 = fVar310 * -fVar309 * auVar354._24_4_;
            auVar102._24_4_ = fVar263;
            auVar102._28_4_ = auVar317._28_4_;
            auVar161 = vsubps_avx(auVar167,auVar100);
            auVar237._0_4_ = auVar259._0_4_ + fVar206;
            auVar237._4_4_ = auVar259._4_4_ + fVar204;
            auVar237._8_4_ = auVar259._8_4_ + fVar220;
            auVar237._12_4_ = auVar259._12_4_ + fVar225;
            auVar237._16_4_ = auVar259._16_4_ + fVar261;
            auVar237._20_4_ = auVar259._20_4_ + fVar262;
            auVar237._24_4_ = auVar259._24_4_ + fVar263;
            auVar237._28_4_ = auVar259._28_4_ + auVar317._28_4_;
            fVar206 = fVar194 * 0.0 * auVar354._0_4_;
            fVar204 = fVar325 * 0.0 * auVar354._4_4_;
            auVar103._4_4_ = fVar204;
            auVar103._0_4_ = fVar206;
            fVar220 = fVar171 * 0.0 * auVar354._8_4_;
            auVar103._8_4_ = fVar220;
            fVar225 = fVar173 * 0.0 * auVar354._12_4_;
            auVar103._12_4_ = fVar225;
            fVar261 = fVar207 * 0.0 * auVar354._16_4_;
            auVar103._16_4_ = fVar261;
            fVar262 = fVar223 * 0.0 * auVar354._20_4_;
            auVar103._20_4_ = fVar262;
            fVar263 = fVar310 * 0.0 * auVar354._24_4_;
            auVar103._24_4_ = fVar263;
            auVar103._28_4_ = auVar167._28_4_;
            auVar159 = vsubps_avx(auVar276,auVar101);
            auVar319._0_4_ = (float)local_5e0._0_4_ + fVar206;
            auVar319._4_4_ = (float)local_5e0._4_4_ + fVar204;
            auVar319._8_4_ = fStack_5d8 + fVar220;
            auVar319._12_4_ = fStack_5d4 + fVar225;
            auVar319._16_4_ = fStack_5d0 + fVar261;
            auVar319._20_4_ = fStack_5cc + fVar262;
            auVar319._24_4_ = fStack_5c8 + fVar263;
            auVar319._28_4_ = fStack_5c4 + auVar167._28_4_;
            auVar41 = vsubps_avx(auVar259,auVar102);
            auVar42 = vsubps_avx(_local_5e0,auVar103);
            auVar43 = vsubps_avx(auVar237,auVar160);
            auVar44 = vsubps_avx(auVar319,auVar161);
            auVar104._4_4_ = auVar161._4_4_ * auVar43._4_4_;
            auVar104._0_4_ = auVar161._0_4_ * auVar43._0_4_;
            auVar104._8_4_ = auVar161._8_4_ * auVar43._8_4_;
            auVar104._12_4_ = auVar161._12_4_ * auVar43._12_4_;
            auVar104._16_4_ = auVar161._16_4_ * auVar43._16_4_;
            auVar104._20_4_ = auVar161._20_4_ * auVar43._20_4_;
            auVar104._24_4_ = auVar161._24_4_ * auVar43._24_4_;
            auVar104._28_4_ = auVar349._28_4_;
            auVar105._4_4_ = auVar160._4_4_ * auVar44._4_4_;
            auVar105._0_4_ = auVar160._0_4_ * auVar44._0_4_;
            auVar105._8_4_ = auVar160._8_4_ * auVar44._8_4_;
            auVar105._12_4_ = auVar160._12_4_ * auVar44._12_4_;
            auVar105._16_4_ = auVar160._16_4_ * auVar44._16_4_;
            auVar105._20_4_ = auVar160._20_4_ * auVar44._20_4_;
            auVar105._24_4_ = auVar160._24_4_ * auVar44._24_4_;
            auVar105._28_4_ = fStack_5c4;
            auVar46 = vsubps_avx(auVar105,auVar104);
            auVar106._4_4_ = auVar45._4_4_ * auVar44._4_4_;
            auVar106._0_4_ = auVar45._0_4_ * auVar44._0_4_;
            auVar106._8_4_ = auVar45._8_4_ * auVar44._8_4_;
            auVar106._12_4_ = auVar45._12_4_ * auVar44._12_4_;
            auVar106._16_4_ = auVar45._16_4_ * auVar44._16_4_;
            auVar106._20_4_ = auVar45._20_4_ * auVar44._20_4_;
            auVar106._24_4_ = auVar45._24_4_ * auVar44._24_4_;
            auVar106._28_4_ = auVar44._28_4_;
            auVar44 = vsubps_avx(auVar356,auVar45);
            auVar107._4_4_ = auVar161._4_4_ * auVar44._4_4_;
            auVar107._0_4_ = auVar161._0_4_ * auVar44._0_4_;
            auVar107._8_4_ = auVar161._8_4_ * auVar44._8_4_;
            auVar107._12_4_ = auVar161._12_4_ * auVar44._12_4_;
            auVar107._16_4_ = auVar161._16_4_ * auVar44._16_4_;
            auVar107._20_4_ = auVar161._20_4_ * auVar44._20_4_;
            auVar107._24_4_ = auVar161._24_4_ * auVar44._24_4_;
            auVar107._28_4_ = auVar39._28_4_;
            auVar48 = vsubps_avx(auVar107,auVar106);
            auVar108._4_4_ = auVar160._4_4_ * auVar44._4_4_;
            auVar108._0_4_ = auVar160._0_4_ * auVar44._0_4_;
            auVar108._8_4_ = auVar160._8_4_ * auVar44._8_4_;
            auVar108._12_4_ = auVar160._12_4_ * auVar44._12_4_;
            auVar108._16_4_ = auVar160._16_4_ * auVar44._16_4_;
            auVar108._20_4_ = auVar160._20_4_ * auVar44._20_4_;
            auVar108._24_4_ = auVar160._24_4_ * auVar44._24_4_;
            auVar108._28_4_ = auVar39._28_4_;
            auVar109._4_4_ = auVar45._4_4_ * auVar43._4_4_;
            auVar109._0_4_ = auVar45._0_4_ * auVar43._0_4_;
            auVar109._8_4_ = auVar45._8_4_ * auVar43._8_4_;
            auVar109._12_4_ = auVar45._12_4_ * auVar43._12_4_;
            auVar109._16_4_ = auVar45._16_4_ * auVar43._16_4_;
            auVar109._20_4_ = auVar45._20_4_ * auVar43._20_4_;
            auVar109._24_4_ = auVar45._24_4_ * auVar43._24_4_;
            auVar109._28_4_ = auVar43._28_4_;
            auVar39 = vsubps_avx(auVar109,auVar108);
            auVar187._0_4_ = auVar46._0_4_ * 0.0 + auVar39._0_4_ + auVar48._0_4_ * 0.0;
            auVar187._4_4_ = auVar46._4_4_ * 0.0 + auVar39._4_4_ + auVar48._4_4_ * 0.0;
            auVar187._8_4_ = auVar46._8_4_ * 0.0 + auVar39._8_4_ + auVar48._8_4_ * 0.0;
            auVar187._12_4_ = auVar46._12_4_ * 0.0 + auVar39._12_4_ + auVar48._12_4_ * 0.0;
            auVar187._16_4_ = auVar46._16_4_ * 0.0 + auVar39._16_4_ + auVar48._16_4_ * 0.0;
            auVar187._20_4_ = auVar46._20_4_ * 0.0 + auVar39._20_4_ + auVar48._20_4_ * 0.0;
            auVar187._24_4_ = auVar46._24_4_ * 0.0 + auVar39._24_4_ + auVar48._24_4_ * 0.0;
            auVar187._28_4_ = auVar46._28_4_ + auVar39._28_4_ + auVar48._28_4_;
            auVar38 = vcmpps_avx(auVar187,ZEXT832(0) << 0x20,2);
            auVar159 = vblendvps_avx(auVar159,_local_6c0,auVar38);
            auVar39 = vblendvps_avx(auVar41,_local_6e0,auVar38);
            auVar41 = vblendvps_avx(auVar42,auVar372,auVar38);
            auVar42 = vblendvps_avx(auVar45,auVar356,auVar38);
            auVar43 = vblendvps_avx(auVar160,auVar237,auVar38);
            auVar44 = vblendvps_avx(auVar161,auVar319,auVar38);
            auVar45 = vblendvps_avx(auVar356,auVar45,auVar38);
            auVar46 = vblendvps_avx(auVar237,auVar160,auVar38);
            auVar48 = vblendvps_avx(auVar319,auVar161,auVar38);
            local_760._0_32_ = vandps_avx(auVar40,_local_420);
            auVar45 = vsubps_avx(auVar45,auVar159);
            auVar182 = vsubps_avx(auVar46,auVar39);
            auVar48 = vsubps_avx(auVar48,auVar41);
            auVar183 = vsubps_avx(auVar39,auVar43);
            fVar206 = auVar182._0_4_;
            fVar285 = auVar41._0_4_;
            fVar265 = auVar182._4_4_;
            fVar293 = auVar41._4_4_;
            auVar110._4_4_ = fVar293 * fVar265;
            auVar110._0_4_ = fVar285 * fVar206;
            fVar193 = auVar182._8_4_;
            fVar294 = auVar41._8_4_;
            auVar110._8_4_ = fVar294 * fVar193;
            fVar173 = auVar182._12_4_;
            fVar295 = auVar41._12_4_;
            auVar110._12_4_ = fVar295 * fVar173;
            fVar326 = auVar182._16_4_;
            fVar246 = auVar41._16_4_;
            auVar110._16_4_ = fVar246 * fVar326;
            fVar250 = auVar182._20_4_;
            fVar296 = auVar41._20_4_;
            auVar110._20_4_ = fVar296 * fVar250;
            fVar283 = auVar182._24_4_;
            fVar297 = auVar41._24_4_;
            auVar110._24_4_ = fVar297 * fVar283;
            auVar110._28_4_ = auVar46._28_4_;
            fVar204 = auVar39._0_4_;
            fVar307 = auVar48._0_4_;
            fVar266 = auVar39._4_4_;
            fVar308 = auVar48._4_4_;
            auVar111._4_4_ = fVar308 * fVar266;
            auVar111._0_4_ = fVar307 * fVar204;
            fVar194 = auVar39._8_4_;
            fVar320 = auVar48._8_4_;
            auVar111._8_4_ = fVar320 * fVar194;
            fVar174 = auVar39._12_4_;
            fVar321 = auVar48._12_4_;
            auVar111._12_4_ = fVar321 * fVar174;
            fVar334 = auVar39._16_4_;
            fVar322 = auVar48._16_4_;
            auVar111._16_4_ = fVar322 * fVar334;
            fVar270 = auVar39._20_4_;
            fVar323 = auVar48._20_4_;
            auVar111._20_4_ = fVar323 * fVar270;
            fVar284 = auVar39._24_4_;
            fVar324 = auVar48._24_4_;
            uVar12 = auVar160._28_4_;
            auVar111._24_4_ = fVar324 * fVar284;
            auVar111._28_4_ = uVar12;
            auVar46 = vsubps_avx(auVar111,auVar110);
            fVar220 = auVar159._0_4_;
            fVar267 = auVar159._4_4_;
            auVar112._4_4_ = fVar308 * fVar267;
            auVar112._0_4_ = fVar307 * fVar220;
            fVar269 = auVar159._8_4_;
            auVar112._8_4_ = fVar320 * fVar269;
            fVar207 = auVar159._12_4_;
            auVar112._12_4_ = fVar321 * fVar207;
            fVar175 = auVar159._16_4_;
            auVar112._16_4_ = fVar322 * fVar175;
            fVar278 = auVar159._20_4_;
            auVar112._20_4_ = fVar323 * fVar278;
            fVar244 = auVar159._24_4_;
            auVar112._24_4_ = fVar324 * fVar244;
            auVar112._28_4_ = uVar12;
            fVar225 = auVar45._0_4_;
            fVar341 = auVar45._4_4_;
            auVar113._4_4_ = fVar293 * fVar341;
            auVar113._0_4_ = fVar285 * fVar225;
            fVar325 = auVar45._8_4_;
            auVar113._8_4_ = fVar294 * fVar325;
            fVar221 = auVar45._12_4_;
            auVar113._12_4_ = fVar295 * fVar221;
            fVar176 = auVar45._16_4_;
            auVar113._16_4_ = fVar246 * fVar176;
            fVar279 = auVar45._20_4_;
            auVar113._20_4_ = fVar296 * fVar279;
            fVar245 = auVar45._24_4_;
            auVar113._24_4_ = fVar297 * fVar245;
            auVar113._28_4_ = auVar356._28_4_;
            auVar160 = vsubps_avx(auVar113,auVar112);
            auVar114._4_4_ = fVar266 * fVar341;
            auVar114._0_4_ = fVar204 * fVar225;
            auVar114._8_4_ = fVar194 * fVar325;
            auVar114._12_4_ = fVar174 * fVar221;
            auVar114._16_4_ = fVar334 * fVar176;
            auVar114._20_4_ = fVar270 * fVar279;
            auVar114._24_4_ = fVar284 * fVar245;
            auVar114._28_4_ = uVar12;
            auVar115._4_4_ = fVar267 * fVar265;
            auVar115._0_4_ = fVar220 * fVar206;
            auVar115._8_4_ = fVar269 * fVar193;
            auVar115._12_4_ = fVar207 * fVar173;
            auVar115._16_4_ = fVar175 * fVar326;
            auVar115._20_4_ = fVar278 * fVar250;
            auVar115._24_4_ = fVar244 * fVar283;
            auVar115._28_4_ = auVar161._28_4_;
            auVar161 = vsubps_avx(auVar115,auVar114);
            auVar184 = vsubps_avx(auVar41,auVar44);
            fVar262 = auVar161._28_4_ + auVar160._28_4_;
            local_780._0_4_ = auVar161._0_4_ + auVar160._0_4_ * 0.0 + auVar46._0_4_ * 0.0;
            local_780._4_4_ = auVar161._4_4_ + auVar160._4_4_ * 0.0 + auVar46._4_4_ * 0.0;
            local_780._8_4_ = auVar161._8_4_ + auVar160._8_4_ * 0.0 + auVar46._8_4_ * 0.0;
            local_780._12_4_ = auVar161._12_4_ + auVar160._12_4_ * 0.0 + auVar46._12_4_ * 0.0;
            local_780._16_4_ = auVar161._16_4_ + auVar160._16_4_ * 0.0 + auVar46._16_4_ * 0.0;
            local_780._20_4_ = auVar161._20_4_ + auVar160._20_4_ * 0.0 + auVar46._20_4_ * 0.0;
            local_780._24_4_ = auVar161._24_4_ + auVar160._24_4_ * 0.0 + auVar46._24_4_ * 0.0;
            local_780._28_4_ = fVar262 + auVar46._28_4_;
            fVar261 = auVar183._0_4_;
            fVar268 = auVar183._4_4_;
            auVar116._4_4_ = auVar44._4_4_ * fVar268;
            auVar116._0_4_ = auVar44._0_4_ * fVar261;
            fVar251 = auVar183._8_4_;
            auVar116._8_4_ = auVar44._8_4_ * fVar251;
            fVar223 = auVar183._12_4_;
            auVar116._12_4_ = auVar44._12_4_ * fVar223;
            fVar190 = auVar183._16_4_;
            auVar116._16_4_ = auVar44._16_4_ * fVar190;
            fVar280 = auVar183._20_4_;
            auVar116._20_4_ = auVar44._20_4_ * fVar280;
            fVar230 = auVar183._24_4_;
            auVar116._24_4_ = auVar44._24_4_ * fVar230;
            auVar116._28_4_ = fVar262;
            fVar262 = auVar184._0_4_;
            fVar342 = auVar184._4_4_;
            auVar117._4_4_ = auVar43._4_4_ * fVar342;
            auVar117._0_4_ = auVar43._0_4_ * fVar262;
            fVar171 = auVar184._8_4_;
            auVar117._8_4_ = auVar43._8_4_ * fVar171;
            fVar309 = auVar184._12_4_;
            auVar117._12_4_ = auVar43._12_4_ * fVar309;
            fVar191 = auVar184._16_4_;
            auVar117._16_4_ = auVar43._16_4_ * fVar191;
            fVar281 = auVar184._20_4_;
            auVar117._20_4_ = auVar43._20_4_ * fVar281;
            fVar240 = auVar184._24_4_;
            auVar117._24_4_ = auVar43._24_4_ * fVar240;
            auVar117._28_4_ = auVar161._28_4_;
            auVar160 = vsubps_avx(auVar117,auVar116);
            auVar161 = vsubps_avx(auVar159,auVar42);
            fVar263 = auVar161._0_4_;
            fVar192 = auVar161._4_4_;
            auVar118._4_4_ = auVar44._4_4_ * fVar192;
            auVar118._0_4_ = auVar44._0_4_ * fVar263;
            fVar172 = auVar161._8_4_;
            auVar118._8_4_ = auVar44._8_4_ * fVar172;
            fVar310 = auVar161._12_4_;
            auVar118._12_4_ = auVar44._12_4_ * fVar310;
            fVar205 = auVar161._16_4_;
            auVar118._16_4_ = auVar44._16_4_ * fVar205;
            fVar282 = auVar161._20_4_;
            auVar118._20_4_ = auVar44._20_4_ * fVar282;
            fVar242 = auVar161._24_4_;
            auVar118._24_4_ = auVar44._24_4_ * fVar242;
            auVar118._28_4_ = auVar44._28_4_;
            auVar119._4_4_ = fVar342 * auVar42._4_4_;
            auVar119._0_4_ = fVar262 * auVar42._0_4_;
            auVar119._8_4_ = fVar171 * auVar42._8_4_;
            auVar119._12_4_ = fVar309 * auVar42._12_4_;
            auVar119._16_4_ = fVar191 * auVar42._16_4_;
            auVar119._20_4_ = fVar281 * auVar42._20_4_;
            auVar119._24_4_ = fVar240 * auVar42._24_4_;
            auVar119._28_4_ = auVar46._28_4_;
            auVar44 = vsubps_avx(auVar118,auVar119);
            auVar120._4_4_ = auVar43._4_4_ * fVar192;
            auVar120._0_4_ = auVar43._0_4_ * fVar263;
            auVar120._8_4_ = auVar43._8_4_ * fVar172;
            auVar120._12_4_ = auVar43._12_4_ * fVar310;
            auVar120._16_4_ = auVar43._16_4_ * fVar205;
            auVar120._20_4_ = auVar43._20_4_ * fVar282;
            auVar120._24_4_ = auVar43._24_4_ * fVar242;
            auVar120._28_4_ = auVar43._28_4_;
            auVar121._4_4_ = fVar268 * auVar42._4_4_;
            auVar121._0_4_ = fVar261 * auVar42._0_4_;
            auVar121._8_4_ = fVar251 * auVar42._8_4_;
            auVar121._12_4_ = fVar223 * auVar42._12_4_;
            auVar121._16_4_ = fVar190 * auVar42._16_4_;
            auVar121._20_4_ = fVar280 * auVar42._20_4_;
            auVar121._24_4_ = fVar230 * auVar42._24_4_;
            auVar121._28_4_ = auVar42._28_4_;
            auVar42 = vsubps_avx(auVar121,auVar120);
            auVar168._0_4_ = auVar160._0_4_ * 0.0 + auVar42._0_4_ + auVar44._0_4_ * 0.0;
            auVar168._4_4_ = auVar160._4_4_ * 0.0 + auVar42._4_4_ + auVar44._4_4_ * 0.0;
            auVar168._8_4_ = auVar160._8_4_ * 0.0 + auVar42._8_4_ + auVar44._8_4_ * 0.0;
            auVar168._12_4_ = auVar160._12_4_ * 0.0 + auVar42._12_4_ + auVar44._12_4_ * 0.0;
            auVar168._16_4_ = auVar160._16_4_ * 0.0 + auVar42._16_4_ + auVar44._16_4_ * 0.0;
            auVar168._20_4_ = auVar160._20_4_ * 0.0 + auVar42._20_4_ + auVar44._20_4_ * 0.0;
            auVar168._24_4_ = auVar160._24_4_ * 0.0 + auVar42._24_4_ + auVar44._24_4_ * 0.0;
            auVar168._28_4_ = auVar44._28_4_ + auVar42._28_4_ + auVar44._28_4_;
            auVar169 = ZEXT3264(auVar168);
            auVar42 = vmaxps_avx(local_780,auVar168);
            auVar42 = vcmpps_avx(auVar42,ZEXT432(0) << 0x20,2);
            auVar43 = local_760._0_32_ & auVar42;
            if ((((((((auVar43 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar43 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar43 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar43 >> 0x7f,0) == '\0') &&
                  (auVar43 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar43 >> 0xbf,0) == '\0') &&
                (auVar43 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar43[0x1f]) {
LAB_0125bb29:
              auVar189 = ZEXT3264(CONCAT824(uStack_488,
                                            CONCAT816(uStack_490,CONCAT88(uStack_498,local_4a0))));
              auVar306._4_4_ = fVar170;
              auVar306._0_4_ = fVar155;
              auVar306._8_4_ = fStack_7b8;
              auVar306._12_4_ = fStack_7b4;
              auVar306._16_4_ = fStack_7b0;
              auVar306._20_4_ = fStack_7ac;
              auVar306._24_4_ = fStack_7a8;
              auVar306._28_4_ = fStack_7a4;
            }
            else {
              auVar43 = vandps_avx(auVar42,local_760._0_32_);
              auVar122._4_4_ = fVar342 * fVar265;
              auVar122._0_4_ = fVar262 * fVar206;
              auVar122._8_4_ = fVar171 * fVar193;
              auVar122._12_4_ = fVar309 * fVar173;
              auVar122._16_4_ = fVar191 * fVar326;
              auVar122._20_4_ = fVar281 * fVar250;
              auVar122._24_4_ = fVar240 * fVar283;
              auVar122._28_4_ = local_760._28_4_;
              auVar123._4_4_ = fVar268 * fVar308;
              auVar123._0_4_ = fVar261 * fVar307;
              auVar123._8_4_ = fVar251 * fVar320;
              auVar123._12_4_ = fVar223 * fVar321;
              auVar123._16_4_ = fVar190 * fVar322;
              auVar123._20_4_ = fVar280 * fVar323;
              auVar123._24_4_ = fVar230 * fVar324;
              auVar123._28_4_ = auVar42._28_4_;
              auVar44 = vsubps_avx(auVar123,auVar122);
              auVar124._4_4_ = fVar192 * fVar308;
              auVar124._0_4_ = fVar263 * fVar307;
              auVar124._8_4_ = fVar172 * fVar320;
              auVar124._12_4_ = fVar310 * fVar321;
              auVar124._16_4_ = fVar205 * fVar322;
              auVar124._20_4_ = fVar282 * fVar323;
              auVar124._24_4_ = fVar242 * fVar324;
              auVar124._28_4_ = auVar48._28_4_;
              auVar125._4_4_ = fVar342 * fVar341;
              auVar125._0_4_ = fVar262 * fVar225;
              auVar125._8_4_ = fVar171 * fVar325;
              auVar125._12_4_ = fVar309 * fVar221;
              auVar125._16_4_ = fVar191 * fVar176;
              auVar125._20_4_ = fVar281 * fVar279;
              auVar125._24_4_ = fVar240 * fVar245;
              auVar125._28_4_ = auVar184._28_4_;
              auVar46 = vsubps_avx(auVar125,auVar124);
              auVar126._4_4_ = fVar268 * fVar341;
              auVar126._0_4_ = fVar261 * fVar225;
              auVar126._8_4_ = fVar251 * fVar325;
              auVar126._12_4_ = fVar223 * fVar221;
              auVar126._16_4_ = fVar190 * fVar176;
              auVar126._20_4_ = fVar280 * fVar279;
              auVar126._24_4_ = fVar230 * fVar245;
              auVar126._28_4_ = auVar45._28_4_;
              auVar127._4_4_ = fVar192 * fVar265;
              auVar127._0_4_ = fVar263 * fVar206;
              auVar127._8_4_ = fVar172 * fVar193;
              auVar127._12_4_ = fVar310 * fVar173;
              auVar127._16_4_ = fVar205 * fVar326;
              auVar127._20_4_ = fVar282 * fVar250;
              auVar127._24_4_ = fVar242 * fVar283;
              auVar127._28_4_ = auVar182._28_4_;
              auVar48 = vsubps_avx(auVar127,auVar126);
              auVar188._0_4_ = auVar44._0_4_ * 0.0 + auVar48._0_4_ + auVar46._0_4_ * 0.0;
              auVar188._4_4_ = auVar44._4_4_ * 0.0 + auVar48._4_4_ + auVar46._4_4_ * 0.0;
              auVar188._8_4_ = auVar44._8_4_ * 0.0 + auVar48._8_4_ + auVar46._8_4_ * 0.0;
              auVar188._12_4_ = auVar44._12_4_ * 0.0 + auVar48._12_4_ + auVar46._12_4_ * 0.0;
              auVar188._16_4_ = auVar44._16_4_ * 0.0 + auVar48._16_4_ + auVar46._16_4_ * 0.0;
              auVar188._20_4_ = auVar44._20_4_ * 0.0 + auVar48._20_4_ + auVar46._20_4_ * 0.0;
              auVar188._24_4_ = auVar44._24_4_ * 0.0 + auVar48._24_4_ + auVar46._24_4_ * 0.0;
              auVar188._28_4_ = auVar182._28_4_ + auVar48._28_4_ + auVar45._28_4_;
              auVar42 = vrcpps_avx(auVar188);
              fVar225 = auVar42._0_4_;
              fVar261 = auVar42._4_4_;
              auVar128._4_4_ = auVar188._4_4_ * fVar261;
              auVar128._0_4_ = auVar188._0_4_ * fVar225;
              fVar262 = auVar42._8_4_;
              auVar128._8_4_ = auVar188._8_4_ * fVar262;
              fVar263 = auVar42._12_4_;
              auVar128._12_4_ = auVar188._12_4_ * fVar263;
              fVar265 = auVar42._16_4_;
              auVar128._16_4_ = auVar188._16_4_ * fVar265;
              fVar341 = auVar42._20_4_;
              auVar128._20_4_ = auVar188._20_4_ * fVar341;
              fVar268 = auVar42._24_4_;
              auVar128._24_4_ = auVar188._24_4_ * fVar268;
              auVar128._28_4_ = auVar184._28_4_;
              auVar350._8_4_ = 0x3f800000;
              auVar350._0_8_ = &DAT_3f8000003f800000;
              auVar350._12_4_ = 0x3f800000;
              auVar350._16_4_ = 0x3f800000;
              auVar350._20_4_ = 0x3f800000;
              auVar350._24_4_ = 0x3f800000;
              auVar350._28_4_ = 0x3f800000;
              auVar42 = vsubps_avx(auVar350,auVar128);
              fVar225 = auVar42._0_4_ * fVar225 + fVar225;
              fVar261 = auVar42._4_4_ * fVar261 + fVar261;
              fVar262 = auVar42._8_4_ * fVar262 + fVar262;
              fVar263 = auVar42._12_4_ * fVar263 + fVar263;
              fVar265 = auVar42._16_4_ * fVar265 + fVar265;
              fVar341 = auVar42._20_4_ * fVar341 + fVar341;
              fVar268 = auVar42._24_4_ * fVar268 + fVar268;
              auVar129._4_4_ =
                   (fVar267 * auVar44._4_4_ + auVar46._4_4_ * fVar266 + auVar48._4_4_ * fVar293) *
                   fVar261;
              auVar129._0_4_ =
                   (fVar220 * auVar44._0_4_ + auVar46._0_4_ * fVar204 + auVar48._0_4_ * fVar285) *
                   fVar225;
              auVar129._8_4_ =
                   (fVar269 * auVar44._8_4_ + auVar46._8_4_ * fVar194 + auVar48._8_4_ * fVar294) *
                   fVar262;
              auVar129._12_4_ =
                   (fVar207 * auVar44._12_4_ + auVar46._12_4_ * fVar174 + auVar48._12_4_ * fVar295)
                   * fVar263;
              auVar129._16_4_ =
                   (fVar175 * auVar44._16_4_ + auVar46._16_4_ * fVar334 + auVar48._16_4_ * fVar246)
                   * fVar265;
              auVar129._20_4_ =
                   (fVar278 * auVar44._20_4_ + auVar46._20_4_ * fVar270 + auVar48._20_4_ * fVar296)
                   * fVar341;
              auVar129._24_4_ =
                   (fVar244 * auVar44._24_4_ + auVar46._24_4_ * fVar284 + auVar48._24_4_ * fVar297)
                   * fVar268;
              auVar129._28_4_ = auVar159._28_4_ + auVar39._28_4_ + auVar41._28_4_;
              fVar206 = ray->tfar;
              auVar238._4_4_ = fVar206;
              auVar238._0_4_ = fVar206;
              auVar238._8_4_ = fVar206;
              auVar238._12_4_ = fVar206;
              auVar238._16_4_ = fVar206;
              auVar238._20_4_ = fVar206;
              auVar238._24_4_ = fVar206;
              auVar238._28_4_ = fVar206;
              auVar159 = vcmpps_avx(local_120,auVar129,2);
              auVar39 = vcmpps_avx(auVar129,auVar238,2);
              auVar159 = vandps_avx(auVar159,auVar39);
              auVar41 = auVar43 & auVar159;
              if ((((((((auVar41 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar41 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar41 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar41 >> 0x7f,0) == '\0') &&
                    (auVar41 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar41 >> 0xbf,0) == '\0') &&
                  (auVar41 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar41[0x1f]) goto LAB_0125bb29;
              auVar159 = vandps_avx(auVar43,auVar159);
              auVar41 = vcmpps_avx(ZEXT432(0) << 0x20,auVar188,4);
              auVar42 = auVar159 & auVar41;
              auVar189 = ZEXT3264(CONCAT824(uStack_488,
                                            CONCAT816(uStack_490,CONCAT88(uStack_498,local_4a0))));
              auVar306._4_4_ = fVar170;
              auVar306._0_4_ = fVar155;
              auVar306._8_4_ = fStack_7b8;
              auVar306._12_4_ = fStack_7b4;
              auVar306._16_4_ = fStack_7b0;
              auVar306._20_4_ = fStack_7ac;
              auVar306._24_4_ = fStack_7a8;
              auVar306._28_4_ = fStack_7a4;
              if ((((((((auVar42 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar42 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar42 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar42 >> 0x7f,0) != '\0') ||
                    (auVar42 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar42 >> 0xbf,0) != '\0') ||
                  (auVar42 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar42[0x1f] < '\0') {
                auVar159 = vandps_avx(auVar41,auVar159);
                auVar189 = ZEXT3264(auVar159);
                auVar130._4_4_ = fVar261 * local_780._4_4_;
                auVar130._0_4_ = fVar225 * (float)local_780._0_4_;
                auVar130._8_4_ = fVar262 * local_780._8_4_;
                auVar130._12_4_ = fVar263 * local_780._12_4_;
                auVar130._16_4_ = fVar265 * local_780._16_4_;
                auVar130._20_4_ = fVar341 * local_780._20_4_;
                auVar130._24_4_ = fVar268 * local_780._24_4_;
                auVar130._28_4_ = auVar39._28_4_;
                auVar131._4_4_ = auVar168._4_4_ * fVar261;
                auVar131._0_4_ = auVar168._0_4_ * fVar225;
                auVar131._8_4_ = auVar168._8_4_ * fVar262;
                auVar131._12_4_ = auVar168._12_4_ * fVar263;
                auVar131._16_4_ = auVar168._16_4_ * fVar265;
                auVar131._20_4_ = auVar168._20_4_ * fVar341;
                auVar131._24_4_ = auVar168._24_4_ * fVar268;
                auVar131._28_4_ = auVar168._28_4_;
                auVar277._8_4_ = 0x3f800000;
                auVar277._0_8_ = &DAT_3f8000003f800000;
                auVar277._12_4_ = 0x3f800000;
                auVar277._16_4_ = 0x3f800000;
                auVar277._20_4_ = 0x3f800000;
                auVar277._24_4_ = 0x3f800000;
                auVar277._28_4_ = 0x3f800000;
                auVar159 = vsubps_avx(auVar277,auVar130);
                _local_1a0 = vblendvps_avx(auVar159,auVar130,auVar38);
                auVar159 = vsubps_avx(auVar277,auVar131);
                _local_380 = vblendvps_avx(auVar159,auVar131,auVar38);
                auVar169 = ZEXT3264(_local_380);
                local_1c0 = auVar129;
              }
            }
            auVar159 = auVar189._0_32_;
            fVar309 = (float)local_700._0_4_;
            fVar310 = (float)local_700._4_4_;
            fVar326 = fStack_6f8;
            fVar334 = fStack_6f4;
            fVar206 = fStack_6f0;
            fVar204 = fStack_6ec;
            fVar220 = fStack_6e8;
            fVar225 = fStack_6e4;
            if ((((((((auVar159 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar159 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar159 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar159 >> 0x7f,0) == '\0') &&
                  (auVar189 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                 SUB321(auVar159 >> 0xbf,0) == '\0') &&
                (auVar189 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                -1 < auVar189[0x1f]) {
              auVar333 = ZEXT3264(_local_580);
            }
            else {
              auVar39 = vsubps_avx(auVar354,auVar306);
              fVar262 = auVar306._0_4_ + auVar39._0_4_ * (float)local_1a0._0_4_;
              fVar263 = auVar306._4_4_ + auVar39._4_4_ * (float)local_1a0._4_4_;
              fVar265 = auVar306._8_4_ + auVar39._8_4_ * fStack_198;
              fVar266 = auVar306._12_4_ + auVar39._12_4_ * fStack_194;
              fVar267 = auVar306._16_4_ + auVar39._16_4_ * fStack_190;
              fVar341 = auVar306._20_4_ + auVar39._20_4_ * fStack_18c;
              fVar155 = auVar306._24_4_ + auVar39._24_4_ * fStack_188;
              fVar170 = auVar306._28_4_ + auVar39._28_4_;
              fVar261 = local_788->depth_scale;
              auVar132._4_4_ = (fVar263 + fVar263) * fVar261;
              auVar132._0_4_ = (fVar262 + fVar262) * fVar261;
              auVar132._8_4_ = (fVar265 + fVar265) * fVar261;
              auVar132._12_4_ = (fVar266 + fVar266) * fVar261;
              auVar132._16_4_ = (fVar267 + fVar267) * fVar261;
              auVar132._20_4_ = (fVar341 + fVar341) * fVar261;
              auVar132._24_4_ = (fVar155 + fVar155) * fVar261;
              auVar132._28_4_ = fVar170 + fVar170;
              auVar39 = vcmpps_avx(local_1c0,auVar132,6);
              auVar169 = ZEXT3264(auVar39);
              auVar41 = auVar159 & auVar39;
              auVar333 = ZEXT3264(_local_580);
              if ((((((((auVar41 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar41 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar41 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar41 >> 0x7f,0) != '\0') ||
                    (auVar41 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar41 >> 0xbf,0) != '\0') ||
                  (auVar41 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar41[0x1f] < '\0') {
                local_240 = vandps_avx(auVar39,auVar159);
                auVar169 = ZEXT3264(local_240);
                auVar180._0_8_ =
                     CONCAT44((float)local_380._4_4_ + (float)local_380._4_4_ + -1.0,
                              (float)local_380._0_4_ + (float)local_380._0_4_ + -1.0);
                auVar180._8_4_ = (float)uStack_378 + (float)uStack_378 + -1.0;
                auVar180._12_4_ = uStack_378._4_4_ + uStack_378._4_4_ + -1.0;
                auVar181._16_4_ = (float)uStack_370 + (float)uStack_370 + -1.0;
                auVar181._0_16_ = auVar180;
                auVar181._20_4_ = uStack_370._4_4_ + uStack_370._4_4_ + -1.0;
                fStack_2c8 = (float)uStack_368 + (float)uStack_368 + -1.0;
                _local_2e0 = auVar181;
                fStack_2c4 = uStack_368._4_4_ + uStack_368._4_4_ + -1.0;
                auVar189 = ZEXT3264(_local_2e0);
                local_300 = _local_1a0;
                local_2c0 = local_1c0;
                local_29c = uVar149;
                local_290 = local_670;
                uStack_288 = uStack_668;
                local_280 = local_4b0._0_8_;
                uStack_278 = local_4b0._8_8_;
                local_270 = local_3e0._0_8_;
                uStack_268 = local_3e0._8_8_;
                local_260 = local_3d0._0_8_;
                uStack_258 = local_3d0._8_8_;
                local_6a0._0_8_ = (local_7f0->scene->geometries).items[local_790].ptr;
                _local_380 = _local_2e0;
                auVar159 = _local_380;
                if ((((Geometry *)local_6a0._0_8_)->mask & ray->mask) == 0) {
                  pRVar147 = (RTCIntersectArguments *)0x0;
                }
                else {
                  pRVar147 = local_7f0->args;
                  if ((pRVar147->filter != (RTCFilterFunctionN)0x0) ||
                     (pRVar147 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar147 >> 8),1),
                     ((Geometry *)local_6a0._0_8_)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_6a0._8_24_ = auVar276._8_24_;
                    _auStack_7dc = auVar354._4_28_;
                    local_7e0 = (undefined1  [4])(int)uVar153;
                    auVar373 = vshufps_avx(ZEXT416((uint)(float)(int)local_2a0),
                                           ZEXT416((uint)(float)(int)local_2a0),0);
                    local_220[0] = (auVar373._0_4_ + (float)local_1a0._0_4_ + 0.0) *
                                   (float)local_140._0_4_;
                    local_220[1] = (auVar373._4_4_ + (float)local_1a0._4_4_ + 1.0) *
                                   (float)local_140._4_4_;
                    local_220[2] = (auVar373._8_4_ + fStack_198 + 2.0) * fStack_138;
                    local_220[3] = (auVar373._12_4_ + fStack_194 + 3.0) * fStack_134;
                    fStack_210 = (auVar373._0_4_ + fStack_190 + 4.0) * fStack_130;
                    fStack_20c = (auVar373._4_4_ + fStack_18c + 5.0) * fStack_12c;
                    fStack_208 = (auVar373._8_4_ + fStack_188 + 6.0) * fStack_128;
                    fStack_204 = auVar373._12_4_ + fStack_184 + 7.0;
                    uStack_378 = auVar180._8_8_;
                    uStack_370 = auVar181._16_8_;
                    uStack_368 = local_2e0._24_8_;
                    local_200 = auVar180._0_8_;
                    uStack_1f8 = uStack_378;
                    uStack_1f0 = uStack_370;
                    uStack_1e8 = uStack_368;
                    auVar189 = ZEXT3264(local_1c0);
                    local_1e0 = local_1c0;
                    iVar146 = vmovmskps_avx(local_240);
                    uVar148 = CONCAT44((int)((ulong)pRVar147 >> 0x20),iVar146);
                    lVar151 = 0;
                    if (uVar148 != 0) {
                      for (; (uVar148 >> lVar151 & 1) == 0; lVar151 = lVar151 + 1) {
                      }
                    }
                    local_7c0 = (uint)lVar151;
                    uStack_7bc = (undefined4)((ulong)lVar151 >> 0x20);
                    local_760._0_8_ = uVar148;
                    local_620._4_28_ = auVar259._4_28_;
                    local_620._0_4_ = (int)CONCAT71((int7)(uVar148 >> 8),iVar146 != 0);
                    _local_380 = auVar159;
                    if (iVar146 != 0) {
                      _local_6c0 = local_4b0;
                      _auStack_5b0 = auVar40._16_16_;
                      _local_5c0 = local_3e0;
                      _local_6e0 = local_3d0;
                      do {
                        lVar151 = CONCAT44(uStack_7bc,local_7c0);
                        local_654 = local_220[lVar151];
                        auVar169 = ZEXT464((uint)local_654);
                        local_650 = *(uint *)((long)&local_200 + lVar151 * 4);
                        auVar189 = ZEXT464(local_650);
                        local_780._0_4_ = local_7e8->tfar;
                        local_7e8->tfar = *(float *)(local_1e0 + lVar151 * 4);
                        local_730.context = local_7f0->user;
                        fVar204 = 1.0 - local_654;
                        fVar206 = local_654 * fVar204 + local_654 * fVar204;
                        auVar373 = ZEXT416((uint)(local_654 * local_654 * 3.0));
                        auVar373 = vshufps_avx(auVar373,auVar373,0);
                        auVar196 = ZEXT416((uint)((fVar206 - local_654 * local_654) * 3.0));
                        auVar196 = vshufps_avx(auVar196,auVar196,0);
                        auVar233 = ZEXT416((uint)((fVar204 * fVar204 - fVar206) * 3.0));
                        auVar233 = vshufps_avx(auVar233,auVar233,0);
                        auVar210 = ZEXT416((uint)(fVar204 * fVar204 * -3.0));
                        auVar210 = vshufps_avx(auVar210,auVar210,0);
                        auVar197._0_4_ =
                             auVar210._0_4_ * (float)local_670._0_4_ +
                             auVar233._0_4_ * (float)local_6c0._0_4_ +
                             auVar373._0_4_ * (float)local_6e0._0_4_ +
                             auVar196._0_4_ * (float)local_5c0._0_4_;
                        auVar197._4_4_ =
                             auVar210._4_4_ * (float)local_670._4_4_ +
                             auVar233._4_4_ * (float)local_6c0._4_4_ +
                             auVar373._4_4_ * (float)local_6e0._4_4_ +
                             auVar196._4_4_ * (float)local_5c0._4_4_;
                        auVar197._8_4_ =
                             auVar210._8_4_ * (float)uStack_668 +
                             auVar233._8_4_ * (float)uStack_6b8 +
                             auVar373._8_4_ * (float)uStack_6d8 + auVar196._8_4_ * fStack_5b8;
                        auVar197._12_4_ =
                             auVar210._12_4_ * uStack_668._4_4_ +
                             auVar233._12_4_ * uStack_6b8._4_4_ +
                             auVar373._12_4_ * uStack_6d8._4_4_ + auVar196._12_4_ * fStack_5b4;
                        local_660 = vmovlps_avx(auVar197);
                        local_658 = vextractps_avx(auVar197,2);
                        local_64c = (int)local_628;
                        local_648 = (int)local_790;
                        local_644 = (local_730.context)->instID[0];
                        local_640 = (local_730.context)->instPrimID[0];
                        local_7f4 = -1;
                        local_730.valid = &local_7f4;
                        local_730.geometryUserPtr = *(void **)(local_6a0._0_8_ + 0x18);
                        local_730.ray = (RTCRayN *)local_7e8;
                        local_730.hit = (RTCHitN *)&local_660;
                        local_730.N = 1;
                        if (*(code **)(local_6a0._0_8_ + 0x48) == (code *)0x0) {
LAB_0125ba2d:
                          p_Var37 = local_7f0->args->filter;
                          if (p_Var37 == (RTCFilterFunctionN)0x0) break;
                          if (((local_7f0->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                               != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             ((*(byte *)(local_6a0._0_8_ + 0x3e) & 0x40) != 0)) {
                            auVar373 = (*p_Var37)(&local_730);
                            auVar189._0_8_ = auVar373._8_8_;
                            auVar169._0_8_ = auVar373._0_8_;
                            auVar189._8_56_ = extraout_var_02;
                            auVar169._8_56_ = extraout_var_00;
                          }
                          if (*local_730.valid != 0) break;
                        }
                        else {
                          auVar373 = (**(code **)(local_6a0._0_8_ + 0x48))(&local_730);
                          auVar189._0_8_ = auVar373._8_8_;
                          auVar169._0_8_ = auVar373._0_8_;
                          auVar189._8_56_ = extraout_var_01;
                          auVar169._8_56_ = extraout_var;
                          if (*local_730.valid != 0) goto LAB_0125ba2d;
                        }
                        auVar169 = ZEXT464((uint)local_780._0_4_);
                        local_7e8->tfar = (float)local_780._0_4_;
                        uVar148 = local_760._0_8_ ^ 1L << ((ulong)local_7c0 & 0x3f);
                        lVar151 = 0;
                        if (uVar148 != 0) {
                          for (; (uVar148 >> lVar151 & 1) == 0; lVar151 = lVar151 + 1) {
                          }
                        }
                        local_7c0 = (uint)lVar151;
                        uStack_7bc = (undefined4)((ulong)lVar151 >> 0x20);
                        local_760._0_8_ = uVar148;
                        local_620._0_4_ = (int)CONCAT71((int7)(uVar148 >> 8),uVar148 != 0);
                      } while (uVar148 != 0);
                    }
                    pRVar147 = (RTCIntersectArguments *)(ulong)(local_620[0] & 1);
                    auVar333 = ZEXT3264(_local_580);
                    uVar153 = (ulong)(uint)local_7e0;
                    ray = local_7e8;
                  }
                }
                uVar153 = CONCAT71((int7)(uVar153 >> 8),(byte)uVar153 | (byte)pRVar147);
                fVar222 = (float)local_600._0_4_;
                fVar359 = (float)local_600._4_4_;
                fVar224 = fStack_5f8;
                fVar264 = fStack_5f4;
                fVar226 = fStack_5f0;
                fVar227 = fStack_5ec;
                fVar228 = fStack_5e8;
                fVar229 = fStack_5e4;
                fVar239 = (float)local_480._0_4_;
                fVar241 = (float)local_480._4_4_;
                fVar243 = fStack_478;
                fVar247 = fStack_474;
                fVar248 = fStack_470;
                fVar249 = fStack_46c;
                fVar252 = fStack_468;
                fVar309 = (float)local_700._0_4_;
                fVar310 = (float)local_700._4_4_;
                fVar326 = fStack_6f8;
                fVar334 = fStack_6f4;
                fVar206 = fStack_6f0;
                fVar204 = fStack_6ec;
                fVar220 = fStack_6e8;
                fVar225 = fStack_6e4;
              }
            }
          }
          lVar154 = lVar154 + 8;
        } while ((int)lVar154 < (int)uVar149);
      }
      if ((uVar153 & 1) != 0) {
        return local_7f5;
      }
      fVar206 = ray->tfar;
      auVar165._4_4_ = fVar206;
      auVar165._0_4_ = fVar206;
      auVar165._8_4_ = fVar206;
      auVar165._12_4_ = fVar206;
      auVar165._16_4_ = fVar206;
      auVar165._20_4_ = fVar206;
      auVar165._24_4_ = fVar206;
      auVar165._28_4_ = fVar206;
      auVar159 = vcmpps_avx(local_80,auVar165,2);
      uVar149 = vmovmskps_avx(auVar159);
      uVar145 = uVar145 & uVar145 + 0xff & uVar149;
      local_7f5 = uVar145 != 0;
      context = local_7f0;
    } while (local_7f5);
  }
  return local_7f5;
}

Assistant:

static __forceinline bool occluded_h(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time());
          if (Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }